

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O3

void __thiscall
Spaghetti<RemSP>::PerformLabelingMem
          (Spaghetti<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Mat1b *pMVar7;
  long lVar8;
  pointer puVar9;
  pointer puVar10;
  pointer puVar11;
  pointer piVar12;
  pointer piVar13;
  Spaghetti<RemSP> *pSVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  undefined4 uVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  pointer puVar29;
  long *plVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  int iVar49;
  long lVar50;
  ulong uVar51;
  int iVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  double dVar56;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  ulong local_410;
  ulong local_400;
  long local_3f8;
  ulong local_3f0;
  pointer local_3e8;
  long *local_3e0;
  long local_3d8;
  pointer local_3d0;
  long local_3c8;
  long *local_3c0;
  long local_3b0;
  long *local_3a8;
  ulong local_3a0;
  pointer local_398;
  ulong local_390;
  long local_388;
  long local_380;
  pointer local_378;
  int local_370;
  long *local_368;
  pointer local_360;
  long local_358;
  ulong *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  undefined1 local_330 [104];
  Mat local_2c8 [16];
  pointer local_2b8;
  long *local_280;
  Spaghetti<RemSP> *local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  ulong local_238;
  long local_230;
  long local_228;
  long local_220;
  ulong local_218;
  ulong local_210;
  long local_208;
  pointer local_200;
  long local_1f8;
  long local_1f0;
  undefined1 local_1e8 [104];
  Mat local_180 [16];
  long local_170;
  ulong *local_138;
  int local_11c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_118;
  Size local_110;
  undefined4 local_108;
  Mat *local_100;
  undefined8 local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar5 = *(int *)&pMVar7->field_0x8;
  uVar34 = (ulong)iVar5;
  iVar6 = *(int *)&pMVar7->field_0xc;
  lVar53 = (long)iVar6;
  local_118 = accesses;
  RemSP::MemAlloc(((iVar6 - (iVar6 + 1 >> 0x1f)) + 1 >> 1) *
                  ((iVar5 - (iVar5 + 1 >> 0x1f)) + 1 >> 1) + 1);
  *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  *RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  RemSP::length_ = 1;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1e8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110.height = (int)uVar2;
  local_110.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_330,&local_110,0);
  piVar12 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar29 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar51 = lVar53 - 2;
  local_370 = (int)uVar51;
  local_268 = this;
  if (iVar5 != 1) {
    uVar18 = 0;
    if (2 < iVar6) {
      local_200 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      uVar22 = 0;
      do {
        lVar26 = (long)(int)uVar22;
        piVar1 = (int *)(local_170 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1e8._24_8_ + lVar26) != '\0') goto LAB_0015de6f;
        uVar28 = *local_138;
        piVar1 = (int *)(uVar28 + local_170 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)local_1e8._80_8_;
        if (*(char *)(lVar26 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_0015de6f;
LAB_0015db0a:
        iVar49 = (int)uVar22;
        uVar46 = (ulong)iVar49;
        piVar1 = (int *)(local_170 + 4 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if ((*(char *)(local_1e8._24_8_ + 1 + uVar46) != '\0') ||
           (piVar1 = (int *)(uVar28 + local_170 + 4 + uVar46 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(uVar46 + 1 + lVar42 + local_1e8._24_8_) != '\0')) {
          uVar18 = RemSP::length_;
          lVar26 = (long)(int)RemSP::length_;
          piVar12[lVar26] = piVar12[lVar26] + 1;
          puVar29[lVar26] = uVar18;
          uVar18 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
LAB_0015db83:
          do {
            local_2b8[uVar46] = local_2b8[uVar46] + 1;
            *(uint *)(local_330._24_8_ + uVar46 * 4) = uVar18;
LAB_0015db8f:
            lVar26 = (long)(int)uVar22;
            uVar18 = (int)uVar22 + 2;
            uVar22 = (ulong)uVar18;
            if (local_370 <= (int)uVar18) {
              piVar1 = (int *)(local_170 + 8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(local_1e8._24_8_ + 2 + lVar26);
              if (local_370 < (int)uVar18) {
                if ((cVar3 == '\0') &&
                   (piVar1 = (int *)(local_170 + *local_138 + 8 + lVar26 * 4), *piVar1 = *piVar1 + 1
                   , *(char *)(lVar26 + 2 + local_1e8._24_8_ + *(long *)local_1e8._80_8_) == '\0'))
                {
                  local_2b8[lVar26 + 2] = local_2b8[lVar26 + 2] + 1;
                  *(undefined4 *)(local_330._24_8_ + 8 + lVar26 * 4) = 0;
                }
                else {
                  local_2b8[lVar26] = local_2b8[lVar26] + 1;
                  uVar23 = *(undefined4 *)(local_330._24_8_ + lVar26 * 4);
                  local_2b8[lVar26 + 2] = local_2b8[lVar26 + 2] + 1;
                  *(undefined4 *)(local_330._24_8_ + 8 + lVar26 * 4) = uVar23;
                }
              }
              else {
                if (cVar3 == '\0') {
                  uVar22 = *local_138;
                  piVar1 = (int *)(uVar22 + local_170 + 8 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_1e8._80_8_;
                  if (*(char *)(lVar26 + 2 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0016c525;
                }
LAB_0015e37f:
                lVar26 = (long)(int)uVar18;
                piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                local_2b8[lVar26 + -2] = local_2b8[lVar26 + -2] + 1;
                uVar23 = *(undefined4 *)(local_330._24_8_ + -8 + lVar26 * 4);
                local_2b8[lVar26] = local_2b8[lVar26] + 1;
                *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
              }
              goto LAB_0015e3e7;
            }
            piVar1 = (int *)(local_170 + 8 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1e8._24_8_ + 2 + lVar26) == '\0') {
              uVar28 = *local_138;
              piVar1 = (int *)(uVar28 + local_170 + 8 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)local_1e8._80_8_;
              if (*(char *)(lVar26 + 2 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0015db0a;
            }
LAB_0015dbd5:
            uVar46 = (ulong)(int)uVar22;
            piVar1 = (int *)(local_170 + 4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(local_1e8._24_8_ + 1 + uVar46);
            local_2b8[uVar46 - 2] = local_2b8[uVar46 - 2] + 1;
            uVar18 = *(uint *)(local_330._24_8_ + -8 + uVar46 * 4);
            if (cVar3 == '\0') {
              local_2b8[uVar46] = local_2b8[uVar46] + 1;
              *(uint *)(local_330._24_8_ + uVar46 * 4) = uVar18;
              do {
                piVar13 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                puVar11 = RemSP::mem_P_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                iVar49 = (int)uVar22;
                uVar18 = iVar49 + 2;
                if (local_370 <= (int)uVar18) {
LAB_0015e085:
                  lVar26 = (long)(int)uVar18;
                  piVar1 = (int *)(local_170 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (local_370 < (int)uVar18) {
                    uVar22 = *local_138;
                    lVar42 = *(long *)local_1e8._80_8_;
                    if ((*(char *)(local_1e8._24_8_ + lVar26) == '\0') &&
                       (piVar1 = (int *)(uVar22 + local_170 + lVar26 * 4), *piVar1 = *piVar1 + 1,
                       *(char *)(lVar26 + local_1e8._24_8_ + lVar42) == '\0')) {
                      local_2b8[lVar26] = local_2b8[lVar26] + 1;
                      goto LAB_0016c221;
                    }
                  }
                  else {
                    if (*(char *)(local_1e8._24_8_ + lVar26) != '\0') {
                      piVar1 = (int *)(*local_138 + local_170 + 4 + (long)iVar49 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)((long)iVar49 + 1 + local_1e8._24_8_ + *(long *)local_1e8._80_8_)
                          == '\0') goto LAB_0015e3a4;
                      goto LAB_0015e37f;
                    }
                    uVar22 = *local_138;
                    piVar1 = (int *)(uVar22 + local_170 + lVar26 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_1e8._80_8_;
                    if (*(char *)(lVar26 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0016c525;
                    piVar1 = (int *)(local_170 + 0xc + (long)iVar49 * 4);
                    *piVar1 = *piVar1 + 1;
                  }
                  lVar43 = (long)iVar49;
                  piVar1 = (int *)(local_170 + uVar22 + 4 + lVar43 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::length_;
                  if (*(char *)(lVar43 + 1 + local_1e8._24_8_ + lVar42) == '\0') {
                    lVar42 = (long)(int)RemSP::length_;
                    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar18;
                    uVar18 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    local_2b8[lVar26] = local_2b8[lVar26] + 1;
                    goto LAB_0015e319;
                  }
                  local_2b8[lVar43] = local_2b8[lVar43] + 1;
                  uVar23 = *(undefined4 *)(local_330._24_8_ + lVar43 * 4);
                  local_2b8[lVar26] = local_2b8[lVar26] + 1;
                  *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
                  goto LAB_0015e3e7;
                }
                lVar36 = (long)iVar49;
                lVar26 = lVar36 + 2;
                lVar43 = local_170 + 8 + lVar36 * 4;
                lVar45 = local_1e8._24_8_ + 2 + lVar36;
                lVar48 = local_330._24_8_ + lVar36 * 4;
                lVar41 = lVar36 << 0x20;
                lVar40 = 0;
                while (piVar1 = (int *)(lVar43 + lVar40 * 4), *piVar1 = *piVar1 + 1,
                      *(char *)(lVar45 + lVar40) == '\0') {
                  uVar28 = *local_138;
                  lVar32 = uVar28 + local_170 + lVar36 * 4;
                  piVar1 = (int *)(lVar32 + 8 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_1e8._80_8_;
                  lVar31 = lVar42 + local_1e8._24_8_ + lVar36;
                  if (*(char *)(lVar40 + 2 + lVar31) == '\0') {
                    uVar22 = (ulong)(uint)((int)lVar26 + (int)lVar40);
                    goto LAB_0015db0a;
                  }
                  piVar1 = (int *)(lVar43 + 4 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar45 + 1 + lVar40) != '\0') {
                    piVar1 = (int *)(uVar28 + local_170 + (lVar41 + 0x100000000 >> 0x1e));
                    *piVar1 = *piVar1 + 1;
                    uVar18 = RemSP::length_;
                    uVar46 = lVar26 + lVar40;
                    if (*(char *)(lVar42 + local_1e8._24_8_ + (lVar41 + 0x100000000 >> 0x20)) ==
                        '\0') {
                      lVar26 = (long)(int)RemSP::length_;
                      piVar12[lVar26] = piVar12[lVar26] + 1;
                      puVar29[lVar26] = uVar18;
                      uVar22 = uVar46 & 0xffffffff;
                      uVar18 = RemSP::length_;
                      RemSP::length_ = RemSP::length_ + 1;
                    }
                    else {
                      piVar1 = (int *)((long)local_2b8 + (lVar41 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      uVar22 = uVar46 & 0xffffffff;
                      uVar18 = *(uint *)(local_330._24_8_ + (lVar41 >> 0x1e));
                    }
                    goto LAB_0015db83;
                  }
                  piVar1 = (int *)(lVar32 + 4 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::length_;
                  if (*(char *)(lVar40 + 1 + lVar31) == '\0') {
                    lVar42 = (long)(int)RemSP::length_;
                    piVar13[lVar42] = piVar13[lVar42] + 1;
                    puVar11[lVar42] = uVar18;
                    uVar18 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                  }
                  else {
                    local_2b8[lVar36 + lVar40] = local_2b8[lVar36 + lVar40] + 1;
                    uVar18 = *(uint *)(lVar48 + lVar40 * 4);
                  }
                  local_2b8[lVar36 + lVar40 + 2] = local_2b8[lVar36 + lVar40 + 2] + 1;
                  *(uint *)(lVar48 + 8 + lVar40 * 4) = uVar18;
                  lVar41 = lVar41 + 0x200000000;
                  lVar42 = lVar26 + lVar40;
                  lVar40 = lVar40 + 2;
                  if ((long)(uVar51 & 0xffffffff) <= lVar42 + 2) {
                    uVar18 = iVar49 + (int)lVar40 + 2;
                    iVar49 = iVar49 + (int)lVar40;
                    goto LAB_0015e085;
                  }
                }
                piVar1 = (int *)((lVar41 + 0x100000000 >> 0x1e) + *local_138 + local_170);
                *piVar1 = *piVar1 + 1;
                uVar22 = lVar26 + lVar40 & 0xffffffff;
                if (*(char *)((lVar41 + 0x100000000 >> 0x20) +
                             *(long *)local_1e8._80_8_ + local_1e8._24_8_) != '\0')
                goto LAB_0015dbd5;
LAB_0015de6f:
                lVar26 = (long)(int)uVar22;
                piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                uVar18 = RemSP::length_;
                cVar3 = *(char *)(local_1e8._24_8_ + 1 + lVar26);
                lVar42 = (long)(int)RemSP::length_;
                piVar12[lVar42] = piVar12[lVar42] + 1;
                puVar29[lVar42] = uVar18;
                uVar18 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
                local_2b8[lVar26] = local_2b8[lVar26] + 1;
                *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
                if (cVar3 != '\0') goto LAB_0015db8f;
              } while( true );
            }
          } while( true );
        }
        local_2b8[iVar49] = local_2b8[iVar49] + 1;
        *(undefined4 *)(local_330._24_8_ + (long)iVar49 * 4) = 0;
        uVar18 = iVar49 + 2;
        uVar22 = (ulong)uVar18;
      } while ((int)uVar18 < local_370);
    }
    lVar26 = (long)(int)uVar18;
    piVar1 = (int *)(local_170 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (local_370 < (int)uVar18) {
      if ((*(char *)(local_1e8._24_8_ + lVar26) == '\0') &&
         (piVar1 = (int *)(local_170 + *local_138 + lVar26 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar26 + local_1e8._24_8_ + *(long *)local_1e8._80_8_) == '\0')) {
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
LAB_0016c221:
        *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
      }
      else {
        uVar18 = RemSP::length_;
        lVar42 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] = uVar18;
        uVar18 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
LAB_0015e319:
        *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
      }
      goto LAB_0015e3e7;
    }
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
      uVar22 = *local_138;
      piVar1 = (int *)(uVar22 + local_170 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_1e8._80_8_;
      if (*(char *)(lVar26 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_0015e3a4;
LAB_0016c525:
      lVar26 = (long)(int)uVar18;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      if ((*(char *)(local_1e8._24_8_ + 1 + lVar26) == '\0') &&
         (piVar1 = (int *)(local_170 + uVar22 + 4 + lVar26 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar26 + 1 + local_1e8._24_8_ + lVar42) == '\0')) {
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
        *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
        goto LAB_0015e3e7;
      }
    }
    else {
LAB_0015e3a4:
      lVar26 = (long)(int)uVar18;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
    }
    uVar18 = RemSP::length_;
    lVar42 = (long)(int)RemSP::length_;
    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar42] =
         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar42] + 1;
    RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar42] = uVar18;
    uVar18 = RemSP::length_;
    RemSP::length_ = RemSP::length_ + 1;
    local_2b8[lVar26] = local_2b8[lVar26] + 1;
    *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
LAB_0015e3e7:
    local_11c = iVar5 - (((uint)(uVar34 >> 0x1f) & 1) + iVar5 & 0xfffffffe);
    uVar18 = iVar5 - local_11c;
    if (2 < (int)uVar18) {
      uVar22 = 2;
      lVar26 = 1;
      local_200 = (pointer)0x3;
      local_3c8 = 0;
      local_3e0 = (long *)local_330._24_8_;
      local_3d0 = local_2b8;
      do {
        local_348 = *local_138;
        piVar1 = (int *)(local_170 + local_348 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_340 = *(long *)local_1e8._80_8_;
        cVar3 = *(char *)(local_1e8._24_8_ + local_340 * uVar22);
        if (2 < iVar6) {
          local_368 = (long *)local_1e8._80_8_;
          local_350 = local_138;
          local_3f0 = 0;
          local_3d8 = local_1e8._24_8_;
          local_388 = local_170;
          local_260 = local_1e8._24_8_;
          local_1f8 = local_170;
          local_400 = 0;
          lVar42 = local_170;
          local_3f8 = local_170;
          uVar46 = local_348;
          lVar43 = local_1e8._24_8_;
          local_338 = local_340;
          local_3b0 = local_1e8._24_8_;
          uVar28 = local_348;
          local_3a0 = local_348;
          local_3e8 = (pointer)local_348;
          local_398 = (pointer)local_340;
          local_390 = local_348;
          local_378 = (pointer)local_340;
          local_360 = (pointer)local_340;
          local_220 = local_340;
          local_210 = local_348;
          local_1f0 = local_340;
          if (cVar3 == '\0') goto LAB_0015ea69;
LAB_0015e56c:
          lVar43 = uVar22 - 1;
          uVar46 = (ulong)(int)local_3f0;
          piVar1 = (int *)(local_348 * lVar43 + lVar42 + 4 + uVar46 * 4);
          *piVar1 = *piVar1 + 1;
          local_400 = local_3f0;
          local_3e0 = (long *)local_330._24_8_;
          if (*(char *)(uVar46 + 1 + local_340 * lVar43 + local_3b0) == '\0') {
            uVar28 = *local_350;
            piVar1 = (int *)(uVar28 * uVar22 + lVar42 + 4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            local_338 = *local_368;
            local_3d8 = local_3b0;
            local_378 = (pointer)local_338;
            local_3f8 = lVar42;
            local_3a0 = uVar28;
            local_360 = (pointer)local_338;
            local_348 = uVar28;
            local_340 = local_338;
            lVar45 = lVar42;
            uVar27 = uVar28;
            lVar48 = local_3b0;
            if (*(char *)(uVar46 + 1 + local_338 * uVar22 + local_3b0) != '\0') goto LAB_0015ecda;
            local_390 = *local_350;
            uVar20 = (ulong)(int)local_3f0;
            piVar1 = (int *)(local_390 * lVar43 + lVar42 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::length_;
            local_398 = (pointer)*local_368;
            local_3a8 = (long *)local_330._80_8_;
            if (*(char *)(uVar20 + lVar43 * (long)local_398 + local_3b0) == '\0') {
              lVar43 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar43] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar43] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar43] = uVar16;
              uVar16 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              uVar27 = *local_280;
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              local_358 = *(long *)local_330._80_8_;
              *(uint *)(local_358 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
              local_388 = lVar42;
              local_3d0 = local_2b8;
              uVar20 = local_3f0;
              local_208 = local_358;
              local_3e8 = (pointer)local_390;
              local_3c0 = local_280;
              local_3a0 = local_390;
              local_380 = uVar27;
              local_378 = local_398;
              local_360 = local_398;
              local_348 = local_390;
              local_340 = (long)local_398;
              local_338 = (long)local_398;
              local_260 = local_3b0;
              local_258 = uVar27;
              local_250 = uVar27;
              local_248 = lVar42;
              local_240 = local_358;
              local_238 = local_390;
              local_230 = local_358;
              local_228 = local_3b0;
              local_220 = (long)local_398;
              local_218 = local_390;
              local_210 = local_390;
              local_1f8 = lVar42;
              local_1f0 = (long)local_398;
              goto LAB_00160327;
            }
            local_3c0 = local_280;
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + uVar20 * 4);
            local_3d0 = local_2b8;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_380 = uVar27;
            local_358 = lVar42;
            local_258 = uVar27;
            local_250 = uVar27;
            local_240 = lVar42;
            local_230 = lVar42;
            goto LAB_001621b6;
          }
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * (uVar22 - 2));
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar46 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
LAB_00166f6c:
          *(uint *)(lVar43 * uVar22 + (long)local_3e0 + uVar46 * 4) = uVar16;
          local_3f0._0_4_ = (int)local_400;
          local_390._0_4_ = (int)local_3f0 + 2;
          local_3d0 = local_2b8;
          local_3f8 = local_170;
          local_3b0 = local_1e8._24_8_;
          local_3e0 = (long *)local_330._24_8_;
          if ((int)(uint)local_390 < local_370) {
            local_350 = local_138;
            local_348 = *local_138;
            local_220 = local_170 + local_348 * uVar22;
            local_368 = (long *)local_1e8._80_8_;
            local_338 = *(long *)local_1e8._80_8_;
            local_210 = uVar22 | 1;
            local_1f0 = uVar22 - 1;
            lVar38 = (long)(int)local_3f0;
            lVar37 = local_348 * local_1f0;
            lVar33 = local_338 * local_1f0;
            lVar50 = lVar38 << 0x20;
            lVar45 = local_348 * uVar22 + lVar38 * 4;
            local_1f8 = local_1e8._24_8_ + local_338 * uVar22;
            lVar35 = local_338 * uVar22 + lVar38;
            lVar55 = local_338 * (long)local_200 + lVar38;
            lVar48 = local_348 * (long)local_200 + lVar38 * 4;
            lVar40 = local_348 * lVar26 + lVar38 * 4;
            lVar44 = local_338 * lVar26 + lVar38;
            lVar47 = local_330._24_8_ + lVar38 * 4 + 8;
            lVar31 = lVar38 * 4 + 8;
            lVar42 = uVar22 - 2;
            lVar43 = lVar38 + 2;
            lVar36 = local_170 + lVar37;
            local_260 = local_1e8._24_8_ + lVar33;
            lVar41 = local_170 + 0xc + lVar45;
            lVar32 = local_1e8._24_8_ + 3 + lVar35;
            lVar54 = 0;
            do {
              piVar1 = (int *)(lVar41 + -4 + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              lVar39 = lVar50 >> 0x1e;
              local_378 = (pointer)local_338;
              local_388 = local_170;
              plVar30 = (long *)local_330._24_8_;
              local_340 = local_338;
              local_3e8 = (pointer)local_348;
              local_360 = (pointer)local_338;
              local_208 = lVar33;
              local_398 = (pointer)local_338;
              if (*(char *)(lVar32 + -1 + lVar54) == '\0') {
                piVar1 = (int *)(lVar48 + local_170 + 8 + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                local_400 = lVar43 + lVar54;
                local_3a0 = local_348;
                uVar28 = local_348;
                if (*(char *)(lVar54 + 2 + lVar55 + local_1e8._24_8_) == '\0') {
                  local_228 = local_1e8._24_8_;
                  local_248 = local_170;
                  local_3d8 = local_1e8._24_8_;
                  puVar29 = (pointer)local_348;
                  lVar45 = local_170;
                  lVar48 = local_338;
                  lVar40 = local_1e8._24_8_;
                  local_238 = local_348;
                  local_220 = local_338;
                  local_210 = local_348;
                  goto LAB_0015ec05;
                }
                lVar42 = local_348 * local_210 + local_170;
                lVar41 = local_210 * local_338 + local_1e8._24_8_;
                lVar45 = lVar50 + 0x300000000 >> 0x20;
                piVar1 = (int *)(local_220 + (lVar50 + 0x300000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar48 = lVar50 + 0x100000000 >> 0x20;
                if (*(char *)(local_1f8 + lVar45) == '\0') {
                  piVar1 = (int *)(lVar42 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = local_348;
                  if (*(char *)(lVar41 + lVar48) != '\0') {
                    local_3c0 = local_280;
                    uVar27 = *local_280;
                    piVar1 = (int *)((long)local_2b8 + lVar39 + uVar27 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    local_3a8 = (long *)local_330._80_8_;
                    local_358 = *(long *)local_330._80_8_;
                    lVar42 = local_358 * uVar22 + local_330._24_8_;
                    uVar23 = *(undefined4 *)(lVar39 + lVar42);
                    piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8
                                    );
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar42 + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
                    local_228 = local_1e8._24_8_;
                    local_248 = local_170;
                    local_3d8 = local_1e8._24_8_;
                    local_338 = local_338;
                    lVar42 = local_358;
                    local_380 = uVar27;
                    local_258 = uVar27;
                    local_250 = uVar27;
                    local_240 = local_358;
                    local_230 = local_358;
                    local_220 = local_338;
                    local_218 = local_348;
                    local_210 = local_348;
                    goto LAB_001609c2;
                  }
                  piVar1 = (int *)(local_220 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = RemSP::length_;
                  if (*(char *)(local_1f8 + lVar48) == '\0') {
                    lVar42 = (long)(int)RemSP::length_;
                    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar16;
                    uVar16 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    local_3c0 = local_280;
                    uVar27 = *local_280;
                    piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8
                                    );
                    *piVar1 = *piVar1 + 1;
                    local_3a8 = (long *)local_330._80_8_;
                    local_358 = *(long *)local_330._80_8_;
                    *(uint *)(local_358 * uVar22 + local_330._24_8_ + lVar38 * 4 + 8 + lVar54 * 4) =
                         uVar16;
                    local_228 = local_1e8._24_8_;
                    local_248 = local_170;
                    local_3d8 = local_1e8._24_8_;
                    local_338 = local_338;
                    lVar42 = local_358;
                    local_380 = uVar27;
                    local_258 = uVar27;
                    local_250 = uVar27;
                    local_240 = local_358;
                    local_230 = local_358;
                    local_220 = local_338;
                    local_218 = local_348;
                    local_210 = local_348;
                    goto LAB_001609c2;
                  }
                  local_3c0 = local_280;
                  uVar27 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar39 + uVar27 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  local_3a8 = (long *)local_330._80_8_;
                  local_358 = *(long *)local_330._80_8_;
                  lVar42 = local_358 * uVar22 + local_330._24_8_;
                  uVar23 = *(undefined4 *)(lVar39 + lVar42);
                  piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
                  local_228 = local_1e8._24_8_;
                  local_248 = local_170;
                  local_3d8 = local_1e8._24_8_;
                  local_338 = local_338;
                  lVar42 = local_358;
                  local_380 = uVar27;
                  local_258 = uVar27;
                  local_250 = uVar27;
                  local_240 = local_358;
                  local_230 = local_358;
                  local_220 = local_338;
                  local_218 = local_348;
                  local_210 = local_348;
                  goto LAB_001609c2;
                }
                piVar1 = (int *)(local_220 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_1f8 + lVar48) != '\0') goto LAB_00167777;
                piVar1 = (int *)(lVar42 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar41 + lVar48) == '\0') {
                  local_228 = local_1e8._24_8_;
                  local_248 = local_170;
                  local_3d8 = local_1e8._24_8_;
                  lVar42 = local_170;
                  local_238 = local_348;
                  goto LAB_0015ec3a;
                }
                piVar1 = (int *)(lVar36 + lVar45 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar45 + local_260) != '\0') goto LAB_0016779f;
                piVar1 = (int *)(lVar36 + (lVar50 + 0x400000000 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_260 + (lVar50 + 0x400000000 >> 0x20)) != '\0')
                goto LAB_00165592;
                piVar1 = (int *)(lVar40 + local_170 + 8 + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                local_3c0 = local_280;
                local_380 = *local_280;
                if (*(char *)(lVar54 + 2 + lVar44 + local_1e8._24_8_) != '\0') {
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + local_380 * local_3c8 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3a8 = (long *)local_330._80_8_;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar16 = *(uint *)(lVar42 * local_3c8 + local_330._24_8_ + lVar38 * 4 + 8 +
                                    lVar54 * 4);
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar46 = local_400 & 0xffffffff;
                  uVar20 = local_400;
                  goto LAB_0015edca;
                }
                piVar1 = (int *)((long)local_2b8 + lVar39 + local_380 * uVar22);
                *piVar1 = *piVar1 + 1;
                local_230 = *(long *)local_330._80_8_;
                lVar42 = local_230 * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar39 + lVar42);
                piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8)
                ;
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar42 + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
LAB_00168772:
                local_400 = lVar43 + lVar54;
                local_248 = local_170;
                local_3a8 = (long *)local_330._80_8_;
                local_3c0 = local_280;
                lVar43 = local_1e8._24_8_;
                lVar36 = local_338;
                lVar42 = local_230;
                lVar45 = local_1e8._24_8_;
                local_3a0 = local_348;
                local_258 = local_380;
                local_238 = local_348;
                goto LAB_00162ac7;
              }
              piVar1 = (int *)(lVar41 + -8 + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              iVar49 = (int)lVar43;
              if ((*(char *)(lVar32 + -2 + lVar54) != '\0') ||
                 (piVar1 = (int *)(local_170 + lVar48 + 4 + lVar54 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(local_1e8._24_8_ + lVar55 + 1 + lVar54) != '\0')) {
                local_400 = (ulong)(uint)(iVar49 + (int)lVar54);
                goto LAB_001654c3;
              }
              piVar1 = (int *)(local_170 + lVar40 + 0xc + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar44 + 3 + lVar54) == '\0') {
                piVar1 = (int *)(lVar45 + local_170 + 0xc + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                uVar20 = lVar43 + lVar54;
                local_3d8 = local_1e8._24_8_;
                local_3a8 = (long *)local_330._80_8_;
                local_3c0 = local_280;
                if (*(char *)(lVar54 + 3 + lVar35 + local_1e8._24_8_) != '\0') {
                  piVar1 = (int *)(lVar36 + (lVar50 + 0x400000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  cVar3 = *(char *)(local_260 + (lVar50 + 0x400000000 >> 0x20));
                  piVar1 = (int *)(lVar40 + local_170 + 8 + lVar54 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar4 = *(char *)(lVar54 + 2 + lVar44 + local_1e8._24_8_);
                  if (cVar3 != '\0') {
                    local_400 = uVar20;
                    if (cVar4 != '\0') goto LAB_0015ed2d;
                    lVar42 = lVar50 + 0x300000000 >> 0x20;
                    goto LAB_001682dc;
                  }
                  local_380 = *local_280;
                  if (cVar4 != '\0') {
                    piVar1 = (int *)((long)local_2b8 +
                                    lVar54 * 4 + lVar38 * 4 + local_380 * local_3c8 + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_330._80_8_;
                    uVar16 = *(uint *)(lVar42 * local_3c8 + local_330._24_8_ + lVar38 * 4 + 8 +
                                      lVar54 * 4);
                    piVar1 = (int *)((long)local_2b8 +
                                    lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar46 = uVar20 & 0xffffffff;
                    goto LAB_0015edca;
                  }
                  piVar1 = (int *)((long)local_2b8 + lVar39 + local_380 * lVar42);
                  *piVar1 = *piVar1 + 1;
                  local_230 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)(lVar39 + lVar42 * local_230 + local_330._24_8_);
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + local_380 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (local_230 * uVar22 + local_330._24_8_ + lVar38 * 4 + 8 + lVar54 * 4) = uVar23;
                  goto LAB_00168772;
                }
                piVar1 = (int *)(lVar40 + local_170 + 8 + lVar54 * 4);
                *piVar1 = *piVar1 + 1;
                uVar27 = *local_280;
                local_250 = uVar27;
                local_380 = uVar27;
                local_258 = uVar27;
                if (*(char *)(lVar54 + 2 + lVar44 + local_1e8._24_8_) != '\0') {
                  piVar1 = (int *)((long)local_2b8 +
                                  lVar54 * 4 + lVar38 * 4 + uVar27 * local_3c8 + 8);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar16 = *(uint *)(lVar42 * local_3c8 + local_330._24_8_ + lVar38 * 4 + 8 +
                                    lVar54 * 4);
                  piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_400 = uVar20 & 0xffffffff;
                  local_358 = lVar42;
                  local_240 = lVar42;
                  local_230 = lVar42;
                  goto LAB_001621b6;
                }
                piVar1 = (int *)((long)local_2b8 + lVar39 + uVar27 * lVar42);
                *piVar1 = *piVar1 + 1;
                local_358 = *(long *)local_330._80_8_;
                uVar23 = *(undefined4 *)(lVar39 + lVar42 * local_358 + local_330._24_8_);
                piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar38 * 4 + uVar27 * uVar22 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_358 * uVar22 + local_330._24_8_ + lVar38 * 4 + 8 + lVar54 * 4)
                     = uVar23;
                local_390 = local_348;
                local_208 = local_358;
                local_3f8 = local_170;
                local_3e8 = (pointer)local_348;
                local_3b0 = local_3d8;
                local_3a0 = local_348;
                local_260 = local_3d8;
                local_248 = local_170;
                local_240 = local_358;
                local_238 = local_348;
                local_230 = local_358;
                local_228 = local_3d8;
                local_220 = local_338;
                local_218 = local_348;
                local_210 = local_348;
                local_1f8 = local_170;
                local_1f0 = local_338;
                goto LAB_00160327;
              }
              piVar1 = (int *)(local_170 + lVar40 + 8 + lVar54 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar44 + 2 + lVar54) == '\0') goto LAB_001678ff;
              lVar39 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + local_3c8 * lVar39 + lVar31);
              *piVar1 = *piVar1 + 1;
              lVar8 = *(long *)local_330._80_8_;
              uVar23 = *(undefined4 *)(local_3c8 * lVar8 + lVar47 + lVar54 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar54 * 4 + lVar39 * uVar22 + lVar31);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar8 * uVar22 + lVar47 + lVar54 * 4) = uVar23;
              lVar50 = lVar50 + 0x200000000;
              lVar39 = lVar43 + lVar54;
              lVar54 = lVar54 + 2;
              if ((long)uVar51 <= lVar39 + 2) {
                local_3f0._0_4_ = (int)local_3f0 + (int)lVar54;
                local_390._0_4_ = iVar49 + (int)lVar54;
                break;
              }
            } while( true );
          }
          local_348 = *local_138;
          lVar42 = local_348 * uVar22 + local_170;
          local_400 = (ulong)(int)(uint)local_390;
          piVar1 = (int *)(lVar42 + local_400 * 4);
          *piVar1 = *piVar1 + 1;
          local_340 = *(long *)local_1e8._80_8_;
          lVar43 = local_340 * uVar22 + local_1e8._24_8_;
          if (local_370 < (int)(uint)local_390) {
            if (*(char *)(local_400 + lVar43) == '\0') {
              lVar48 = local_348 * (uVar22 | 1);
              piVar1 = (int *)(local_170 + lVar48 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              lVar45 = local_340 * (uVar22 | 1);
              if (*(char *)(local_400 + local_1e8._24_8_ + lVar45) == '\0') {
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + *local_280 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)
                 (*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) = 0;
              }
              else {
LAB_00167610:
                lVar40 = (long)(int)local_3f0;
                piVar1 = (int *)(local_170 + lVar48 + 4 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar40 + 1 + local_1e8._24_8_ + lVar45) == '\0') {
                  piVar1 = (int *)(lVar42 + 4 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = RemSP::length_;
                  if (*(char *)(lVar40 + 1 + lVar43) == '\0') {
                    lVar42 = (long)(int)RemSP::length_;
                    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar16;
                    uVar16 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    piVar1 = (int *)((long)local_2b8 +
                                    (long)(int)(uint)local_390 * 4 + *local_280 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ +
                             (long)(int)(uint)local_390 * 4) = uVar16;
                  }
                  else {
                    lVar43 = *local_280;
                    piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar43 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                    uVar23 = *(undefined4 *)(lVar42 + lVar40 * 4);
                    local_400 = (ulong)(int)(uint)local_390;
                    piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * uVar22);
                    *piVar1 = *piVar1 + 1;
LAB_00161689:
                    *(undefined4 *)(lVar42 + local_400 * 4) = uVar23;
                  }
                }
                else {
                  lVar42 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar42 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                  uVar23 = *(undefined4 *)(lVar43 + lVar40 * 4);
                  piVar1 = (int *)((long)local_2b8 +
                                  (long)(int)(uint)local_390 * 4 + lVar42 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar43 + (long)(int)(uint)local_390 * 4) = uVar23;
                }
              }
            }
            else {
              lVar45 = (long)(int)local_3f0;
              piVar1 = (int *)(lVar42 + 4 + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              if ((*(char *)(lVar43 + 1 + lVar45) == '\0') &&
                 (piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar45 * 4),
                 *piVar1 = *piVar1 + 1,
                 *(char *)(lVar45 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')) {
                lVar43 = local_348 * (uVar22 - 1);
                lVar42 = local_340 * (uVar22 - 1);
LAB_00167e52:
                piVar1 = (int *)(local_170 + lVar43 + local_400 * 4);
                *piVar1 = *piVar1 + 1;
                lVar43 = uVar22 - 2;
                lVar45 = *local_280;
                if (*(char *)(local_400 + local_1e8._24_8_ + lVar42) == '\0') {
                  piVar1 = (int *)((long)local_2b8 + (long)(int)local_3f0 * 4 + lVar45 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)
                            (lVar43 * lVar42 + local_330._24_8_ + (long)(int)local_3f0 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar45 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
                }
                else {
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar45 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)(lVar43 * lVar42 + local_330._24_8_ + local_400 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar45 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
                }
              }
              else {
                lVar43 = *local_280;
                piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar42 + lVar45 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
LAB_00167302:
                *(undefined4 *)(lVar42 + local_400 * 4) = uVar23;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
              }
            }
            goto LAB_00167b4a;
          }
          if (*(char *)(local_400 + lVar43) == '\0') {
            lVar48 = local_348 * (uVar22 | 1);
            piVar1 = (int *)(local_170 + lVar48 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            lVar45 = (uVar22 | 1) * local_340;
            if (*(char *)(local_400 + local_1e8._24_8_ + lVar45) == '\0') goto LAB_00167a72;
            lVar40 = (long)(int)local_3f0;
            piVar1 = (int *)(lVar42 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + 3 + lVar40) == '\0') goto LAB_00167610;
            piVar1 = (int *)(lVar42 + 4 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + 1 + lVar40) != '\0') goto LAB_00167352;
            piVar1 = (int *)(local_170 + lVar48 + 4 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1e8._24_8_ + lVar45 + 1 + lVar40) == '\0') goto LAB_0015e492;
            lVar43 = local_348 * (uVar22 - 1);
            piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = (uVar22 - 1) * local_340;
            if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar42) == '\0') {
              piVar1 = (int *)(local_170 + lVar43 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar42 + local_400) == '\0') {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar43 + lVar40 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 + local_400 * 4) = uVar23;
              }
              else {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar43 + local_330._24_8_ + local_400 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
              }
              goto LAB_00167b4a;
            }
          }
          else {
            lVar45 = (long)(int)local_3f0;
            piVar1 = (int *)(lVar42 + 4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            if ((*(char *)(lVar43 + 1 + lVar45) == '\0') &&
               (piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar45 * 4),
               *piVar1 = *piVar1 + 1,
               *(char *)(lVar45 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')) {
              lVar43 = local_348 * (uVar22 - 1);
              piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = (uVar22 - 1) * local_340;
              if (*(char *)(lVar45 + 3 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_00167e52;
              piVar1 = (int *)(local_170 + lVar43 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_1e8._24_8_ + lVar42 + local_400) == '\0') {
LAB_0016879b:
                lVar42 = uVar22 - 2;
                piVar1 = (int *)(local_348 * lVar42 + local_3f8 + local_400 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_400 + local_340 * lVar42 + local_3b0) != '\0') {
                  lVar43 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * lVar42);
                  *piVar1 = *piVar1 + 1;
                  lVar45 = *(long *)local_330._80_8_;
                  uVar23 = *(undefined4 *)(lVar42 * lVar45 + local_330._24_8_ + local_400 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = lVar45 * uVar22 + local_330._24_8_;
                  goto LAB_00167302;
                }
                lVar43 = *local_280;
                piVar1 = (int *)((long)local_2b8 +
                                (long)(int)(uint)local_390 * 4 + lVar43 * lVar42 + -8);
                *piVar1 = *piVar1 + 1;
                lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
                uVar16 = *(uint *)(lVar45 + -8 + (long)(int)(uint)local_390 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar43 * lVar42);
                *piVar1 = *piVar1 + 1;
                uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar45 + local_400 * 4));
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + *local_280 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) =
                     uVar16;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
              }
              else {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar43 + local_330._24_8_ + local_400 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + local_400 * 4) = uVar23;
              }
              goto LAB_00167b4a;
            }
LAB_00167352:
            lVar45 = (long)(int)(uint)local_390;
            lVar43 = local_348 * (uVar22 - 1);
            piVar1 = (int *)(local_170 + lVar43 + 4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = (uVar22 - 1) * local_340;
            if (*(char *)(lVar45 + 1 + local_1e8._24_8_ + lVar42) == '\0') {
              lVar42 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
              uVar23 = *(undefined4 *)(lVar43 + -8 + lVar45 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar43 + lVar45 * 4) = uVar23;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
              goto LAB_00167b4a;
            }
          }
LAB_00167381:
          lVar45 = (long)(int)(uint)local_390;
          piVar1 = (int *)(lVar43 + local_170 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = uVar22 - 2;
          if (*(char *)(lVar45 + lVar42 + local_1e8._24_8_) == '\0') {
            piVar1 = (int *)(local_170 + local_348 * lVar43 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(lVar45 + local_1e8._24_8_ + local_340 * lVar43);
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * lVar43);
            *piVar1 = *piVar1 + 1;
            lVar48 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar43 * lVar48 + local_330._24_8_ + lVar45 * 4);
            if (cVar3 == '\0') {
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(local_330._24_8_ + lVar48 * uVar22 + -8 + lVar45 * 4);
LAB_0016134f:
              uVar16 = RemSP::MemMerge(uVar16,uVar17);
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16
              ;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
            }
            else {
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
              *piVar1 = *piVar1 + 1;
LAB_001674e7:
              *(uint *)(lVar48 * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
            }
          }
          else {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * lVar43);
            *piVar1 = *piVar1 + 1;
            lVar48 = *(long *)local_330._80_8_;
            uVar23 = *(undefined4 *)(lVar43 * lVar48 + local_330._24_8_ + lVar45 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar48 * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar23;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
          goto LAB_00167b4a;
        }
        if (iVar6 == 2) {
          local_390._0_4_ = 0;
          if (cVar3 == '\0') {
            local_400 = 0;
LAB_0015e68d:
            local_390._0_4_ = (uint)local_400;
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
LAB_00167a72:
              lVar45 = (long)(int)(uint)local_390;
              local_348 = *local_138;
              piVar1 = (int *)(local_348 * uVar22 + local_170 + 4 + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              local_340 = *(long *)local_1e8._80_8_;
              if (*(char *)(lVar45 + 1 + local_340 * uVar22 + local_1e8._24_8_) != '\0')
              goto LAB_0015e492;
              lVar45 = lVar45 + 1;
LAB_00167ac5:
              piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar45 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = (long)(int)(uint)local_390;
              if (*(char *)(lVar45 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4)
                     = 0;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
                goto LAB_00167b4a;
              }
            }
            else {
              piVar1 = (int *)(local_348 * uVar22 + local_170 + 4 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + 1 + local_340 * uVar22 + local_1e8._24_8_) != '\0')
              goto LAB_0015e492;
            }
LAB_00167aeb:
            uVar16 = RemSP::length_;
            lVar43 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar43] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar43] = uVar16;
            uVar16 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar16;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
          else {
LAB_0015e492:
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + 4 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            local_400 = (ulong)(uint)local_390;
            if (*(char *)(lVar42 + 1 + (uVar22 - 1) * local_340 + local_1e8._24_8_) == '\0')
            goto LAB_0015e601;
LAB_0015e624:
            lVar43 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            lVar45 = *(long *)local_330._80_8_;
            uVar23 = *(undefined4 *)((uVar22 - 2) * lVar45 + local_330._24_8_ + lVar42 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar45 * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar23;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
        }
        else {
          local_400 = 0;
          if (cVar3 != '\0') {
LAB_0015e601:
            lVar42 = (long)(int)local_400;
            piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + local_340 * (uVar22 - 1) + local_1e8._24_8_) == '\0')
            goto LAB_00167aeb;
            goto LAB_0015e624;
          }
          lVar42 = 0;
LAB_0015e6ec:
          piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::length_;
          local_3d0 = local_2b8;
          local_3e0 = (long *)local_330._24_8_;
          if (*(char *)(lVar42 + local_340 * (uVar22 | 1) + local_1e8._24_8_) == '\0') {
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4) = 0;
          }
          else {
            lVar43 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar43] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar43] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar43] = uVar16;
            uVar16 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
            piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar16;
          }
        }
LAB_00167b4a:
        uVar22 = uVar22 + 2;
        lVar26 = lVar26 + 2;
        local_3c8 = local_3c8 + 2;
        local_200 = (pointer)((long)local_200 + 2);
      } while (uVar22 < uVar18);
    }
    this = local_268;
    if (local_11c == 1) {
      lVar26 = uVar34 - 1;
      uVar18 = 0;
      iVar49 = (int)lVar26;
      if (2 < iVar6) {
        lVar42 = (long)(iVar5 + -2);
        lVar43 = (long)(iVar5 + -3);
        local_200 = (pointer)(uVar51 & 0xffffffff);
        local_3f0 = *(ulong *)local_1e8._80_8_;
        uVar16 = 0xfffffffe;
        uVar51 = 0;
        local_380 = local_1e8._24_8_;
        do {
          local_3c0 = (long *)*local_138;
          lVar45 = (long)local_3c0 * lVar26 + local_170;
          uVar18 = (uint)uVar51;
          local_410 = (ulong)(int)uVar18;
          piVar1 = (int *)(lVar45 + local_410 * 4);
          *piVar1 = *piVar1 + 1;
          lVar48 = local_3f0 * lVar26 + local_380;
          plVar30 = (long *)local_170;
          local_3b0 = local_170;
          local_368 = (long *)local_380;
          local_350 = (ulong *)local_380;
          local_3a8 = (long *)local_170;
          if (*(char *)(local_410 + lVar48) == '\0') goto LAB_00168e6d;
          lVar41 = (long)(int)uVar16;
          lVar40 = (long)local_3c0 * lVar42;
          piVar1 = (int *)(lVar40 + local_170 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = local_3f0 * lVar42;
          if (*(char *)(lVar41 + 3 + local_380 + lVar36) != '\0') {
            local_400 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3d8 = *(long *)local_330._80_8_;
            uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + local_410 * 4);
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            local_3e8 = local_2b8;
            local_380 = local_330._24_8_;
            this = local_268;
            local_3a0 = local_330._24_8_;
            goto LAB_0016b23e;
          }
          piVar1 = (int *)(lVar45 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar48 + 3 + lVar41) != '\0') {
LAB_00168fd4:
            uVar18 = (uint)uVar51;
            local_410 = (ulong)(int)uVar18;
            piVar1 = (int *)(lVar40 + (long)plVar30 + 8 + local_410 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)(local_410 + 2 + lVar36 + local_380);
            piVar1 = (int *)(lVar40 + (long)plVar30 + local_410 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::length_;
            cVar4 = *(char *)(local_410 + lVar36 + local_380);
            this = local_268;
            puVar29 = local_2b8;
            local_388 = local_330._24_8_;
            local_220 = (long)plVar30;
            if (cVar3 != '\0') {
              if (cVar4 != '\0') goto LAB_00169040;
              local_3e0 = local_280;
              local_400 = *local_280;
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43 + 8);
              *piVar1 = *piVar1 + 1;
              local_3d0 = (pointer)local_330._80_8_;
              local_3d8 = *(long *)local_330._80_8_;
              uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + local_410 * 4);
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
              *piVar1 = *piVar1 + 1;
              local_3f8 = local_330._24_8_;
              local_3a0 = local_330._24_8_;
              local_3e8 = local_2b8;
              local_398 = local_2b8;
              uVar22 = local_410;
              local_378 = local_2b8;
              lVar45 = local_330._24_8_;
              goto LAB_0016a266;
            }
            if (cVar4 == '\0') {
              lVar45 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar45] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar45] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar45] = uVar16;
              uVar16 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              local_3e0 = local_280;
              local_400 = *local_280;
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
              *piVar1 = *piVar1 + 1;
              local_3d0 = (pointer)local_330._80_8_;
              local_3d8 = *(long *)local_330._80_8_;
              local_3f8 = local_330._24_8_;
              local_398 = local_2b8;
              local_3e8 = local_2b8;
              local_3a0 = local_330._24_8_;
              goto LAB_00169cdf;
            }
            local_3e0 = local_280;
            local_400 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3d0 = (pointer)local_330._80_8_;
            local_3d8 = *(long *)local_330._80_8_;
            local_3f8 = local_330._24_8_;
            local_398 = local_2b8;
            local_3a0 = local_330._24_8_;
            local_360 = local_2b8;
            local_260 = local_330._24_8_;
            local_378 = local_2b8;
            lVar45 = local_330._24_8_;
LAB_00169174:
            lVar48 = local_3d8 * lVar43;
            uVar23 = *(undefined4 *)(lVar45 + lVar48 + local_410 * 4);
            lVar45 = local_400 * lVar26;
            piVar1 = (int *)((long)puVar29 + local_410 * 4 + lVar45);
            *piVar1 = *piVar1 + 1;
            lVar36 = local_3d8 * lVar26 + local_388;
            *(undefined4 *)(lVar36 + local_410 * 4) = uVar23;
            lVar40 = (long)(int)uVar18;
            uVar51 = lVar40 + 2;
            uVar18 = (uint)uVar51;
            if ((int)uVar18 < local_370) {
              lVar41 = (long)local_3c0 * lVar26 + (long)local_3a8;
              piVar1 = (int *)(lVar41 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar32 = local_3f0 * lVar26 + (long)local_368;
              if (*(char *)(lVar40 + 2 + lVar32) == '\0') {
                local_3b0 = (long)local_3a8;
                uVar51 = uVar51 & 0xffffffff;
                plVar30 = local_3a8;
                local_380 = (long)local_368;
                goto LAB_00169fa0;
              }
              lVar31 = (long)local_3c0 * lVar42 + (long)local_3a8;
              piVar1 = (int *)(lVar31 + 0xc + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar33 = local_3f0 * lVar42 + (long)local_368;
              local_410 = uVar51;
              if (*(char *)(lVar40 + 3 + lVar33) != '\0') {
                piVar1 = (int *)((long)local_3a8 + (long)local_3c0 * lVar43 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar40 + 2 + (long)local_368 + local_3f0 * lVar43) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_388 + lVar48 + 8 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar36 + lVar40 * 4);
                  goto LAB_00169dc1;
                }
                uVar51 = uVar51 & 0xffffffff;
LAB_0016ab5a:
                local_410 = (ulong)(int)uVar51;
                piVar1 = (int *)(*local_138 * lVar43 + local_170 + -4 + local_410 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((local_410 - 1) +
                             *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_) == '\0') {
                  lVar45 = *local_280;
                  local_410 = (ulong)(int)uVar51;
                  piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar43 + -8);
                  *piVar1 = *piVar1 + 1;
                  lVar48 = *(long *)local_330._80_8_ * lVar43 + local_330._24_8_;
                  uVar18 = *(uint *)(lVar48 + -8 + local_410 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar48 + local_410 * 4);
                  goto LAB_0016baa1;
                }
                local_400 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
                *piVar1 = *piVar1 + 1;
                local_3d0 = (pointer)local_330._80_8_;
                local_3e8 = local_2b8;
                local_3a0 = local_330._24_8_;
                goto LAB_0016b82e;
              }
              piVar1 = (int *)(lVar41 + 0xc + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar32 + 3 + lVar40) != '\0') {
                piVar1 = (int *)(lVar31 + 0x10 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar33 + 4 + lVar40) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(lVar36 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar36 + 8 + lVar40 * 4) = uVar23;
                  local_3a0 = local_260;
                  goto LAB_0016a842;
                }
                lVar32 = (long)local_3a8 + (long)local_3c0 * lVar43;
                piVar1 = (int *)(lVar32 + 0xc + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar41 = local_3f0 * lVar43;
                if (*(char *)(lVar40 + 3 + (long)local_368 + lVar41) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_388 + lVar48 + 0x10 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar36 + lVar40 * 4));
                  local_400 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_330._80_8_;
                  goto LAB_00169f2f;
                }
                piVar1 = (int *)(lVar32 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)((long)local_368 + lVar41 + 2 + lVar40) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_388 + lVar48 + 0x10 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar36 + lVar40 * 4));
                  local_400 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_330._80_8_;
                  local_388 = local_330._24_8_;
                  uVar22 = uVar51;
                  local_378 = local_2b8;
                  puVar29 = local_2b8;
                  lVar45 = local_330._24_8_;
                  uVar51 = uVar51 & 0xffffffff;
                  local_3f8 = local_330._24_8_;
                  local_3e8 = local_2b8;
                  local_3e0 = local_280;
                  local_3d0 = (pointer)local_330._80_8_;
                  local_3a0 = local_330._24_8_;
                  local_398 = local_2b8;
                  goto LAB_0016a266;
                }
                uVar51 = uVar51 & 0xffffffff;
                lVar45 = local_260;
                local_3e8 = puVar29;
                local_380 = local_388;
LAB_0016ad5a:
                iVar24 = (int)uVar51;
                uVar22 = (ulong)iVar24;
                piVar1 = (int *)(*local_138 * lVar43 + local_170 + -4 + uVar22 * 4);
                *piVar1 = *piVar1 + 1;
                lVar48 = (long)(iVar24 + 2);
                if (*(char *)((uVar22 - 1) + lVar41 + (long)local_368) != '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + *local_3e0 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_380 + *(long *)local_3d0 * lVar43 + lVar48 * 4);
                  local_400 = *local_3e0;
                  piVar1 = (int *)((long)local_378 + uVar22 * 4 + local_400 * lVar26);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_3d0;
                  local_388 = lVar45;
                  puVar29 = local_378;
                  local_3e8 = local_360;
                  goto LAB_0016a266;
                }
                lVar40 = *local_3e0;
                piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar40 * lVar43);
                *piVar1 = *piVar1 + 1;
                lVar36 = *(long *)local_3d0;
                uVar18 = *(uint *)(lVar36 * lVar43 + lVar45 + lVar48 * 4);
                uVar22 = (ulong)iVar24;
                piVar1 = (int *)((long)local_378 + uVar22 * 4 + lVar40 * lVar26 + -8);
                *piVar1 = *piVar1 + 1;
                uVar16 = *(uint *)(lVar36 * lVar26 + lVar45 + -8 + uVar22 * 4);
LAB_00169452:
                uVar18 = RemSP::MemMerge(uVar18,uVar16);
                local_400 = *local_280;
                piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
                *piVar1 = *piVar1 + 1;
                local_3d8 = *(long *)local_330._80_8_;
                do {
                  local_3f8 = local_330._24_8_;
                  local_3a0 = local_330._24_8_;
                  local_3e8 = local_2b8;
                  local_398 = local_2b8;
                  local_388 = local_330._24_8_;
                  local_378 = local_2b8;
                  puVar29 = local_2b8;
                  lVar45 = local_330._24_8_;
                  local_3e0 = local_280;
                  local_3d0 = (pointer)local_330._80_8_;
LAB_0016a266:
                  *(uint *)(local_3d8 * lVar26 + local_388 + uVar22 * 4) = uVar18;
                  local_3b0._0_4_ = (int)uVar51;
                  uVar18 = (int)local_3b0 + 2;
                  if (local_370 <= (int)uVar18) {
LAB_0016c1d8:
                    if (local_370 < (int)uVar18) {
                      local_3f0 = *(ulong *)local_1e8._80_8_;
                      local_3a0 = lVar45;
                      local_368 = (long *)local_1e8._24_8_;
                      goto LAB_0016c942;
                    }
                    uVar51 = *local_138;
                    lVar41 = uVar51 * lVar26 + local_170;
                    lVar48 = (long)(int)uVar18;
                    piVar1 = (int *)(lVar41 + lVar48 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar45 = *(long *)local_1e8._80_8_;
                    lVar36 = lVar45 * lVar26 + local_1e8._24_8_;
                    lVar40 = (long)(int)local_3b0;
                    if (*(char *)(lVar48 + lVar36) == '\0') {
                      piVar1 = (int *)(lVar41 + 0xc + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar36 + 3 + lVar40) == '\0') {
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_388 + local_3d8 * lVar26 + lVar48 * 4) = 0;
                      }
                      else {
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar43);
                        *piVar1 = *piVar1 + 1;
                        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_388 + lVar48 * 4);
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_3d8 * lVar26 + local_388 + lVar48 * 4) = uVar23;
                      }
                    }
                    else {
                      piVar1 = (int *)(local_170 + uVar51 * lVar42 + 0xc + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar45 * lVar42) == '\0') {
                        piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        local_388 = local_388 + local_3d8 * lVar26;
                        uVar23 = *(undefined4 *)(local_388 + lVar40 * 4);
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_388 + lVar48 * 4) = uVar23;
                      }
                      else {
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar43);
                        *piVar1 = *piVar1 + 1;
                        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_388 + lVar48 * 4);
                        piVar1 = (int *)((long)puVar29 + lVar48 * 4 + local_400 * lVar26);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(local_3d8 * lVar26 + local_388 + lVar48 * 4) = uVar23;
                      }
                    }
                    goto LAB_0016d178;
                  }
                  lVar40 = (long)(int)local_3b0;
                  lVar41 = lVar40 << 0x20;
                  lVar48 = lVar40 * 4;
                  lVar36 = 0;
                  local_360 = local_3e8;
                  local_3e8 = puVar29;
                  local_380 = local_388;
                  local_260 = lVar45;
                  while( true ) {
                    local_3c0 = (long *)*local_138;
                    lVar31 = (long)local_3c0 * lVar26 + local_170;
                    lVar45 = lVar31 + lVar48;
                    piVar1 = (int *)(lVar45 + 8 + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    local_3f0 = *(ulong *)local_1e8._80_8_;
                    lVar33 = local_3f0 * lVar26 + local_1e8._24_8_;
                    lVar32 = lVar33 + lVar40;
                    local_3a8 = (long *)local_170;
                    this = local_268;
                    if (*(char *)(lVar36 + 2 + lVar32) == '\0') break;
                    lVar31 = (long)local_3c0 * lVar42 + local_170 + lVar48;
                    piVar1 = (int *)(lVar31 + 0xc + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar33 = local_3f0 * lVar42 + local_1e8._24_8_ + lVar40;
                    iVar52 = (int)lVar36;
                    iVar24 = (int)(lVar40 + 2);
                    if (*(char *)(lVar36 + 3 + lVar33) != '\0') {
                      piVar1 = (int *)((long)puVar29 +
                                      lVar36 * 4 + lVar40 * 4 + local_400 * lVar43 + 8);
                      *piVar1 = *piVar1 + 1;
                      uVar18 = *(uint *)(local_3d8 * lVar43 + local_388 + lVar40 * 4 + 8 +
                                        lVar36 * 4);
                      piVar1 = (int *)((long)puVar29 +
                                      lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
                      *piVar1 = *piVar1 + 1;
                      uVar51 = (ulong)(uint)(iVar24 + iVar52);
                      local_410 = lVar40 + lVar36 + 2;
                      local_380 = local_380;
                      local_3a0 = local_388;
                      goto LAB_0016b23e;
                    }
                    piVar1 = (int *)(lVar45 + 0xc + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar45 = lVar41 >> 0x1e;
                    if (*(char *)(lVar36 + 3 + lVar32) == '\0') {
                      piVar1 = (int *)((long)puVar29 + lVar45 + local_400 * lVar26);
                      *piVar1 = *piVar1 + 1;
                      local_388 = local_388 + local_3d8 * lVar26;
                      uVar23 = *(undefined4 *)(lVar45 + local_388);
                      piVar1 = (int *)((long)puVar29 +
                                      lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(local_388 + lVar40 * 4 + 8 + lVar36 * 4) = uVar23;
                      local_350 = (ulong *)local_1e8._24_8_;
                      uVar16 = iVar24 + iVar52;
                      goto LAB_0016bdad;
                    }
                    piVar1 = (int *)(lVar31 + 0x10 + lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar36 + 4 + lVar33) == '\0') goto LAB_0016a6d2;
                    piVar1 = (int *)(local_170 + lVar48 + (long)local_3c0 * lVar43 + 0xc +
                                    lVar36 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar3 = *(char *)(lVar36 + 3 + local_1e8._24_8_ + lVar40 + local_3f0 * lVar43);
                    piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar48 + local_400 * lVar43 + 0x10
                                    );
                    *piVar1 = *piVar1 + 1;
                    lVar32 = local_3d8 * lVar26 + local_388;
                    uVar18 = *(uint *)(local_3d8 * lVar43 + local_388 + lVar48 + 0x10 + lVar36 * 4);
                    lVar45 = lVar48 + local_400 * lVar26;
                    if (cVar3 == '\0') {
                      piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar45);
                      *piVar1 = *piVar1 + 1;
                      uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar32 + lVar48 + lVar36 * 4));
                      local_3e0 = local_280;
                      local_400 = *local_280;
                      piVar1 = (int *)((long)local_2b8 +
                                      lVar36 * 4 + lVar48 + local_400 * lVar26 + 8);
                      *piVar1 = *piVar1 + 1;
                      local_3d0 = (pointer)local_330._80_8_;
                      local_3d8 = *(long *)local_330._80_8_;
                      lVar32 = local_3d8 * lVar26 + local_330._24_8_;
                      local_3a0 = local_330._24_8_;
                      local_360 = local_2b8;
                      local_260 = local_330._24_8_;
                      local_378 = local_2b8;
                      local_380 = local_330._24_8_;
                      local_3e8 = local_2b8;
                      local_3f8 = local_330._24_8_;
                      local_388 = local_330._24_8_;
                      local_398 = local_2b8;
                      puVar29 = local_2b8;
                    }
                    else {
                      piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar45 + 8);
                      *piVar1 = *piVar1 + 1;
                    }
                    *(uint *)(lVar32 + lVar48 + 8 + lVar36 * 4) = uVar18;
                    lVar41 = lVar41 + 0x200000000;
                    lVar45 = lVar40 + lVar36;
                    lVar36 = lVar36 + 2;
                    if ((long)local_200 <= lVar45 + 4) {
                      uVar18 = (int)local_3b0 + (int)lVar36 + 2;
                      local_3b0._0_4_ = (int)local_3b0 + (int)lVar36;
                      this = local_268;
                      lVar45 = local_260;
                      goto LAB_0016c1d8;
                    }
                  }
                  local_368 = (long *)local_1e8._24_8_;
                  uVar51 = lVar40 + 2 + lVar36;
                  uVar18 = (uint)uVar51;
                  piVar1 = (int *)(lVar31 + (lVar41 + 0x300000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  lVar45 = lVar41 + 0x300000000 >> 0x20;
                  local_410 = lVar40 + 2 + lVar36;
                  if (*(char *)(lVar33 + lVar45) == '\0') {
                    local_400 = *local_3e0;
                    piVar1 = (int *)((long)local_360 +
                                    lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_350 = (ulong *)local_1e8._24_8_;
                    local_3e8 = local_360;
                    local_380 = local_1e8._24_8_;
                    plVar30 = (long *)local_170;
                    local_3b0 = local_170;
                    goto LAB_00169744;
                  }
                  lVar48 = (long)local_3c0 * lVar42 + local_170;
                  piVar1 = (int *)(lVar48 + lVar45 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar32 = local_3f0 * lVar42 + local_1e8._24_8_;
                  if (*(char *)(lVar45 + lVar32) != '\0') {
                    piVar1 = (int *)((long)puVar29 +
                                    lVar36 * 4 + lVar40 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_350 = (ulong *)local_1e8._24_8_;
                    local_3b0 = local_170;
                    uVar51 = uVar51 & 0xffffffff;
                    goto LAB_0016a038;
                  }
                  piVar1 = (int *)(lVar48 + (lVar41 + 0x400000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar32 + (lVar41 + 0x400000000 >> 0x20)) == '\0') {
                    piVar1 = (int *)((long)puVar29 +
                                    lVar36 * 4 + lVar40 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    local_350 = (ulong *)local_1e8._24_8_;
                    local_3b0 = local_170;
                    lVar45 = local_388;
                    puVar29 = local_3e8;
                    local_388 = local_380;
                    goto LAB_00169174;
                  }
                  uVar51 = uVar51 & 0xffffffff;
LAB_00169040:
                  uVar22 = (ulong)(int)uVar51;
                  piVar1 = (int *)(*local_138 * lVar43 + local_170 + 4 + uVar22 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar22 + 1 + local_3f0 * lVar43 + (long)local_368) == '\0')
                  goto LAB_0016940b;
                  local_400 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  local_3d8 = *(long *)local_330._80_8_;
                  uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
                  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
                  *piVar1 = *piVar1 + 1;
                } while( true );
              }
              lVar45 = *local_3e0;
              piVar1 = (int *)((long)local_378 + lVar40 * 4 + lVar45 * lVar26);
              *piVar1 = *piVar1 + 1;
              lVar48 = local_260 + *(long *)local_3d0 * lVar26;
              uVar23 = *(undefined4 *)(lVar48 + lVar40 * 4);
              piVar1 = (int *)((long)local_378 + lVar40 * 4 + lVar45 * lVar26 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar48 + 8 + lVar40 * 4) = uVar23;
LAB_001699d6:
              uVar16 = (uint)local_410;
              goto LAB_0016bdad;
            }
            local_3a0 = local_260;
            if (local_370 < (int)uVar18) {
LAB_0016c942:
              lVar42 = (long)(int)uVar18;
              piVar1 = (int *)(*local_138 * lVar26 + local_170 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + local_3f0 * lVar26 + (long)local_368) == '\0') {
                piVar1 = (int *)((long)local_378 + lVar42 * 4 + *local_3e0 * lVar26);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_3a0 + lVar26 * *(long *)local_3d0 + lVar42 * 4) = 0;
              }
              else {
                lVar43 = *local_3e0;
                piVar1 = (int *)((long)local_378 + lVar42 * 4 + lVar43 * lVar26 + -8);
                *piVar1 = *piVar1 + 1;
                lVar45 = local_3a0 + lVar26 * *(long *)local_3d0;
                uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
                piVar1 = (int *)((long)local_378 + lVar42 * 4 + lVar43 * lVar26);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
              }
            }
            else {
              piVar1 = (int *)((long)local_3c0 * lVar26 + local_3b0 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              local_3e8 = local_378;
              local_3f8 = local_260;
              if (*(char *)(lVar40 + 2 + local_3f0 * lVar26 + (long)local_368) == '\0') {
LAB_0016c578:
                lVar45 = (long)(int)uVar18;
                piVar1 = (int *)(*local_138 * lVar26 + local_170 + 4 + lVar45 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar45 + 1 + local_3f0 * lVar26 + (long)local_368) == '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + *local_3e0 * lVar26);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_3f8 + lVar26 * *(long *)local_3d0 + lVar45 * 4) = 0;
                }
                else {
                  piVar1 = (int *)(lVar42 * *local_138 + local_170 + 4 + lVar45 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::length_;
                  if (*(char *)(lVar45 + 1 + (long)local_368 + local_3f0 * lVar42) == '\0') {
                    lVar42 = (long)(int)RemSP::length_;
                    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar18;
                    uVar18 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + *local_3e0 * lVar26);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_3f8 + lVar26 * *(long *)local_3d0 + lVar45 * 4) = uVar18;
                  }
                  else {
                    lVar42 = *local_3e0;
                    piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + lVar42 * lVar43);
                    *piVar1 = *piVar1 + 1;
                    lVar48 = *(long *)local_3d0;
                    uVar23 = *(undefined4 *)(lVar43 * lVar48 + local_3f8 + lVar45 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar45 * 4 + lVar42 * lVar26);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar48 * lVar26 + local_3f8 + lVar45 * 4) = uVar23;
                  }
                }
              }
              else {
                piVar1 = (int *)((long)local_3c0 * lVar42 + local_3b0 + 0xc + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar40 + 3 + lVar42 * local_3f0 + (long)local_368) == '\0') {
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(lVar36 + lVar40 * 4);
                  piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45 + 8);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar36 + 8 + lVar40 * 4) = uVar23;
                }
                else {
                  piVar1 = (int *)(local_3b0 + (long)local_3c0 * lVar43 + 8 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar40 + 2 + (long)local_368 + local_3f0 * lVar43) == '\0') {
                    piVar1 = (int *)((long)puVar29 + lVar40 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = *(uint *)(local_388 + lVar48 + 8 + lVar40 * 4);
                    piVar1 = (int *)((long)puVar29 + lVar40 * 4 + lVar45);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar36 + lVar40 * 4));
                    piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + 8 + lVar40 * 4
                             ) = uVar18;
                  }
                  else {
                    lVar36 = local_3f0 * lVar43;
LAB_0016c309:
                    lVar48 = (long)(int)uVar18;
                    piVar1 = (int *)(*local_138 * lVar43 + local_170 + -4 + lVar48 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar48 + -1 + lVar36 + (long)local_368) == '\0') {
                      lVar42 = *local_3e0;
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43 + -8);
                      *piVar1 = *piVar1 + 1;
                      local_3f8 = local_3f8 + lVar43 * *(long *)local_3d0;
                      uVar18 = *(uint *)(local_3f8 + -8 + lVar48 * 4);
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(uint *)(local_3f8 + lVar48 * 4);
LAB_0016d139:
                      uVar18 = RemSP::MemMerge(uVar18,uVar16);
                      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + *local_280 * lVar26);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar26 * *(long *)local_330._80_8_ + local_330._24_8_;
LAB_0016d16f:
                      *(uint *)(lVar42 + lVar48 * 4) = uVar18;
                    }
                    else {
                      lVar42 = *local_3e0;
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43);
                      *piVar1 = *piVar1 + 1;
                      lVar45 = *(long *)local_3d0;
                      uVar23 = *(undefined4 *)(lVar43 * lVar45 + local_3f8 + lVar48 * 4);
                      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar26);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar45 * lVar26 + local_3f8 + lVar48 * 4) = uVar23;
                    }
                  }
                }
              }
            }
            goto LAB_0016d178;
          }
          piVar1 = (int *)(lVar40 + local_170 + local_410 * 4);
          *piVar1 = *piVar1 + 1;
          uVar17 = RemSP::length_;
          uVar16 = uVar18;
          if (*(char *)(local_380 + lVar36 + local_410) == '\0') {
            lVar45 = (long)(int)RemSP::length_;
            RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar45] =
                 RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar45] + 1;
            RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar45] = uVar17;
            uVar18 = RemSP::length_;
            RemSP::length_ = RemSP::length_ + 1;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + *local_280 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * lVar26 + local_330._24_8_ + local_410 * 4) =
                 uVar18;
          }
          else {
            lVar45 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar43);
            *piVar1 = *piVar1 + 1;
            lVar48 = *(long *)local_330._80_8_;
            uVar23 = *(undefined4 *)(lVar48 * lVar43 + local_330._24_8_ + local_410 * 4);
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + lVar45 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar48 * lVar26 + local_330._24_8_ + local_410 * 4) = uVar23;
          }
LAB_0016bdad:
          uVar18 = uVar16 + 2;
          uVar51 = (ulong)uVar18;
          local_380 = (long)local_350;
        } while ((int)uVar18 < local_370);
      }
      local_3c0 = (long *)*local_138;
      lVar26 = (long)iVar49;
      lVar42 = (long)(int)uVar18;
      piVar1 = (int *)((long)local_3c0 * lVar26 + local_170 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = *(ulong *)local_1e8._80_8_;
      local_368 = (long *)local_1e8._24_8_;
      cVar3 = *(char *)(lVar42 + local_3f0 * lVar26 + local_1e8._24_8_);
      this = local_268;
      local_3a8 = (long *)local_170;
      if (local_370 < (int)uVar18) {
        if (cVar3 == '\0') {
LAB_0016c751:
          piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + lVar42 * 4) = 0;
          goto LAB_0016d178;
        }
        lVar45 = (long)local_3c0 * (uVar34 - 2);
        lVar43 = local_3f0 * (uVar34 - 2);
LAB_0016c6d9:
        piVar1 = (int *)(lVar45 + (long)local_3a8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar18 = RemSP::length_;
        if (*(char *)(lVar42 + lVar43 + (long)local_368) == '\0') {
          lVar26 = (long)(int)RemSP::length_;
          RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar26] =
               RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar26] + 1;
          RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[lVar26] = uVar18;
          uVar18 = RemSP::length_;
          RemSP::length_ = RemSP::length_ + 1;
          piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + *local_280 * (long)iVar49);
          *piVar1 = *piVar1 + 1;
          *(uint *)((long)iVar49 * *(long *)local_330._80_8_ + local_330._24_8_ + lVar42 * 4) =
               uVar18;
          goto LAB_0016d178;
        }
        lVar43 = uVar34 - 3;
        lVar26 = *local_280;
      }
      else {
        if (cVar3 == '\0') {
LAB_0016c669:
          lVar42 = (long)(int)uVar18;
          piVar1 = (int *)((long)local_3c0 * lVar26 + (long)local_3a8 + 4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 1 + local_3f0 * lVar26 + (long)local_368) == '\0')
          goto LAB_0016c751;
          lVar26 = lVar42 + 1;
        }
        else {
          lVar26 = (long)(int)(uVar18 + 1);
        }
        lVar45 = (long)local_3c0 * (uVar34 - 2);
        piVar1 = (int *)(lVar45 + (long)local_3a8 + lVar26 * 4);
        *piVar1 = *piVar1 + 1;
        lVar43 = local_3f0 * (uVar34 - 2);
        lVar42 = (long)(int)uVar18;
        if (*(char *)(lVar26 + (long)local_368 + lVar43) == '\0') goto LAB_0016c6d9;
        lVar26 = *local_280;
        lVar43 = (long)(iVar5 + -3);
      }
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar26 * lVar43);
      *piVar1 = *piVar1 + 1;
      lVar45 = *(long *)local_330._80_8_;
      uVar23 = *(undefined4 *)(lVar43 * lVar45 + local_330._24_8_ + lVar42 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar26 * iVar49);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar45 * iVar49 + local_330._24_8_ + lVar42 * 4) = uVar23;
    }
    goto LAB_0016d178;
  }
  if (2 < iVar6) {
    iVar24 = -2;
    iVar49 = 0;
LAB_0015d877:
    lVar26 = (long)iVar49;
    piVar1 = (int *)(local_170 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') goto LAB_0015d8c7;
    piVar1 = (int *)(local_170 + 0xc + (long)iVar24 * 4);
    *piVar1 = *piVar1 + 1;
    uVar18 = RemSP::length_;
    cVar3 = *(char *)(local_1e8._24_8_ + 3 + (long)iVar24);
    lVar42 = (long)(int)RemSP::length_;
    piVar12[lVar42] = piVar12[lVar42] + 1;
    puVar29[lVar42] = uVar18;
    uVar18 = RemSP::length_;
    RemSP::length_ = RemSP::length_ + 1;
    local_2b8[lVar26] = local_2b8[lVar26] + 1;
    *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
    iVar24 = iVar49;
    if (cVar3 == '\0') goto LAB_0015da05;
    while (iVar49 = iVar24 + 2, iVar49 < local_370) {
      lVar40 = (long)iVar24;
      lVar26 = lVar40 + 2;
      lVar42 = local_170 + 0xc + lVar40 * 4;
      lVar48 = local_1e8._24_8_ + 3 + lVar40;
      lVar43 = local_330._24_8_ + lVar40 * 4;
      lVar36 = lVar40 << 0x20;
      lVar45 = 0;
      while (piVar1 = (int *)(lVar42 + -4 + lVar45 * 4), *piVar1 = *piVar1 + 1,
            *(char *)(lVar48 + -1 + lVar45) != '\0') {
        piVar1 = (int *)(lVar42 + lVar45 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar48 + lVar45) == '\0') {
          piVar1 = (int *)((long)local_2b8 + (lVar36 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          lVar26 = lVar26 + lVar45;
          uVar23 = *(undefined4 *)(local_330._24_8_ + (lVar36 >> 0x1e));
          iVar49 = (int)lVar26;
          goto LAB_0015d9f7;
        }
        local_2b8[lVar40 + lVar45] = local_2b8[lVar40 + lVar45] + 1;
        uVar23 = *(undefined4 *)(lVar43 + lVar45 * 4);
        local_2b8[lVar40 + lVar45 + 2] = local_2b8[lVar40 + lVar45 + 2] + 1;
        *(undefined4 *)(lVar43 + 8 + lVar45 * 4) = uVar23;
        lVar36 = lVar36 + 0x200000000;
        lVar41 = lVar45 + 2;
        lVar45 = lVar45 + 2;
        if ((long)(uVar51 & 0xffffffff) <= lVar41 + lVar26) {
          iVar49 = iVar24 + (int)lVar45 + 2;
          iVar24 = iVar24 + (int)lVar45;
          goto LAB_0015e017;
        }
      }
      iVar49 = (int)lVar26 + (int)lVar45;
LAB_0015d8c7:
      lVar26 = (long)iVar49;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar18 = RemSP::length_;
      if (*(char *)(local_1e8._24_8_ + 1 + lVar26) == '\0') goto LAB_0015d9a0;
      lVar42 = (long)(int)RemSP::length_;
      piVar12[lVar42] = piVar12[lVar42] + 1;
      puVar29[lVar42] = uVar18;
      uVar18 = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
      *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
      iVar24 = iVar49;
    }
LAB_0015e017:
    lVar26 = (long)iVar49;
    piVar1 = (int *)(local_170 + lVar26 * 4);
    *piVar1 = *piVar1 + 1;
    if (iVar49 <= local_370) {
      if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') goto LAB_0015e1c8;
      lVar42 = (long)iVar24;
      piVar1 = (int *)(local_170 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_2b8[lVar42] = local_2b8[lVar42] + 1;
      uVar23 = *(undefined4 *)(local_330._24_8_ + lVar42 * 4);
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
      *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
      goto LAB_0016d178;
    }
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
      goto LAB_0015e27b;
    }
    local_2b8[iVar24] = local_2b8[iVar24] + 1;
    uVar23 = *(undefined4 *)(local_330._24_8_ + (long)iVar24 * 4);
    local_2b8[lVar26] = local_2b8[lVar26] + 1;
    *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
    goto LAB_0016d178;
  }
  iVar49 = 0;
  lVar42 = 1;
  goto LAB_0015dfb4;
LAB_00160327:
  lVar43 = (long)(int)uVar20;
  local_400 = lVar43 + 2;
  if (local_370 <= (int)local_400) {
    piVar1 = (int *)(local_390 * uVar22 + local_1f8 + 8 + lVar43 * 4);
    *piVar1 = *piVar1 + 1;
    cVar3 = *(char *)(lVar43 + 2 + local_1f0 * uVar22 + local_260);
    if (local_370 < (int)local_400) {
      if (cVar3 == '\0') {
        uVar28 = local_400 & 0xffffffff;
LAB_00165e88:
        lVar48 = local_348 * (uVar22 | 1);
        piVar1 = (int *)(local_3f8 + lVar48 + local_400 * 4);
        *piVar1 = *piVar1 + 1;
        lVar40 = (uVar22 | 1) * local_340;
        local_390._0_4_ = (uint)uVar28;
        if (*(char *)(local_400 + local_3b0 + lVar40) == '\0') {
          piVar1 = (int *)((long)local_2b8 + local_400 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) = 0
          ;
          local_3e0 = (long *)local_330._24_8_;
          local_3d0 = local_2b8;
          goto LAB_00167b4a;
        }
LAB_00165f39:
        lVar42 = (long)(int)(uint)local_390;
        piVar1 = (int *)(lVar48 + local_3f8 + -4 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + -1 + lVar40 + local_3b0) == '\0') goto LAB_00167aeb;
        lVar43 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        lVar45 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
        local_3e0 = (long *)local_330._24_8_;
        local_3d0 = local_2b8;
        goto LAB_00167b4a;
      }
      piVar1 = (int *)(local_1f8 + local_390 * (uVar22 | 1) + 4 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar43 + 1 + local_260 + local_1f0 * (uVar22 | 1)) == '\0') {
        local_348 = *local_138;
        local_340 = *(long *)local_1e8._80_8_;
        goto LAB_0015e601;
      }
      lVar42 = (long)local_3e8 * (uVar22 - 1);
      lVar43 = (long)local_398 * (uVar22 - 1);
      uVar28 = local_400;
LAB_00161301:
      lVar45 = (long)(int)uVar28;
      piVar1 = (int *)(lVar42 + local_388 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar45 + lVar43 + local_3d8) == '\0') {
        piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * uVar22 + -8 + lVar45 * 4);
        piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + lVar45 * 4) = uVar23;
        local_3e0 = local_3e0;
        goto LAB_00167b4a;
      }
    }
    else {
      local_3f0 = uVar27;
      if (cVar3 == '\0') {
LAB_001610c2:
        uVar28 = local_400 & 0xffffffff;
        local_390._0_4_ = (uint)local_400;
        uVar46 = uVar22 | 1;
        lVar43 = (long)local_3e8 * uVar46;
        piVar1 = (int *)(local_388 + lVar43 + local_400 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (long)local_398 * uVar46;
        if (*(char *)(local_400 + local_3d8 + lVar42) == '\0') {
LAB_001663a3:
          local_390._0_4_ = (uint)uVar28;
          goto LAB_00167a72;
        }
        piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 4 + (long)(int)(uint)local_390 * 4);
        *piVar1 = *piVar1 + 1;
        uVar27 = local_3f0;
        if (*(char *)((long)(int)(uint)local_390 + 1 + (long)local_398 * uVar22 + local_3d8) == '\0'
           ) {
          lVar48 = local_348 * uVar46;
          lVar40 = local_340 * uVar46;
          goto LAB_00165f39;
        }
      }
      else {
        lVar43 = (long)local_3e8 * (uVar22 | 1);
        lVar42 = (uVar22 | 1) * (long)local_398;
        uVar28 = local_400 & 0xffffffff;
      }
      local_390._0_4_ = (uint)uVar28;
      piVar1 = (int *)(lVar43 + local_388 + -4 + (long)(int)(uint)local_390 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)(int)(uint)local_390 + -1 + lVar42 + local_3d8) == '\0') {
        local_348 = *local_138;
        local_340 = *(long *)local_1e8._80_8_;
        goto LAB_0015e492;
      }
LAB_0016115c:
      lVar45 = (long)(int)uVar28;
      lVar42 = (long)local_3e8 * (uVar22 - 1);
      piVar1 = (int *)(local_388 + lVar42 + 4 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      lVar43 = (long)local_398 * (uVar22 - 1);
      if (*(char *)(lVar45 + 1 + local_3d8 + lVar43) == '\0') goto LAB_00161301;
    }
    piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + lVar45 * 4);
    piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
    goto LAB_0016134f;
  }
  lVar48 = local_390 * uVar22 + local_1f8;
  piVar1 = (int *)(lVar48 + 8 + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  lVar40 = local_1f0 * uVar22 + local_260;
  lVar45 = local_358;
  if (*(char *)(lVar43 + 2 + lVar40) == '\0') goto LAB_001606b6;
  piVar1 = (int *)(local_390 * (uVar22 | 1) + local_1f8 + 4 + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = local_3f8;
  local_3b0 = local_3b0;
  local_3f0 = local_400;
  if (*(char *)(lVar43 + 1 + (uVar22 | 1) * local_1f0 + local_260) == '\0') goto LAB_0015e56c;
  lVar42 = uVar22 - 1;
  piVar1 = (int *)(local_1f8 + local_390 * lVar42 + 0xc + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar43 + 3 + local_260 + local_1f0 * lVar42) != '\0') {
    piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_250 * (uVar22 - 2) + 8);
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + 8 + lVar43 * 4);
    piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_208 * uVar22 + (long)local_3e0 + lVar43 * 4));
    piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + *local_280 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar46 = local_400;
LAB_00161910:
    local_400 = local_400 & 0xffffffff;
    local_3e0 = (long *)local_330._24_8_;
    goto LAB_00166f6c;
  }
  piVar1 = (int *)(lVar48 + 0xc + lVar43 * 4);
  *piVar1 = *piVar1 + 1;
  uVar20 = local_400;
  local_3f0 = uVar27;
  if (*(char *)(lVar40 + 3 + lVar43) != '\0') {
    lVar43 = (long)local_3e8 * lVar42;
    lVar42 = (long)local_398 * lVar42;
    goto LAB_00160f94;
  }
LAB_00161b61:
  piVar1 = (int *)(local_218 * (uVar22 - 1) + local_388 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  iVar49 = (int)local_400;
  if (*(char *)(uVar20 + (uVar22 - 1) * (long)local_378 + local_3d8) != '\0') {
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + (long)iVar49 * 4 + local_3f0 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                             (long)iVar49 * 4));
    local_3c0 = local_280;
    uVar27 = *local_280;
    local_3d0 = local_2b8;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar42 = *(long *)local_330._80_8_;
    local_400 = local_400 & 0xffffffff;
    local_3e0 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    local_380 = uVar27;
    local_358 = lVar42;
    local_258 = uVar27;
    local_250 = uVar27;
    local_240 = lVar42;
    local_230 = lVar42;
LAB_001621b6:
    do {
      *(uint *)(lVar42 * uVar22 + (long)local_3e0 + uVar20 * 4) = uVar16;
      lVar43 = (long)(int)local_400;
      local_400 = lVar43 + 2;
      local_390._0_4_ = (uint)local_400;
      local_3f8 = local_170;
      local_3b0 = local_1e8._24_8_;
      local_390 = local_400;
      local_208 = lVar42;
      if (local_370 <= (int)(uint)local_390) {
        local_348 = *local_138;
        lVar42 = local_348 * uVar22 + local_170;
        piVar1 = (int *)(lVar42 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        local_340 = *(long *)local_1e8._80_8_;
        lVar45 = local_340 * uVar22 + local_1e8._24_8_;
        cVar3 = *(char *)(lVar43 + 2 + lVar45);
        if (local_370 < (int)(uint)local_390) {
          if (cVar3 == '\0') {
            uVar28 = local_400 & 0xffffffff;
            goto LAB_00165e88;
          }
          piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')
          goto LAB_0015e601;
          lVar45 = local_348 * (uVar22 - 1);
          lVar42 = (uVar22 - 1) * local_340;
        }
        else {
          uVar46 = uVar22 | 1;
          lVar48 = local_348 * uVar46;
          if (cVar3 == '\0') {
            piVar1 = (int *)(local_170 + lVar48 + 8 + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = uVar46 * local_340;
            uVar28 = local_400;
            if (*(char *)(lVar43 + 2 + local_1e8._24_8_ + lVar40) == '\0') goto LAB_001663a3;
            piVar1 = (int *)(lVar42 + 0xc + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar45 + 3 + lVar43) == '\0') goto LAB_00165f39;
          }
          piVar1 = (int *)(lVar48 + local_170 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + uVar46 * local_340 + local_1e8._24_8_) == '\0')
          goto LAB_0015e492;
          lVar45 = local_348 * (uVar22 - 1);
          piVar1 = (int *)(local_170 + lVar45 + 0xc + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = (uVar22 - 1) * local_340;
          if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar42) != '\0') {
LAB_00165985:
            lVar42 = uVar22 - 2;
            lVar43 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_348 * lVar42 + local_170 + -4 + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + local_340 * lVar42 + local_1e8._24_8_) == '\0') {
              lVar45 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * lVar42);
              *piVar1 = *piVar1 + 1;
              lVar48 = *(long *)local_330._80_8_;
              uVar16 = *(uint *)(lVar42 * lVar48 + local_330._24_8_ + lVar43 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar48 * uVar22 + local_330._24_8_ + -8 +
                                                       lVar43 * 4));
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar43 * 4) = uVar16
              ;
              local_3e0 = (long *)local_330._24_8_;
              local_3d0 = local_2b8;
              goto LAB_00167b4a;
            }
            lVar43 = local_348 * (uVar22 - 1);
            lVar42 = (uVar22 - 1) * local_340;
            goto LAB_00167381;
          }
        }
        piVar1 = (int *)(lVar45 + local_170 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar43 + 2 + lVar42 + local_1e8._24_8_) == '\0') {
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + uVar27 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * uVar22 + lVar43 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + uVar27 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + 8 + lVar43 * 4) = uVar23;
          local_3e0 = (long *)(long)local_3e0;
          local_3d0 = local_3d0;
          goto LAB_00167b4a;
        }
LAB_00165c5a:
        lVar42 = uVar22 - 2;
        lVar45 = (long)(int)(uint)local_390;
        piVar1 = (int *)(local_348 * lVar42 + local_170 + -4 + lVar45 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(lVar45 + -1 + local_340 * lVar42 + local_1e8._24_8_);
        lVar43 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43 * lVar42);
        *piVar1 = *piVar1 + 1;
        lVar48 = *(long *)local_330._80_8_;
        uVar16 = *(uint *)(lVar42 * lVar48 + local_330._24_8_ + lVar45 * 4);
        lVar43 = lVar43 * uVar22;
        if (cVar3 != '\0') {
          piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43);
          *piVar1 = *piVar1 + 1;
          goto LAB_001674e7;
        }
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar43 + -8);
        *piVar1 = *piVar1 + 1;
        lVar42 = local_330._24_8_ + lVar48 * uVar22;
LAB_00165d92:
        uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar42 + -8 + lVar45 * 4));
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
        local_3e0 = (long *)local_330._24_8_;
        local_3d0 = local_2b8;
        goto LAB_00167b4a;
      }
      local_350 = local_138;
      local_3e8 = (pointer)*local_138;
      lVar45 = (long)local_3e8 * uVar22 + local_170;
      piVar1 = (int *)(lVar45 + 8 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      local_3d8 = local_1e8._24_8_;
      local_368 = (long *)local_1e8._80_8_;
      local_338 = *(long *)local_1e8._80_8_;
      lVar48 = local_338 * uVar22 + local_1e8._24_8_;
      uVar28 = uVar22 | 1;
      lVar42 = local_170;
      local_378 = (pointer)local_338;
      local_388 = local_170;
      local_3a0 = (ulong)local_3e8;
      local_340 = local_338;
      local_360 = (pointer)local_338;
      local_348 = (ulong)local_3e8;
      if (*(char *)(lVar43 + 2 + lVar48) == '\0') {
        lVar36 = (long)local_3e8 * uVar28 + local_170;
        piVar1 = (int *)(lVar36 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar40 = uVar28 * local_338 + local_1e8._24_8_;
        uVar28 = (ulong)local_3e8;
        local_398 = (pointer)local_338;
        if (*(char *)(lVar43 + 2 + lVar40) == '\0') {
          local_228 = local_1e8._24_8_;
          local_248 = local_170;
          puVar29 = local_3e8;
          lVar45 = local_170;
          lVar48 = local_338;
          lVar40 = local_1e8._24_8_;
          local_238 = (ulong)local_3e8;
          local_220 = local_338;
          local_210 = (ulong)local_3e8;
          goto LAB_0015ec05;
        }
        piVar1 = (int *)(lVar45 + 0xc + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar48 + 3 + lVar43) == '\0') {
          local_228 = local_1e8._24_8_;
          local_248 = local_170;
          local_3b0 = local_3d8;
          local_238 = (ulong)local_3e8;
          local_220 = local_338;
          local_218 = (ulong)local_3e8;
          local_210 = (ulong)local_3e8;
          goto LAB_001608bf;
        }
        piVar1 = (int *)(lVar36 + 4 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar40 + 1 + lVar43) == '\0') {
          local_228 = local_1e8._24_8_;
          local_248 = local_170;
          local_238 = (ulong)local_3e8;
          goto LAB_0015ec3a;
        }
        lVar40 = (long)local_3e8 * (uVar22 - 1);
        piVar1 = (int *)(local_170 + lVar40 + 0xc + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (uVar22 - 1) * local_338;
        if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_00165b21;
LAB_001625bd:
        lVar40 = lVar40 + local_170;
        piVar1 = (int *)(lVar40 + 0x10 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar42 + local_1e8._24_8_;
        if (*(char *)(lVar43 + 4 + lVar42) == '\0') {
          piVar1 = (int *)(lVar40 + 8 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 2 + lVar43) != '\0') goto LAB_001666ef;
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar42 = (long)local_3e0 + local_240 * uVar22;
          uVar23 = *(undefined4 *)(lVar42 + lVar43 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar42 + 8 + lVar43 * 4) = uVar23;
          local_248 = local_170;
          lVar43 = local_1e8._24_8_;
          lVar36 = local_338;
          lVar42 = local_240;
          lVar45 = local_1e8._24_8_;
          local_3f8 = local_248;
          local_238 = (ulong)local_3e8;
          goto LAB_00162ac7;
        }
        lVar45 = uVar22 - 2;
        lVar48 = (long)local_3e8 * lVar45;
        piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = local_338 * lVar45;
        if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar36) != '\0') goto LAB_001660b8;
        piVar1 = (int *)(lVar40 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 2 + lVar43) != '\0') goto LAB_001668d0;
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * lVar45 + 0x10);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar45 * local_240 + (long)local_3e0 + 0x10 + lVar43 * 4);
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22);
        *piVar1 = *piVar1 + 1;
        uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_240 * uVar22 + (long)local_3e0 + lVar43 * 4)
                                );
        local_380 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + local_380 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        plVar30 = (long *)local_330._24_8_;
        uVar20 = local_400;
        local_3a8 = (long *)local_330._80_8_;
        lVar42 = lVar43;
        local_3c0 = local_280;
LAB_00163484:
        do {
          *(uint *)(lVar42 * uVar22 + (long)plVar30 + uVar20 * 4) = uVar16;
          iVar49 = (int)local_390;
          local_390._0_4_ = iVar49 + 2;
          if (local_370 <= (int)(uint)local_390) {
LAB_00163838:
            local_400 = (ulong)(uint)local_390;
            if (local_370 < (int)(uint)local_390) {
              local_368 = (long *)local_1e8._80_8_;
              puVar21 = local_138;
              lVar43 = local_170;
              lVar48 = local_1e8._24_8_;
LAB_001645d0:
              iVar49 = (int)local_400;
              local_400 = (ulong)iVar49;
              piVar1 = (int *)(*puVar21 * uVar22 + lVar43 + local_400 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(local_400 + *local_368 * uVar22 + lVar48) == '\0') {
                iVar49 = iVar49 + -2;
LAB_0016464a:
                piVar1 = (int *)(*local_138 * (uVar22 | 1) + local_170 + local_400 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *local_280 * uVar22;
                local_3d0 = local_2b8;
                local_3e0 = (long *)local_330._24_8_;
                if (*(char *)(local_400 +
                             (uVar22 | 1) * *(long *)local_1e8._80_8_ + local_1e8._24_8_) == '\0') {
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + local_400 * 4) = 0;
                }
                else {
                  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar42);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                  uVar23 = *(undefined4 *)(lVar43 + (long)iVar49 * 4);
                  piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar43 + local_400 * 4) = uVar23;
                }
              }
              else {
                lVar42 = *local_280;
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22 + -8);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar43 + -8 + local_400 * 4);
                piVar1 = (int *)((long)local_2b8 + local_400 * 4 + lVar42 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 + local_400 * 4) = uVar23;
                local_3e0 = (long *)local_330._24_8_;
                local_3d0 = local_2b8;
              }
              goto LAB_00167b4a;
            }
            local_348 = *local_138;
            lVar43 = local_348 * uVar22 + local_170;
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(lVar43 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            local_340 = *(long *)local_1e8._80_8_;
            lVar45 = local_340 * uVar22 + local_1e8._24_8_;
            local_3d0 = local_2b8;
            local_3e0 = (long *)local_330._24_8_;
            if (*(char *)(lVar42 + lVar45) == '\0') {
              piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar42 + (uVar22 | 1) * local_340 + local_1e8._24_8_);
              lVar48 = (long)iVar49;
              piVar1 = (int *)(lVar43 + 0xc + lVar48 * 4);
              *piVar1 = *piVar1 + 1;
              cVar4 = *(char *)(lVar45 + 3 + lVar48);
              if (cVar3 == '\0') {
                if (cVar4 == '\0') {
                  lVar45 = (long)(int)((uint)local_390 + 1);
                  goto LAB_00167ac5;
                }
                lVar43 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar45 = *local_3a8;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar45 + local_330._24_8_ + lVar42 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = lVar45 * uVar22 + local_330._24_8_;
              }
              else {
                if (cVar4 != '\0') {
                  lVar48 = lVar48 + 3;
                  goto LAB_001638a7;
                }
                lVar45 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar43 + lVar48 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar45 * uVar22);
                *piVar1 = *piVar1 + 1;
              }
              *(undefined4 *)(lVar43 + lVar42 * 4) = uVar23;
            }
            else {
              lVar48 = (long)(iVar49 + 3);
LAB_001638a7:
              piVar1 = (int *)(local_170 + local_348 * (uVar22 - 1) + lVar48 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar48 + local_1e8._24_8_ + local_340 * (uVar22 - 1)) == '\0') {
                lVar43 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar45 = *local_3a8 * uVar22 + local_330._24_8_;
                uVar23 = *(undefined4 *)(lVar45 + (long)iVar49 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
              }
              else {
                lVar43 = *local_3c0;
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * (uVar22 - 2));
                *piVar1 = *piVar1 + 1;
                lVar45 = *local_3a8;
                uVar23 = *(undefined4 *)((uVar22 - 2) * lVar45 + local_330._24_8_ + lVar42 * 4);
                piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar23;
              }
            }
            goto LAB_00167b4a;
          }
          lVar42 = uVar22 - 1;
          lVar36 = (long)iVar49;
          lVar48 = lVar36 << 0x20;
          lVar45 = lVar36 * 4;
          lVar40 = 0;
          while( true ) {
            local_350 = local_138;
            local_348 = *local_138;
            lVar32 = local_348 * uVar22;
            piVar1 = (int *)(lVar45 + local_170 + lVar32 + 8 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_368 = (long *)local_1e8._80_8_;
            local_338 = *(long *)local_1e8._80_8_;
            lVar31 = local_338 * uVar22;
            iVar24 = (int)lVar40;
            lVar41 = lVar48 >> 0x1e;
            iVar52 = (int)(lVar36 + 2);
            if (*(char *)(lVar40 + 2 + local_1e8._24_8_ + lVar31 + lVar36) == '\0') break;
            piVar1 = (int *)(lVar26 * local_348 + lVar45 + local_170 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_208 = lVar43;
            if (*(char *)(lVar40 + 3 + lVar26 * local_338 + local_1e8._24_8_ + lVar36) != '\0') {
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + local_3c8 * local_380 + 8
                              );
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(local_3c8 * lVar43 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4
                                );
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + local_380 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              uVar46 = lVar36 + lVar40 + 2;
              local_3e0 = (long *)local_330._24_8_;
              goto LAB_00166f6c;
            }
            piVar1 = (int *)(lVar45 + local_170 + lVar32 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar36 + lVar31) == '\0') {
              piVar1 = (int *)((long)local_2b8 + lVar41 + local_380 * uVar22);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)(lVar41 + lVar43 * uVar22 + local_330._24_8_);
              uVar27 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + uVar27 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8;
              *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4) =
                   uVar23;
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              local_380 = uVar27;
              local_240 = lVar43;
              goto LAB_00165713;
            }
LAB_00163679:
            piVar1 = (int *)(local_348 * lVar42 + local_170 + lVar45 + 0x10 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 4 + local_338 * lVar42 + local_1e8._24_8_ + lVar36) == '\0')
            goto LAB_001639f9;
            piVar1 = (int *)(local_170 + lVar45 + local_348 * local_3c8 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + local_1e8._24_8_ + lVar36 + local_338 * local_3c8) == '\0') {
              lVar43 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_3c8 * lVar43 + lVar45 + 0x10);
              *piVar1 = *piVar1 + 1;
              lVar41 = *local_3a8;
              uVar16 = *(uint *)(local_3c8 * lVar41 + local_330._24_8_ + lVar45 + 0x10 + lVar40 * 4)
              ;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar43 * uVar22 + lVar45);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar41 * uVar22 + local_330._24_8_ + lVar45
                                                       + lVar40 * 4));
              local_3c0 = local_280;
              local_380 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar45 + uVar22 * local_380 + 8);
              *piVar1 = *piVar1 + 1;
              local_3a8 = (long *)local_330._80_8_;
            }
            else {
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_3c0 * local_3c8 + lVar45 + 0x10
                              );
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(*local_3a8 * local_3c8 + local_330._24_8_ + lVar45 + 0x10 +
                                lVar40 * 4);
              local_380 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + uVar22 * local_380 + lVar45 + 8);
              *piVar1 = *piVar1 + 1;
            }
            lVar43 = *local_3a8;
            *(uint *)(local_330._24_8_ + lVar45 + uVar22 * lVar43 + 8 + lVar40 * 4) = uVar16;
            lVar48 = lVar48 + 0x200000000;
            lVar41 = lVar36 + lVar40;
            lVar40 = lVar40 + 2;
            if ((long)uVar51 <= lVar41 + 4) {
              iVar49 = iVar49 + (int)lVar40;
              local_390._0_4_ = iVar52 + (int)lVar40;
              goto LAB_00163838;
            }
          }
          local_3f8 = local_170;
          lVar43 = local_170 + lVar45;
          piVar1 = (int *)((long)local_200 * local_348 + lVar43 + 8 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar33 = local_1e8._24_8_ + lVar36;
          local_378 = (pointer)local_338;
          local_3a0 = local_348;
          local_340 = local_338;
          local_3e8 = (pointer)local_348;
          local_360 = (pointer)local_338;
          local_398 = (pointer)local_338;
          if (*(char *)(lVar40 + 2 + (long)local_200 * local_338 + lVar33) != '\0') {
            piVar1 = (int *)(lVar32 + lVar43 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar31 + lVar33) == '\0') {
              piVar1 = (int *)((long)local_2b8 + lVar41 + *local_3c0 * uVar22);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)(lVar41 + *local_3a8 * uVar22 + local_330._24_8_);
              uVar27 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + uVar27 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              local_358 = *local_3a8;
              local_3e0 = (long *)local_330._24_8_;
              *(undefined4 *)(local_358 * uVar22 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4) =
                   uVar23;
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              local_228 = local_1e8._24_8_;
              local_248 = local_170;
              local_3b0 = local_1e8._24_8_;
              local_3d8 = local_1e8._24_8_;
              local_388 = local_170;
              uVar46 = local_348;
              local_3d0 = local_2b8;
              lVar42 = local_358;
              local_380 = uVar27;
              local_258 = uVar27;
              local_250 = uVar27;
              local_240 = local_358;
              local_230 = local_358;
              local_220 = local_338;
              local_218 = local_348;
              local_210 = local_348;
              goto LAB_001609c2;
            }
            piVar1 = (int *)(lVar43 + lVar26 * local_348 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar33 + lVar26 * local_338) != '\0') {
              lVar42 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * local_3c8 + 8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8;
              uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4
                                );
              piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              uVar20 = lVar36 + lVar40 + 2;
              local_400 = (ulong)(uint)(iVar52 + iVar24);
              goto LAB_0016325c;
            }
            goto LAB_00163679;
          }
          piVar1 = (int *)(local_170 + lVar32 + (lVar48 + 0x300000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          uVar46 = lVar36 + 2 + lVar40;
          lVar43 = lVar48 + 0x300000000 >> 0x20;
          local_3b0 = local_1e8._24_8_;
          if (*(char *)(local_1e8._24_8_ + lVar31 + lVar43) == '\0') {
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_3d8 = local_1e8._24_8_;
            puVar29 = (pointer)local_348;
            local_388 = local_170;
            lVar45 = local_170;
            uVar28 = local_348;
            lVar48 = local_338;
            lVar40 = local_1e8._24_8_;
            local_238 = local_348;
            local_220 = local_338;
            local_210 = local_348;
            goto LAB_0015f73e;
          }
          uVar20 = lVar36 + lVar40 + 2;
          lVar45 = local_348 * lVar42 + local_170;
          piVar1 = (int *)(lVar45 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar42 * local_338 + local_1e8._24_8_;
          if (*(char *)(lVar43 + lVar42) != '\0') {
            lVar42 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * local_3c8 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *local_3a8;
            uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar36 * 4 + 8 + lVar40 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            local_400 = uVar46;
            goto LAB_0016325c;
          }
          piVar1 = (int *)(lVar45 + (lVar48 + 0x400000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          local_400 = uVar46;
          if (*(char *)(lVar42 + (lVar48 + 0x400000000 >> 0x20)) == '\0') {
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + *local_3c0 * local_3c8 + 8)
            ;
            *piVar1 = *piVar1 + 1;
            uVar16 = *(uint *)(*local_3a8 * local_3c8 + local_330._24_8_ + lVar36 * 4 + 8 +
                              lVar40 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + *local_3c0 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            lVar42 = *local_3a8;
            plVar30 = (long *)local_330._24_8_;
            goto LAB_0015edca;
          }
LAB_0015ed2d:
          lVar42 = uVar22 - 2;
          uVar20 = (ulong)(int)local_400;
          piVar1 = (int *)(local_348 * lVar42 + local_3f8 + 4 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          local_390 = local_400;
          if (*(char *)(uVar20 + 1 + local_338 * lVar42 + local_3b0) == '\0') {
            lVar43 = *local_280;
            uVar20 = (ulong)(int)local_400;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42);
            *piVar1 = *piVar1 + 1;
            lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
            uVar16 = *(uint *)(lVar45 + uVar20 * 4);
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42 + 8);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar45 + 8 + uVar20 * 4));
            goto LAB_0015f11a;
          }
LAB_0015f06a:
          local_380 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
          *piVar1 = *piVar1 + 1;
          plVar30 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          lVar42 = lVar43;
          local_3c0 = local_280;
        } while( true );
      }
      piVar1 = (int *)((long)local_3e8 * uVar28 + local_170 + 4 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = local_400;
      if (*(char *)(lVar43 + 1 + uVar28 * local_338 + local_1e8._24_8_) == '\0') goto LAB_0015e56c;
      lVar40 = (long)local_3e8 * (uVar22 - 1);
      piVar1 = (int *)(local_170 + lVar40 + 0xc + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = (uVar22 - 1) * local_338;
      if (*(char *)(lVar43 + 3 + local_1e8._24_8_ + lVar42) != '\0') {
        local_400 = local_400 & 0xffffffff;
LAB_00165819:
        lVar42 = uVar22 - 2;
        uVar46 = (ulong)(int)local_400;
        piVar1 = (int *)((long)local_3e8 * lVar42 + local_170 + -4 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((uVar46 - 1) + local_338 * lVar42 + local_1e8._24_8_) == '\0') {
          lVar43 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar43 * lVar42);
          *piVar1 = *piVar1 + 1;
          lVar45 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + uVar46 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar43 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar45 * uVar22 + local_330._24_8_ + -8 + uVar46 * 4);
          local_3f0 = local_400;
          goto LAB_00167a02;
        }
        lVar37 = (long)local_3e8 * (uVar22 - 1);
        lVar33 = (uVar22 - 1) * local_338;
LAB_001654ee:
        uVar46 = (ulong)(int)local_400;
        piVar1 = (int *)(lVar37 + local_170 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = uVar22 - 2;
        if (*(char *)(uVar46 + lVar33 + local_1e8._24_8_) != '\0') {
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * lVar42);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar46 * 4);
          goto LAB_001679ae;
        }
        piVar1 = (int *)(local_170 + (long)local_3e8 * lVar42 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar46 + local_1e8._24_8_ + local_338 * lVar42);
        lVar45 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * lVar42);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar46 * 4);
        lVar45 = lVar45 * uVar22;
        if (cVar3 == '\0') {
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 +
                                                   uVar46 * 4));
LAB_001659f4:
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)local_330._24_8_;
          lVar43 = *(long *)local_330._80_8_;
        }
        else {
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)local_330._24_8_;
        }
        goto LAB_00166f6c;
      }
      piVar1 = (int *)(lVar45 + 0xc + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar48 + 3 + lVar43) != '\0') goto LAB_001625bd;
      piVar1 = (int *)(local_170 + lVar40 + 8 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_1e8._24_8_ + lVar42 + 2 + lVar43) == '\0') {
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * uVar22 + lVar43 * 4);
        piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_258 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_240 * uVar22 + (long)local_3e0 + 8 + lVar43 * 4) = uVar23;
        local_228 = local_1e8._24_8_;
        local_248 = local_170;
        local_260 = local_1e8._24_8_;
        local_238 = (ulong)local_3e8;
        local_218 = (ulong)local_3e8;
        goto LAB_00162986;
      }
LAB_00166600:
      local_400 = local_390 & 0xffffffff;
      lVar43 = uVar22 - 2;
      uVar20 = (ulong)(int)local_390;
      piVar1 = (int *)((long)local_3e8 * lVar43 + local_170 + -4 + uVar20 * 4);
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)((uVar20 - 1) + local_338 * lVar43 + local_1e8._24_8_);
      uVar27 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * lVar43);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar43 * lVar42 + local_330._24_8_ + uVar20 * 4);
      if (cVar3 == '\0') {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar42 * uVar22 + -8 +
                                                 uVar20 * 4));
        uVar27 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)local_330._80_8_;
        local_3e0 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        local_3d0 = local_2b8;
        local_3c0 = local_280;
        local_380 = uVar27;
        local_358 = lVar42;
        local_258 = uVar27;
        local_250 = uVar27;
        local_240 = lVar42;
        local_230 = lVar42;
      }
      else {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_3e0 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        local_3d0 = local_2b8;
        local_3c0 = local_280;
        local_380 = uVar27;
        local_358 = lVar42;
        local_258 = uVar27;
        local_250 = uVar27;
        local_240 = lVar42;
        local_230 = lVar42;
      }
    } while( true );
  }
  local_3c0 = local_280;
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + local_380 * uVar22 + -8);
  *piVar1 = *piVar1 + 1;
  local_3a8 = (long *)local_330._80_8_;
  local_240 = *(long *)local_330._80_8_;
  lVar42 = local_240 * uVar22 + local_330._24_8_;
  uVar23 = *(undefined4 *)(lVar42 + -8 + (long)iVar49 * 4);
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar42 + uVar20 * 4) = uVar23;
  local_260 = local_3d8;
  local_3e0 = (long *)local_330._24_8_;
  local_3d0 = local_2b8;
  local_258 = local_380;
  local_230 = local_240;
LAB_00162986:
  local_390 = local_218;
  local_358 = local_240;
  uVar27 = local_258;
  uVar20 = local_400 & 0xffffffff;
  local_208 = local_240;
  local_3e8 = (pointer)local_218;
  local_3d8 = local_260;
  local_398 = local_378;
  local_250 = local_258;
  local_220 = (long)local_378;
  local_210 = local_218;
  local_1f8 = local_388;
  local_1f0 = (long)local_378;
  goto LAB_00160327;
LAB_001639f9:
  lVar42 = *local_3c0;
  piVar1 = (int *)((long)local_2b8 + lVar41 + lVar42 * uVar22);
  *piVar1 = *piVar1 + 1;
  lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
  uVar23 = *(undefined4 *)(lVar41 + lVar43);
  piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + lVar36 * 4 + lVar42 * uVar22 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar43 + lVar36 * 4 + 8 + lVar40 * 4) = uVar23;
  local_400 = (ulong)(uint)(iVar52 + iVar24);
LAB_00164326:
  iVar49 = (int)local_400;
  local_390._0_4_ = iVar49 + 2;
  local_3f8 = local_170;
  local_350 = local_138;
  local_3b0 = local_1e8._24_8_;
  local_368 = (long *)local_1e8._80_8_;
  local_3d0 = local_2b8;
  local_3e0 = (long *)local_330._24_8_;
  if ((int)(uint)local_390 < local_370) {
    local_3a0 = *local_138;
    local_360 = *(pointer *)local_1e8._80_8_;
    lVar40 = (long)iVar49;
    lVar36 = local_3a0 * (uVar22 - 1);
    lVar43 = local_170 + lVar36;
    lVar35 = (uVar22 - 1) * (long)local_360;
    lVar45 = local_1e8._24_8_ + lVar35;
    lVar32 = lVar40 << 0x20;
    lVar37 = local_170 + local_3a0 * uVar22 + lVar40 * 4;
    lVar44 = lVar37 + 0xc;
    lVar48 = local_1e8._24_8_ + (long)local_360 * uVar22 + lVar40;
    lVar54 = lVar48 + 3;
    lVar31 = (long)local_360 * lVar26 + lVar40 + local_1e8._24_8_ + 3;
    lVar33 = local_3a0 * lVar26 + lVar40 * 4 + local_170 + 0xc;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar40 + 2;
    lVar41 = 0;
    do {
      piVar1 = (int *)(lVar37 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      lVar38 = lVar32 >> 0x1e;
      iVar24 = (int)lVar41;
      lVar47 = lVar32 >> 0x20;
      iVar52 = (int)lVar42;
      if (*(char *)(lVar48 + 2 + lVar41) != '\0') {
        piVar1 = (int *)(lVar33 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar31 + lVar41) == '\0') {
          piVar1 = (int *)(lVar44 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar54 + lVar41) == '\0') {
            local_400 = (ulong)(uint)(iVar52 + iVar24);
            local_3c0 = local_280;
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar38 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            lVar42 = lVar43 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar38 + lVar42);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + uVar27 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 + lVar40 * 4 + 8 + lVar41 * 4) = uVar23;
            local_380 = uVar27;
            local_240 = lVar43;
            goto LAB_00165713;
          }
          goto LAB_00164501;
        }
        piVar1 = (int *)(local_3a0 * local_3c8 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        local_400 = lVar42 + lVar41;
        uVar46 = lVar40 + 2 + lVar41;
        if (*(char *)(lVar41 + 2 + (long)local_360 * local_3c8 + lVar40 + local_1e8._24_8_) == '\0')
        {
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_));
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)local_330._24_8_;
          lVar43 = *(long *)local_330._80_8_;
        }
        else {
          *(int *)(lVar43 + lVar38) = *(int *)(lVar43 + lVar38) + 1;
          if (*(char *)(lVar45 + lVar47) == '\0') {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar47 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ +
                                                     lVar47 * 4));
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            local_3e0 = (long *)local_330._24_8_;
            lVar43 = *(long *)local_330._80_8_;
          }
          else {
            lVar42 = local_3a0 * (uVar22 - 2);
            lVar43 = (long)local_360 * (uVar22 - 2);
LAB_0015ee85:
            uVar46 = (ulong)(int)local_400;
            piVar1 = (int *)(lVar42 + local_170 + -4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)((uVar46 - 1) + lVar43 + local_1e8._24_8_);
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar46 * 4);
            if (cVar3 == '\0') {
              piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 +
                                                       uVar46 * 4));
              goto LAB_001659f4;
            }
            piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_3e0 = (long *)local_330._24_8_;
          }
        }
        goto LAB_00166f6c;
      }
      piVar1 = (int *)(local_3a0 * (long)local_200 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      local_340 = (long)local_360;
      local_3e8 = (pointer)local_3a0;
      local_3c0 = local_280;
      local_348 = local_3a0;
      if (*(char *)((long)local_360 * (long)local_200 + lVar40 + local_1e8._24_8_ + 2 + lVar41) ==
          '\0') {
        local_400 = (ulong)(uint)(iVar52 + iVar24);
        local_238 = local_3a0;
        local_3d8 = local_1e8._24_8_;
        local_338 = (long)local_360;
        local_248 = local_170;
        goto LAB_00163191;
      }
      piVar1 = (int *)(lVar44 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar54 + lVar41) == '\0') {
        uVar27 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar38 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_358 = *(long *)local_330._80_8_;
        lVar42 = local_358 * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar38 + lVar42);
        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + uVar27 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar42 + lVar40 * 4 + 8 + lVar41 * 4) = uVar23;
        local_400 = (ulong)(uint)(iVar52 + iVar24);
        local_3d8 = local_1e8._24_8_;
        local_388 = local_170;
        uVar46 = local_3a0;
        local_338 = (long)local_360;
        lVar42 = local_358;
        local_398 = local_360;
        local_380 = uVar27;
        local_378 = local_360;
        local_258 = uVar27;
        local_250 = uVar27;
        local_248 = local_170;
        local_240 = local_358;
        local_238 = local_3a0;
        local_230 = local_358;
        local_228 = local_1e8._24_8_;
        local_220 = (long)local_360;
        local_218 = local_3a0;
        local_210 = local_3a0;
        goto LAB_001609c2;
      }
      piVar1 = (int *)(lVar33 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar31 + lVar41) != '\0') goto LAB_00164dbb;
LAB_00164501:
      piVar1 = (int *)(local_170 + lVar40 * 4 + lVar36 + 0x10 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 4 + lVar35 + local_1e8._24_8_ + lVar40) != '\0') {
        lVar36 = local_3a0 * (uVar22 - 2);
        piVar1 = (int *)((lVar32 + 0x300000000 >> 0x1e) + local_170 + lVar36);
        *piVar1 = *piVar1 + 1;
        local_400 = lVar42 + lVar41;
        lVar48 = (long)local_360 * (uVar22 - 2);
        uVar20 = lVar40 + 2 + lVar41;
        if (*(char *)((lVar32 + 0x300000000 >> 0x20) + local_1e8._24_8_ + lVar48) == '\0') {
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 0x10 + lVar41 * 4)
          ;
          piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_));
          local_380 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + local_380 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          local_390 = local_400 & 0xffffffff;
          plVar30 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          lVar42 = lVar43;
          local_3c0 = local_280;
          goto LAB_00163484;
        }
        piVar1 = (int *)(local_3a0 * local_3c8 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 2 + (long)local_360 * local_3c8 + lVar40 + local_1e8._24_8_) == '\0')
        {
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 0x10 + lVar41 * 4)
          ;
          piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_);
        }
        else {
          *(int *)(lVar43 + lVar38) = *(int *)(lVar43 + lVar38) + 1;
          if (*(char *)(lVar45 + lVar47) != '\0') goto LAB_00164967;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 0x10 + lVar41 * 4)
          ;
          piVar1 = (int *)((long)local_2b8 + lVar47 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar17 = *(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar47 * 4);
        }
        uVar16 = RemSP::MemMerge(uVar16,uVar17);
        local_380 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + local_380 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        local_390 = local_400;
        plVar30 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        lVar42 = lVar43;
        local_3c0 = local_280;
        goto LAB_00163484;
      }
      lVar38 = *local_280 * uVar22 + lVar40 * 4 + 8;
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar38 + -8);
      *piVar1 = *piVar1 + 1;
      lVar47 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 + lVar40 * 4;
      uVar23 = *(undefined4 *)(lVar47 + -8 + lVar41 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar38);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar47 + lVar41 * 4) = uVar23;
      lVar32 = lVar32 + 0x200000000;
      lVar38 = lVar40 + lVar41;
      lVar41 = lVar41 + 2;
      if ((long)uVar51 <= lVar38 + 4) {
        iVar49 = iVar49 + (int)lVar41;
        local_390._0_4_ = iVar52 + (int)lVar41;
        break;
      }
    } while( true );
  }
  local_400 = (ulong)(uint)local_390;
  puVar21 = local_138;
  lVar43 = local_170;
  lVar48 = local_1e8._24_8_;
  if (local_370 < (int)(uint)local_390) goto LAB_001645d0;
  local_348 = *local_138;
  lVar42 = local_348 * uVar22;
  lVar45 = (long)(int)(uint)local_390;
  piVar1 = (int *)(lVar42 + local_170 + lVar45 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = *(long *)local_1e8._80_8_;
  lVar43 = local_340 * uVar22;
  if (*(char *)(lVar45 + local_1e8._24_8_ + lVar43) == '\0') {
    piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + lVar45 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar45 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
LAB_00164d0d:
      lVar45 = (long)(int)(uint)local_390;
      piVar1 = (int *)(lVar42 + local_3f8 + 4 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar45 + 1 + lVar43 + local_3b0) == '\0') {
        lVar45 = lVar45 + 1;
        local_348 = *local_138;
        local_340 = *(long *)local_1e8._80_8_;
        goto LAB_00167ac5;
      }
      piVar1 = (int *)(local_3f8 + local_348 * (uVar22 - 1) + 4 + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = RemSP::length_;
      local_3d0 = local_2b8;
      local_3e0 = (long *)local_330._24_8_;
      if (*(char *)(lVar45 + 1 + local_3b0 + local_340 * (uVar22 - 1)) == '\0') {
        lVar42 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] = uVar16;
        uVar16 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
      }
      else {
        lVar42 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * (uVar22 - 2));
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        uVar23 = *(undefined4 *)((uVar22 - 2) * lVar43 + local_330._24_8_ + lVar45 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar23;
      }
      goto LAB_00167b4a;
    }
    lVar48 = (long)iVar49;
    piVar1 = (int *)(lVar42 + local_170 + 0xc + lVar48 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_1e8._24_8_ + lVar43 + 3 + lVar48) == '\0') {
      lVar42 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar43 + lVar48 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar43 + lVar45 * 4) = uVar23;
      goto LAB_00167b4a;
    }
    lVar48 = lVar48 + 3;
  }
  else {
    lVar48 = (long)(iVar49 + 3);
  }
  lVar43 = local_348 * (uVar22 - 1);
  piVar1 = (int *)(local_170 + lVar43 + lVar48 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = (uVar22 - 1) * local_340;
  if (*(char *)(lVar48 + local_1e8._24_8_ + lVar42) == '\0') {
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar43 + (long)iVar49 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar43 + lVar45 * 4) = uVar23;
    goto LAB_00167b4a;
  }
  lVar48 = uVar22 - 2;
  piVar1 = (int *)(local_348 * lVar48 + local_170 + lVar45 * 4);
  *piVar1 = *piVar1 + 1;
  local_390 = local_400;
  if (*(char *)(lVar45 + local_340 * lVar48 + local_1e8._24_8_) == '\0') {
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * lVar48);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + lVar45 * 4);
    piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + (long)iVar49 * 4)
                            );
    piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
    local_3e0 = (long *)local_330._24_8_;
    local_3d0 = local_2b8;
    goto LAB_00167b4a;
  }
LAB_00165c32:
  lVar45 = (long)(int)(uint)local_390;
  piVar1 = (int *)(lVar43 + local_170 + -8 + lVar45 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar45 + -2 + lVar42 + local_1e8._24_8_) != '\0') goto LAB_00165c5a;
  lVar42 = *local_280;
  piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * (uVar22 - 2));
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
  uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + lVar45 * 4);
  piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + lVar42 * uVar22 + -8);
  *piVar1 = *piVar1 + 1;
  lVar42 = lVar43 * uVar22 + local_330._24_8_;
  goto LAB_00165d92;
LAB_00164dbb:
  piVar1 = (int *)(local_3a0 * local_3c8 + lVar40 * 4 + local_170 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  local_400 = lVar42 + lVar41;
  uVar20 = lVar40 + 2 + lVar41;
  if (*(char *)(lVar41 + 2 + (long)local_360 * local_3c8 + lVar40 + local_1e8._24_8_) == '\0') {
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar38 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar38 + lVar43 * uVar22 + local_330._24_8_));
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
  }
  else {
    *(int *)(lVar43 + lVar38) = *(int *)(lVar43 + lVar38) + 1;
    if (*(char *)(lVar45 + lVar47) != '\0') {
      lVar42 = local_3a0 * (uVar22 - 2);
      lVar43 = (long)local_360 * (uVar22 - 2);
      goto LAB_00164e5d;
    }
    lVar42 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + lVar42 * local_3c8 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar43 * local_3c8 + local_330._24_8_ + lVar40 * 4 + 8 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar47 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar47 * 4));
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar40 * 4 + *local_280 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
  }
LAB_0016325c:
  *(uint *)(lVar43 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
  lVar42 = (long)(int)local_400;
  local_390._0_4_ = (int)local_400 + 2;
  local_400 = (ulong)(uint)local_390;
  local_3d0 = local_2b8;
  local_3e0 = (long *)local_330._24_8_;
  if ((int)(uint)local_390 < local_370) {
    local_3f8 = local_170;
    local_350 = local_138;
    local_3a0 = *local_138;
    lVar43 = local_3a0 * uVar22 + local_170;
    piVar1 = (int *)(lVar43 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_3d8 = local_1e8._24_8_;
    local_368 = (long *)local_1e8._80_8_;
    local_338 = *(long *)local_1e8._80_8_;
    lVar45 = local_338 * uVar22 + local_1e8._24_8_;
    local_3e8 = (pointer)local_3a0;
    if (*(char *)(lVar42 + 2 + lVar45) == '\0') {
      piVar1 = (int *)(local_3a0 * (uVar22 | 1) + local_170 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_378 = (pointer)local_338;
      local_340 = local_338;
      local_360 = (pointer)local_338;
      local_348 = local_3a0;
      local_398 = (pointer)local_338;
      if (*(char *)(lVar42 + 2 + (uVar22 | 1) * local_338 + local_1e8._24_8_) == '\0') {
        local_228 = local_1e8._24_8_;
        local_248 = local_170;
        puVar29 = (pointer)local_3a0;
        local_388 = local_170;
        lVar45 = local_170;
        local_3b0 = local_1e8._24_8_;
        uVar28 = local_3a0;
        lVar48 = local_338;
        lVar40 = local_1e8._24_8_;
        local_238 = local_3a0;
        local_220 = local_338;
        local_210 = local_3a0;
        goto LAB_0015ec05;
      }
      piVar1 = (int *)(lVar43 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar45 + 3 + lVar42) == '\0') {
        local_3c0 = local_280;
        uVar27 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        local_3a8 = (long *)local_330._80_8_;
        local_240 = *(long *)local_330._80_8_;
        lVar43 = local_240 * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar43 + lVar42 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar43 + 8 + lVar42 * 4) = uVar23;
        uVar46 = local_3a0;
        local_358 = local_240;
        lVar42 = local_240;
        local_3b0 = local_3d8;
        local_388 = local_3f8;
        local_380 = uVar27;
        local_258 = uVar27;
        local_250 = uVar27;
        local_248 = local_3f8;
        local_230 = local_240;
        local_228 = local_3d8;
        local_220 = local_338;
        local_218 = local_3a0;
        local_210 = local_3a0;
        goto LAB_001609c2;
      }
LAB_00167777:
      lVar37 = (long)local_3e8 * (uVar22 - 1);
      piVar1 = (int *)(local_170 + lVar37 + 4 + (long)(int)local_400 * 4);
      *piVar1 = *piVar1 + 1;
      lVar33 = (uVar22 - 1) * local_338;
      local_348 = (ulong)local_3e8;
      if (*(char *)((long)(int)local_400 + 1 + local_1e8._24_8_ + lVar33) == '\0')
      goto LAB_00165575;
LAB_0016779f:
      uVar20 = (ulong)(int)local_400;
      piVar1 = (int *)(lVar37 + local_170 + uVar20 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = uVar22 - 2;
      if (*(char *)(uVar20 + lVar33 + local_1e8._24_8_) == '\0') {
        piVar1 = (int *)(local_170 + (long)local_3e8 * lVar42 + uVar20 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar20 + local_1e8._24_8_ + local_338 * lVar42);
        lVar45 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * lVar42);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar20 * 4);
        lVar45 = lVar45 * uVar22;
        if (cVar3 != '\0') goto code_r0x0016782e;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 + -8);
        *piVar1 = *piVar1 + 1;
        goto LAB_00168264;
      }
LAB_0015ec83:
      lVar42 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar20 * 4);
      puVar29 = (pointer)(lVar42 * uVar22 + (long)local_2b8);
      goto LAB_0015ecc9;
    }
LAB_001654c3:
    lVar42 = (long)(int)local_400;
    lVar37 = (long)local_3e8 * (uVar22 - 1);
    piVar1 = (int *)(local_170 + lVar37 + 4 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar33 = (uVar22 - 1) * local_338;
    if (*(char *)(lVar42 + 1 + local_1e8._24_8_ + lVar33) != '\0') goto LAB_001654ee;
    piVar1 = (int *)((long)local_3e8 * uVar22 + local_170 + 4 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    local_348 = (ulong)local_3e8;
    if (*(char *)(lVar42 + 1 + local_338 * uVar22 + local_1e8._24_8_) == '\0') {
      uVar27 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22 + -8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      lVar45 = lVar43 * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
      local_3a8 = (long *)local_330._80_8_;
      local_3c0 = local_280;
      local_380 = uVar27;
      local_240 = lVar43;
LAB_00165713:
      lVar41 = (long)(int)local_400;
      local_390 = lVar41 + 2;
      local_3d0 = local_2b8;
      local_3f8 = local_170;
      local_3b0 = local_1e8._24_8_;
      local_400 = local_390;
      local_3e0 = (long *)local_330._24_8_;
      if ((int)(uint)local_390 < local_370) {
        local_350 = local_138;
        local_3e8 = (pointer)*local_138;
        lVar45 = (long)local_3e8 * uVar22 + local_170;
        piVar1 = (int *)(lVar45 + 8 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        local_3d8 = local_1e8._24_8_;
        local_368 = (long *)local_1e8._80_8_;
        local_338 = *(long *)local_1e8._80_8_;
        lVar48 = local_338 * uVar22 + local_1e8._24_8_;
        uVar28 = uVar22 | 1;
        lVar42 = local_170;
        local_378 = (pointer)local_338;
        local_388 = local_170;
        local_3a0 = (ulong)local_3e8;
        local_340 = local_338;
        uVar20 = local_390;
        local_360 = (pointer)local_338;
        local_348 = (ulong)local_3e8;
        local_398 = (pointer)local_338;
        local_230 = lVar43;
        if (*(char *)(lVar41 + 2 + lVar48) == '\0') {
          lVar40 = (long)local_3e8 * uVar28 + local_170;
          piVar1 = (int *)(lVar40 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = uVar28 * local_338 + local_1e8._24_8_;
          uVar28 = (ulong)local_3e8;
          if (*(char *)(lVar41 + 2 + lVar43) == '\0') {
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_400 = local_390 & 0xffffffff;
            puVar29 = local_3e8;
            lVar45 = local_170;
            lVar48 = local_338;
            lVar40 = local_1e8._24_8_;
            local_238 = (ulong)local_3e8;
            local_220 = local_338;
            local_210 = (ulong)local_3e8;
            goto LAB_0015ec05;
          }
          piVar1 = (int *)(lVar45 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
            local_400 = local_390 & 0xffffffff;
            local_250 = uVar27;
            local_358 = local_240;
            local_3b0 = local_3d8;
            local_258 = uVar27;
            local_248 = local_3f8;
            local_238 = (ulong)local_3e8;
            local_228 = local_3d8;
            local_220 = local_338;
            local_218 = (ulong)local_3e8;
            local_210 = (ulong)local_3e8;
            local_208 = local_240;
            goto LAB_001608bf;
          }
          piVar1 = (int *)(lVar40 + 4 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + lVar41) == '\0') {
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_400 = local_390 & 0xffffffff;
            local_238 = (ulong)local_3e8;
            goto LAB_0015ec3a;
          }
          lVar43 = (long)local_3e8 * (uVar22 - 1);
          piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = (uVar22 - 1) * local_338;
          if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar42) == '\0') goto LAB_0016604a;
          piVar1 = (int *)(local_170 + lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1e8._24_8_ + lVar42 + lVar41) != '\0') {
            local_400 = local_390 & 0xffffffff;
LAB_00165b21:
            lVar42 = uVar22 - 2;
            uVar20 = (ulong)(int)local_400;
            piVar1 = (int *)((long)local_3e8 * lVar42 + local_170 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((uVar20 - 1) + local_338 * lVar42 + local_1e8._24_8_) != '\0') {
              lVar37 = (long)local_3e8 * (uVar22 - 1);
              lVar33 = (uVar22 - 1) * local_338;
              goto LAB_0016779f;
            }
            lVar43 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42);
            *piVar1 = *piVar1 + 1;
            lVar45 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + uVar20 * 4);
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * uVar22 + -8);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(lVar45 * uVar22 + local_330._24_8_ + -8 + uVar20 * 4);
            goto LAB_00168272;
          }
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar43 * uVar22 + local_330._24_8_;
LAB_00166a52:
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar42 + lVar41 * 4));
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
LAB_00166a8e:
          local_400 = uVar20 & 0xffffffff;
          goto LAB_0016325c;
        }
        piVar1 = (int *)((long)local_3e8 * uVar28 + local_170 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        local_3f0 = local_390;
        if (*(char *)(lVar41 + 1 + uVar28 * local_338 + local_1e8._24_8_) == '\0')
        goto LAB_0015e56c;
        lVar43 = (long)local_3e8 * (uVar22 - 1);
        lVar36 = local_170 + lVar43;
        piVar1 = (int *)(lVar36 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (uVar22 - 1) * local_338;
        lVar40 = local_1e8._24_8_ + lVar42;
        if (*(char *)(lVar41 + 3 + lVar40) != '\0') {
          piVar1 = (int *)(lVar36 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + lVar41) != '\0') goto LAB_00165819;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          puVar29 = (pointer)(lVar42 * uVar22 + (long)local_2b8);
LAB_0016623c:
          puVar29[lVar41] = puVar29[lVar41] + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4)
                                  );
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar46 = local_390;
LAB_00166287:
          local_400 = uVar46 & 0xffffffff;
          local_3e0 = (long *)local_330._24_8_;
          goto LAB_00166f6c;
        }
        piVar1 = (int *)(lVar45 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
          piVar1 = (int *)(lVar36 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + 2 + lVar41) == '\0') {
            local_3c0 = local_280;
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            local_358 = *(long *)local_330._80_8_;
            lVar42 = local_358 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
            local_228 = local_1e8._24_8_;
            local_248 = local_170;
            local_390 = (ulong)local_3e8;
            local_208 = local_358;
            local_3a0 = (ulong)local_3e8;
            local_380 = uVar27;
            local_348 = (ulong)local_3e8;
            local_260 = local_3d8;
            local_258 = uVar27;
            local_250 = uVar27;
            local_240 = local_358;
            local_238 = (ulong)local_3e8;
            local_230 = local_358;
            local_220 = local_338;
            local_218 = (ulong)local_3e8;
            local_210 = (ulong)local_3e8;
            local_1f8 = local_170;
            local_1f0 = local_338;
            goto LAB_00160327;
          }
          piVar1 = (int *)(lVar36 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + lVar41) != '\0') goto LAB_00166600;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4)
                                  );
          local_3d0 = local_2b8;
          local_3c0 = local_280;
          uVar27 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)local_330._80_8_;
          local_400 = local_390 & 0xffffffff;
          local_3e0 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          local_380 = uVar27;
          local_358 = lVar42;
          local_258 = uVar27;
          local_250 = uVar27;
          local_240 = lVar42;
          local_230 = lVar42;
          goto LAB_001621b6;
        }
LAB_0016604a:
        lVar43 = lVar43 + local_170;
        piVar1 = (int *)(lVar43 + 0x10 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar42 + local_1e8._24_8_;
        if (*(char *)(lVar41 + 4 + lVar42) == '\0') {
          piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 2 + lVar41) == '\0') {
            local_3c0 = local_280;
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            local_230 = *(long *)local_330._80_8_;
            lVar42 = local_230 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
            local_248 = local_170;
            lVar43 = local_1e8._24_8_;
            lVar36 = local_338;
            lVar42 = local_230;
            lVar45 = local_1e8._24_8_;
            local_3f8 = local_248;
            local_258 = local_380;
            local_238 = (ulong)local_3e8;
            goto LAB_00162ac7;
          }
          piVar1 = (int *)(lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar41) == '\0') {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ +
                                                     lVar41 * 4));
            local_3c0 = local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = *(long *)local_330._80_8_;
            uVar46 = local_390 & 0xffffffff;
            plVar30 = (long *)local_330._24_8_;
          }
          else {
            local_400 = local_390 & 0xffffffff;
LAB_001666ef:
            lVar43 = uVar22 - 2;
            uVar20 = (ulong)(int)local_400;
            piVar1 = (int *)(local_3a0 * lVar43 + local_170 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            cVar3 = *(char *)((uVar20 - 1) + local_338 * lVar43 + local_1e8._24_8_);
            local_3c0 = local_280;
            lVar45 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar43 * lVar42 + local_330._24_8_ + uVar20 * 4);
            uVar46 = local_400;
            if (cVar3 == '\0') {
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar42 * uVar22 + -8 +
                                                       uVar20 * 4));
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              plVar30 = (long *)local_330._24_8_;
              lVar42 = *(long *)local_330._80_8_;
              local_3c0 = local_280;
              local_3a8 = (long *)local_330._80_8_;
            }
            else {
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45 * uVar22);
              *piVar1 = *piVar1 + 1;
              plVar30 = (long *)local_330._24_8_;
            }
          }
LAB_0015edca:
          *(uint *)(lVar42 * uVar22 + (long)plVar30 + uVar20 * 4) = uVar16;
          lVar41 = (long)(int)uVar46;
          local_400 = lVar41 + 2;
          local_3d0 = local_2b8;
          local_3b0 = local_1e8._24_8_;
          local_390 = local_400;
          if ((int)local_400 < local_370) {
            local_3a0 = *local_138;
            lVar42 = local_3a0 * uVar22 + local_170;
            piVar1 = (int *)(lVar42 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            local_360 = *(pointer *)local_1e8._80_8_;
            lVar43 = (long)local_360 * uVar22 + local_1e8._24_8_;
            if (*(char *)(lVar41 + 2 + lVar43) == '\0') goto LAB_0015f160;
            lVar48 = local_3a0 * (uVar22 - 1);
            piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar45 = (uVar22 - 1) * (long)local_360;
            if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar45) == '\0') {
              piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar43 + 3 + lVar41) != '\0') goto LAB_0015f2c1;
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_3c0 * uVar22);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)(*local_3a8 * uVar22 + local_330._24_8_ + lVar41 * 4);
              uVar27 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8;
              *(undefined4 *)(lVar43 * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) = uVar23;
              local_400 = local_400 & 0xffffffff;
              local_380 = uVar27;
              local_240 = lVar43;
              goto LAB_00165713;
            }
            lVar45 = uVar22 - 2;
            lVar42 = local_3a0 * lVar45;
            piVar1 = (int *)(local_170 + lVar42 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            lVar43 = (long)local_360 * lVar45;
            if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar43) != '\0') goto LAB_0015ee85;
            lVar42 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *local_3a8;
            uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
            puVar29 = (pointer)(lVar42 * uVar22 + (long)local_2b8);
            goto LAB_0016623c;
          }
          if (local_370 < (int)local_400) {
            local_368 = (long *)local_1e8._80_8_;
            puVar21 = local_138;
            lVar43 = local_170;
            lVar48 = local_1e8._24_8_;
            goto LAB_001645d0;
          }
          local_348 = *local_138;
          lVar42 = local_348 * uVar22;
          piVar1 = (int *)(local_170 + lVar42 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          local_340 = *(long *)local_1e8._80_8_;
          lVar43 = local_340 * uVar22;
          local_3e0 = (long *)local_330._24_8_;
          if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar43) == '\0') {
            piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + 2 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
              local_3f8 = local_170;
LAB_00163141:
              goto LAB_00164d0d;
            }
            piVar1 = (int *)(local_170 + lVar42 + 0xc + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1e8._24_8_ + lVar43 + 3 + lVar41) == '\0') {
              lVar42 = *local_3c0;
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
              *piVar1 = *piVar1 + 1;
              lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
              uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
              goto LAB_00167b4a;
            }
            lVar42 = lVar41 + 3;
          }
          else {
            lVar42 = (long)((int)uVar46 + 3);
          }
          piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + (uVar22 - 1) * local_340 + local_1e8._24_8_) == '\0') {
            lVar42 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
            uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
          }
          else {
            lVar42 = uVar22 - 2;
            piVar1 = (int *)(local_348 * lVar42 + local_170 + 8 + lVar41 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar41 + 2 + local_340 * lVar42 + local_1e8._24_8_) != '\0')
            goto LAB_00165c5a;
            lVar43 = *local_3c0;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * lVar42 + 8);
            *piVar1 = *piVar1 + 1;
            lVar45 = *local_3a8;
            uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar45 * uVar22 + local_330._24_8_ +
                                                     lVar41 * 4));
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) =
                 uVar16;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
          }
          goto LAB_00167b4a;
        }
        lVar45 = uVar22 - 2;
        lVar48 = (long)local_3e8 * lVar45;
        piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = local_338 * lVar45;
        if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar36) == '\0') {
          piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 2 + lVar41) == '\0') goto LAB_00166952;
          piVar1 = (int *)(lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar41) == '\0') {
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = lVar45 * *(long *)local_330._80_8_ + local_330._24_8_;
            uVar16 = *(uint *)(lVar43 + 8 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 0x10);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + 0x10 + lVar41 * 4));
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar41 * 4);
LAB_001669a6:
            uVar16 = RemSP::MemMerge(uVar16,uVar17);
            local_3c0 = local_280;
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            plVar30 = (long *)local_330._24_8_;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = lVar43;
          }
          else {
LAB_001668d0:
            lVar42 = uVar22 - 2;
            local_390 = local_400 & 0xffffffff;
            iVar49 = (int)local_400;
            lVar43 = (long)iVar49;
            piVar1 = (int *)(lVar48 + local_170 + -4 + lVar43 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + lVar36 + local_1e8._24_8_) == '\0') {
              lVar43 = *local_280;
              lVar48 = (long)iVar49;
              piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar43 * lVar42);
              *piVar1 = *piVar1 + 1;
              lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
              uVar16 = *(uint *)(lVar45 + lVar48 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar43 * lVar42 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar45 + 8 + lVar48 * 4));
              piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + *local_280 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 +
                                lVar48 * 4);
            }
            else {
              lVar45 = *local_280;
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * lVar42 + 8);
              *piVar1 = *piVar1 + 1;
              lVar48 = *(long *)local_330._80_8_;
              uVar16 = *(uint *)(lVar42 * lVar48 + local_330._24_8_ + 8 + lVar43 * 4);
              piVar1 = (int *)((long)local_2b8 + lVar43 * 4 + lVar45 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(lVar48 * uVar22 + local_330._24_8_ + -8 + lVar43 * 4);
            }
            uVar20 = (ulong)iVar49;
            uVar16 = RemSP::MemMerge(uVar16,uVar17);
            local_3c0 = local_280;
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            plVar30 = (long *)local_330._24_8_;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = lVar43;
          }
        }
        else {
          piVar1 = (int *)(lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar41) == '\0') {
LAB_00166952:
            lVar42 = *local_280;
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 0x10);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 0x10 + lVar41 * 4);
            piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
            *piVar1 = *piVar1 + 1;
            uVar17 = *(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4);
            goto LAB_001669a6;
          }
          local_400 = local_390 & 0xffffffff;
LAB_001660b8:
          uVar20 = (ulong)(int)local_400;
          piVar1 = (int *)(lVar48 + local_170 + -4 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          local_390 = local_400;
          local_348 = local_3a0;
          if (*(char *)((uVar20 - 1) + lVar36 + local_1e8._24_8_) != '\0') goto LAB_001655ba;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + -8 +
                                                   uVar20 * 4));
          local_380 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          plVar30 = (long *)local_330._24_8_;
          local_3a8 = (long *)local_330._80_8_;
          lVar42 = lVar43;
          local_3c0 = local_280;
        }
        goto LAB_00163484;
      }
      local_348 = *local_138;
      lVar42 = local_348 * uVar22 + local_170;
      piVar1 = (int *)(lVar42 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      local_340 = *(long *)local_1e8._80_8_;
      lVar43 = local_340 * uVar22 + local_1e8._24_8_;
      cVar3 = *(char *)(lVar41 + 2 + lVar43);
      if (local_370 < (int)(uint)local_390) {
        if (cVar3 == '\0') {
          uVar28 = local_390 & 0xffffffff;
          goto LAB_00165e88;
        }
        piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 1 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0')
        goto LAB_0015e601;
        lVar43 = local_348 * (uVar22 - 1);
        lVar42 = (uVar22 - 1) * local_340;
      }
      else {
        uVar46 = uVar22 | 1;
        lVar48 = local_348 * uVar46;
        if (cVar3 == '\0') {
          piVar1 = (int *)(local_170 + lVar48 + 8 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = uVar46 * local_340;
          uVar28 = local_390;
          if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar40) == '\0') goto LAB_001663a3;
          piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 3 + lVar41) == '\0') goto LAB_00165f39;
        }
        piVar1 = (int *)(lVar48 + local_170 + 4 + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + 1 + uVar46 * local_340 + local_1e8._24_8_) == '\0')
        goto LAB_0015e492;
        lVar43 = local_348 * (uVar22 - 1);
        piVar1 = (int *)(local_170 + lVar43 + 0xc + lVar41 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = (uVar22 - 1) * local_340;
        if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar42) != '\0') {
          piVar1 = (int *)(local_170 + lVar43 + lVar41 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1e8._24_8_ + lVar42 + lVar41) != '\0') goto LAB_00165985;
          lVar42 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * (uVar22 - 2) + 8);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 * uVar22 + local_330._24_8_ + lVar41 * 4)
                                  );
          piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) = uVar16
          ;
          local_3e0 = (long *)local_330._24_8_;
          local_3d0 = local_2b8;
          goto LAB_00167b4a;
        }
      }
      piVar1 = (int *)(local_170 + lVar43 + 8 + lVar41 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar42) != '\0') goto LAB_00165c32;
      lVar42 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
      goto LAB_00167b4a;
    }
LAB_00165575:
    lVar42 = (long)(int)local_400;
    piVar1 = (int *)(lVar37 + local_170 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + 2 + lVar33 + local_1e8._24_8_) != '\0') goto LAB_00165592;
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    lVar45 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar45 + -8 + lVar42 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar45 + lVar42 * 4) = uVar23;
    goto LAB_00164326;
  }
  if (local_370 < (int)(uint)local_390) {
    local_368 = (long *)local_1e8._80_8_;
    local_400 = (ulong)(uint)local_390;
    puVar21 = local_138;
    lVar43 = local_170;
    lVar48 = local_1e8._24_8_;
    goto LAB_001645d0;
  }
  local_348 = *local_138;
  lVar43 = local_348 * uVar22 + local_170;
  piVar1 = (int *)(lVar43 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = *(long *)local_1e8._80_8_;
  lVar45 = local_340 * uVar22 + local_1e8._24_8_;
  if (*(char *)(lVar42 + 2 + lVar45) != '\0') goto LAB_00167352;
  piVar1 = (int *)(local_348 * (uVar22 | 1) + local_170 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar42 + 2 + (uVar22 | 1) * local_340 + local_1e8._24_8_) == '\0') {
    uVar28 = (ulong)(uint)local_390;
    goto LAB_001663a3;
  }
  piVar1 = (int *)(lVar43 + 0xc + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar45 + 3 + lVar42) != '\0') goto LAB_00167352;
  lVar43 = *local_280;
  piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22);
  *piVar1 = *piVar1 + 1;
  lVar45 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
  uVar23 = *(undefined4 *)(lVar45 + lVar42 * 4);
  piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + lVar43 * uVar22 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar45 + 8 + lVar42 * 4) = uVar23;
  goto LAB_00167b4a;
LAB_00165592:
  lVar42 = uVar22 - 2;
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(local_348 * lVar42 + local_170 + 4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  local_390 = local_400;
  if (*(char *)(uVar20 + 1 + local_338 * lVar42 + local_1e8._24_8_) == '\0') {
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * lVar42 + 8);
    *piVar1 = *piVar1 + 1;
    lVar45 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + 8 + uVar20 * 4);
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar45 * uVar22 + local_330._24_8_ + -8 + uVar20 * 4))
    ;
    local_380 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar43;
    local_3c0 = local_280;
  }
  else {
LAB_001655ba:
    uVar20 = (ulong)(int)local_390;
    piVar1 = (int *)(local_348 * (uVar22 - 1) + local_170 + uVar20 * 4);
    *piVar1 = *piVar1 + 1;
    lVar42 = uVar22 - 2;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    local_3c0 = local_280;
    if (*(char *)(uVar20 + (uVar22 - 1) * local_338 + local_1e8._24_8_) == '\0') {
      piVar1 = (int *)(local_170 + local_348 * lVar42 + uVar20 * 4);
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)(uVar20 + local_1e8._24_8_ + local_338 * lVar42);
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * lVar42 + 8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
      if (cVar3 == '\0') {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 +
                                                 uVar20 * 4));
        local_380 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)local_330._80_8_;
        plVar30 = (long *)local_330._24_8_;
        local_3a8 = (long *)local_330._80_8_;
        lVar42 = lVar43;
        local_3c0 = local_280;
      }
      else {
        piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar43;
      }
    }
    else {
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * lVar42 + 8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar42 = lVar43;
    }
  }
  goto LAB_00163484;
code_r0x0016782e:
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar45);
  *piVar1 = *piVar1 + 1;
  goto LAB_0016325c;
LAB_0015f160:
  local_368 = (long *)local_1e8._80_8_;
  local_350 = local_138;
  piVar1 = (int *)(local_3a0 * (uVar22 | 1) + local_170 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = (long)local_360;
  local_3e8 = (pointer)local_3a0;
  local_348 = local_3a0;
  if (*(char *)(lVar41 + 2 + (uVar22 | 1) * (long)local_360 + local_1e8._24_8_) == '\0') {
    local_400 = local_400 & 0xffffffff;
    local_238 = local_3a0;
    local_3d8 = local_1e8._24_8_;
    local_338 = (long)local_360;
    local_248 = local_170;
    local_3f8 = local_170;
    goto LAB_00163191;
  }
  piVar1 = (int *)(lVar42 + 0xc + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar43 + 3 + lVar41) == '\0') {
    local_3c0 = local_280;
    uVar27 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22);
    *piVar1 = *piVar1 + 1;
    local_3a8 = (long *)local_330._80_8_;
    local_358 = *(long *)local_330._80_8_;
    local_3e0 = (long *)local_330._24_8_;
    lVar42 = local_358 * uVar22 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + uVar27 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
    local_400 = local_400 & 0xffffffff;
    local_228 = local_1e8._24_8_;
    local_248 = local_170;
    local_3d8 = local_1e8._24_8_;
    local_3f8 = local_170;
    local_388 = local_170;
    uVar46 = local_3a0;
    local_338 = (long)local_360;
    lVar42 = local_358;
    local_398 = local_360;
    local_380 = uVar27;
    local_378 = local_360;
    local_258 = uVar27;
    local_250 = uVar27;
    local_240 = local_358;
    local_230 = local_358;
    local_220 = (long)local_360;
    local_218 = local_3a0;
    local_210 = local_3a0;
LAB_001609c2:
    do {
      lVar43 = (long)(int)local_400;
      local_400 = lVar43 + 2;
      local_390._0_4_ = (uint)local_400;
      local_3f0 = uVar27;
      if (local_370 <= (int)(uint)local_390) {
        piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 8 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(lVar43 + 2 + (long)local_398 * uVar22 + local_3d8);
        if (local_370 < (int)(uint)local_390) {
          uVar28 = local_400;
          if (cVar3 == '\0') goto LAB_00165e88;
          piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + (uVar22 | 1) * (long)local_398 + local_3d8) == '\0') {
LAB_0016162b:
            local_388 = (long)local_3e8 * (uVar22 - 1) + local_388;
            piVar1 = (int *)(local_388 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            local_3d8 = (long)local_398 * (uVar22 - 1) + local_3d8;
            if (*(char *)(local_400 + local_3d8) != '\0') {
LAB_0016164e:
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * (uVar22 - 2));
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)((long)local_3e0 + (uVar22 - 2) * local_358 + local_400 * 4);
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              lVar42 = local_358 * uVar22 + (long)local_3e0;
              goto LAB_00161689;
            }
            lVar42 = (long)(int)(uint)local_390;
            piVar1 = (int *)(local_388 + -4 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::length_;
            if (*(char *)(local_3d8 + -1 + lVar42) == '\0') {
              lVar42 = (long)(int)RemSP::length_;
              RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar42] =
                   RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar42] + 1;
              RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar42] = uVar16;
              uVar16 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(uint *)(local_358 * uVar22 + (long)local_3e0 + local_400 * 4) = uVar16;
              local_3e0 = local_3e0;
            }
            else {
              piVar1 = (int *)((long)local_3d0 + lVar42 * 4 + uVar27 * (uVar22 - 2) + -8);
              *piVar1 = *piVar1 + 1;
              uVar23 = *(undefined4 *)((long)local_3e0 + local_358 * (uVar22 - 2) + -8 + lVar42 * 4)
              ;
              piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + local_400 * 4) = uVar23;
              local_3e0 = local_3e0;
            }
            goto LAB_00167b4a;
          }
LAB_00161287:
          lVar45 = (long)(int)local_400;
          lVar42 = (long)local_3e8 * (uVar22 - 1);
          piVar1 = (int *)(local_388 + lVar42 + -4 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = (long)local_398 * (uVar22 - 1);
          if (*(char *)(lVar45 + -1 + local_3d8 + lVar43) == '\0') {
            uVar28 = local_400 & 0xffffffff;
            goto LAB_00161301;
          }
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * (uVar22 - 2) + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + -8 + lVar45 * 4);
        }
        else {
          if (cVar3 == '\0') goto LAB_001610c2;
          piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + 4 + lVar43 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 1 + (uVar22 | 1) * (long)local_398 + local_3d8) == '\0') {
LAB_00160ee6:
            local_390._0_4_ = (uint)local_400;
            local_400 = (ulong)(int)(uint)local_390;
            lVar43 = (long)local_3e8 * (uVar22 - 1) + local_388;
            piVar1 = (int *)(lVar43 + 4 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = (uVar22 - 1) * (long)local_398 + local_3d8;
            if (*(char *)(local_400 + 1 + lVar42) == '\0') goto LAB_0016162b;
            piVar1 = (int *)(lVar43 + local_400 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + local_400) == '\0') {
              piVar1 = (int *)(lVar43 + -4 + (long)(int)(uint)local_390 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + -1 + (long)(int)(uint)local_390) == '\0') goto LAB_0016164e;
              goto LAB_0016879b;
            }
            piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * (uVar22 - 2));
            *piVar1 = *piVar1 + 1;
            uVar23 = *(undefined4 *)((uVar22 - 2) * local_358 + (long)local_3e0 + local_400 * 4);
            piVar1 = (int *)((long)local_3d0 + local_400 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_358 * uVar22 + (long)local_3e0 + local_400 * 4) = uVar23;
            local_3e0 = local_3e0;
            goto LAB_00167b4a;
          }
LAB_00160d3e:
          lVar45 = (long)(int)local_400;
          lVar42 = (long)local_3e8 * (uVar22 - 1) + local_388;
          piVar1 = (int *)(lVar42 + 4 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = (uVar22 - 1) * (long)local_398 + local_3d8;
          if (*(char *)(lVar45 + 1 + lVar43) == '\0') goto LAB_00161287;
          piVar1 = (int *)(lVar42 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + lVar45) == '\0') {
            piVar1 = (int *)(lVar42 + -4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = uVar22 - 2;
            if (*(char *)(lVar43 + -1 + lVar45) == '\0') {
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + lVar45 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
              goto LAB_0016134f;
            }
            piVar1 = (int *)(local_388 + (long)local_3e8 * lVar42 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar45 + local_3d8 + (long)local_398 * lVar42) == '\0') {
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42 + -8);
              *piVar1 = *piVar1 + 1;
              lVar43 = (long)local_3e0 + local_358 * lVar42;
              uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + lVar45 * 4));
              piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 +
                                lVar45 * 4);
            }
            else {
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * lVar42);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + lVar45 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
            }
            uVar16 = RemSP::MemMerge(uVar16,uVar17);
            piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar45 * 4) = uVar16;
            local_3e0 = (long *)local_330._24_8_;
            local_3d0 = local_2b8;
            goto LAB_00167b4a;
          }
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * (uVar22 - 2));
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + lVar45 * 4);
        }
        piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + uVar27 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
        goto LAB_0016134f;
      }
      piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 8 + lVar43 * 4);
      *piVar1 = *piVar1 + 1;
      lVar45 = local_358;
      local_238 = uVar46;
      local_208 = lVar42;
      if (*(char *)(lVar43 + 2 + (long)local_398 * uVar22 + local_3d8) != '\0') {
        local_3e8 = (pointer)local_210;
        piVar1 = (int *)(local_210 * (uVar22 | 1) + local_388 + 4 + lVar43 * 4);
        *piVar1 = *piVar1 + 1;
        local_398 = (pointer)local_220;
        local_1f0 = local_220;
        local_260 = local_3d8;
        local_1f8 = local_388;
        lVar36 = local_338;
        lVar41 = local_340;
        local_390 = (ulong)local_3e8;
        local_260 = local_3d8;
        if (*(char *)(lVar43 + 1 + (uVar22 | 1) * local_220 + local_3d8) == '\0') goto LAB_0015fdf8;
LAB_00160b12:
        iVar49 = (int)local_400;
        uVar46 = (ulong)iVar49;
        lVar48 = local_210 * (uVar22 - 1);
        lVar42 = local_388 + lVar48;
        piVar1 = (int *)(lVar42 + 4 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = local_220 * (uVar22 - 1);
        lVar43 = local_3d8 + lVar45;
        if (*(char *)(uVar46 + 1 + lVar43) == '\0') {
          piVar1 = (int *)(local_210 * uVar22 + local_388 + 4 + uVar46 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(uVar46 + 1 + local_220 * uVar22 + local_3d8) == '\0') {
            uVar20 = (ulong)iVar49;
            piVar1 = (int *)(lVar42 + -4 + uVar20 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + uVar20) == '\0') goto LAB_00161b61;
            piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * (uVar22 - 2) + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + -8 + uVar20 * 4);
            piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                     uVar20 * 4));
            uVar27 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + uVar27 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            *(uint *)(lVar43 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
            local_3a8 = (long *)local_330._80_8_;
            local_3c0 = local_280;
            local_380 = uVar27;
            local_240 = lVar43;
            goto LAB_00165713;
          }
          uVar20 = (ulong)iVar49;
          piVar1 = (int *)(lVar42 + 8 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar43 + 2 + uVar20) == '\0') {
            lVar40 = (long)iVar49;
            piVar1 = (int *)(lVar42 + -4 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar43 + -1 + lVar40) == '\0') {
LAB_001613fe:
              uVar20 = (ulong)(int)local_400;
              piVar1 = (int *)(lVar48 + local_388 + uVar20 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar20 + lVar45 + local_3d8) == '\0') {
                piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
                *piVar1 = *piVar1 + 1;
                lVar42 = (long)local_3e0 + local_358 * uVar22;
                uVar23 = *(undefined4 *)(lVar42 + -8 + uVar20 * 4);
                piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar42 + uVar20 * 4) = uVar23;
                lVar43 = local_228;
                lVar36 = local_338;
                local_388 = local_388;
                lVar42 = local_240;
                lVar45 = local_3d8;
                local_3e8 = (pointer)local_218;
                local_378 = local_378;
LAB_00162ac7:
                do {
                  local_3d8 = lVar43;
                  iVar49 = (int)local_400;
                  lVar41 = (long)iVar49;
                  local_400 = lVar41 + 2;
                  local_3d0 = local_2b8;
                  local_390 = local_400;
                  if (local_370 <= (int)local_400) {
                    puVar21 = local_350;
                    lVar43 = local_3f8;
                    lVar48 = local_3b0;
                    if (local_370 < (int)local_400) goto LAB_001645d0;
                    lVar43 = (long)local_3e8 * uVar22 + local_388;
                    piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar48 = (long)local_378 * uVar22 + lVar45;
                    if (*(char *)(lVar41 + 2 + lVar48) == '\0') {
                      piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + 8 + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar41 + 2 + (uVar22 | 1) * (long)local_378 + lVar45) == '\0') {
                        local_348 = *local_350;
                        local_340 = *local_368;
                        lVar42 = local_348 * uVar22;
                        lVar43 = local_340 * uVar22;
                        goto LAB_00163141;
                      }
                      piVar1 = (int *)(lVar43 + 0xc + lVar41 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar48 + 3 + lVar41) != '\0') {
                        lVar43 = lVar41 + 3;
                        goto LAB_00162c0f;
                      }
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar42 * uVar22 + local_330._24_8_;
                      uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                    }
                    else {
                      lVar43 = (long)(iVar49 + 3);
LAB_00162c0f:
                      piVar1 = (int *)(local_388 + (long)local_3e8 * (uVar22 - 1) + lVar43 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar43 + lVar45 + (long)local_378 * (uVar22 - 1)) != '\0') {
                        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 8
                                        );
                        *piVar1 = *piVar1 + 1;
                        uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 8 + lVar41 * 4
                                          );
                        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                        *piVar1 = *piVar1 + 1;
                        uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar42 * uVar22 + local_330._24_8_
                                                                 + lVar41 * 4));
                        piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + 8 +
                                 lVar41 * 4) = uVar16;
                        local_3e0 = (long *)local_330._24_8_;
                        local_3d0 = local_2b8;
                        goto LAB_00167b4a;
                      }
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar42 * uVar22 + local_330._24_8_;
                      uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                    }
                    *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
                    local_3e0 = (long *)local_330._24_8_;
                    goto LAB_00167b4a;
                  }
                  lVar43 = (long)local_3e8 * uVar22 + local_388;
                  piVar1 = (int *)(lVar43 + 8 + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar48 = (long)local_378 * uVar22 + lVar45;
                  if (*(char *)(lVar41 + 2 + lVar48) != '\0') {
                    lVar36 = (long)local_3e8 * (uVar22 - 1);
                    piVar1 = (int *)(local_388 + lVar36 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = (long)local_378 * (uVar22 - 1);
                    if (*(char *)(lVar41 + 3 + lVar45 + lVar40) != '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 8);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 8 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar42 * uVar22 + local_330._24_8_ +
                                                               lVar41 * 4));
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      lVar43 = *(long *)local_330._80_8_;
                      uVar46 = local_400;
                      goto LAB_00166287;
                    }
                    piVar1 = (int *)(lVar43 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar48 + 3 + lVar41) == '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      uVar23 = *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) = uVar23;
                      uVar27 = local_258;
                      lVar43 = local_230;
                      local_240 = lVar42;
                      goto LAB_00165713;
                    }
LAB_00162e08:
                    piVar1 = (int *)(local_248 + lVar36 + 0x10 + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar41 + 4 + local_3d8 + lVar40) == '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = lVar42 * uVar22 + local_330._24_8_;
                      uVar23 = *(undefined4 *)(lVar42 + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar42 + 8 + lVar41 * 4) = uVar23;
                      goto LAB_00164326;
                    }
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 0x10)
                    ;
                    *piVar1 = *piVar1 + 1;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 0x10 + lVar41 * 4)
                    ;
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    uVar17 = *(uint *)(lVar42 * uVar22 + local_330._24_8_ + lVar41 * 4);
                    goto LAB_00162e68;
                  }
                  piVar1 = (int *)(local_388 + (long)local_3e8 * (uVar22 | 1) + 8 + lVar41 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_338 = lVar36;
                  local_3e8 = (pointer)local_3a0;
                  if (*(char *)(lVar41 + 2 + lVar45 + (long)local_378 * (uVar22 | 1)) != '\0') {
                    piVar1 = (int *)(local_238 * uVar22 + local_248 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar41 + 3 + (long)local_360 * uVar22 + local_3d8) == '\0') {
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      uVar23 = *(undefined4 *)(lVar42 * uVar22 + local_330._24_8_ + lVar41 * 4);
                      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
                      *piVar1 = *piVar1 + 1;
                      local_3e0 = (long *)local_330._24_8_;
                      *(undefined4 *)(local_230 * uVar22 + local_330._24_8_ + 8 + lVar41 * 4) =
                           uVar23;
                      local_378 = local_360;
                      local_218 = local_238;
                      local_220 = (long)local_360;
                      local_210 = local_238;
                      local_398 = local_360;
                      local_3e8 = (pointer)local_238;
                      local_240 = local_230;
                      local_258 = local_380;
                      local_388 = local_248;
                      local_250 = local_380;
                      uVar46 = local_238;
                      local_358 = local_230;
                      uVar27 = local_380;
                      lVar42 = local_230;
                      local_228 = local_3d8;
                      goto LAB_001609c2;
                    }
                    lVar36 = local_238 * (uVar22 - 1);
                    piVar1 = (int *)(local_248 + lVar36 + 0xc + lVar41 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = (long)local_360 * (uVar22 - 1);
                    if (*(char *)(lVar41 + 3 + local_3d8 + lVar40) == '\0') goto LAB_00162e08;
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * (uVar22 - 2) + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + 8 + lVar41 * 4);
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_258 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar42 * uVar22 + local_330._24_8_ +
                                                             lVar41 * 4));
                    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + *local_280 * uVar22 + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar43 = *(long *)local_330._80_8_;
                    uVar20 = local_400;
                    goto LAB_00166a8e;
                  }
LAB_00163191:
                  iVar49 = (int)local_400;
                  uVar20 = (ulong)iVar49;
                  piVar1 = (int *)(local_238 * uVar22 + local_248 + 4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_3a0 = (ulong)local_3e8;
                  local_228 = local_3d8;
                  if (*(char *)(uVar20 + 1 + (long)local_360 * uVar22 + local_3d8) == '\0') {
                    uVar46 = local_400 & 0xffffffff;
                    puVar29 = (pointer)local_238;
                    local_388 = local_248;
                    lVar45 = local_248;
                    uVar28 = local_238;
                    lVar48 = (long)local_360;
                    lVar40 = local_3d8;
                    local_3e8 = (pointer)local_238;
                    local_398 = local_360;
                    local_378 = local_360;
                    local_220 = (long)local_360;
                    local_210 = local_238;
LAB_0015f73e:
                    local_218 = uVar28;
                    iVar49 = (int)uVar46;
                    lVar32 = (long)iVar49;
                    lVar42 = (long)puVar29 * (uVar22 | 1) + lVar45;
                    piVar1 = (int *)(lVar42 + 4 + lVar32 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar16 = RemSP::length_;
                    lVar43 = lVar48 * (uVar22 | 1) + lVar40;
                    uVar46 = local_238;
                    local_3d0 = local_2b8;
                    uVar28 = local_218;
                    if (*(char *)(lVar32 + 1 + lVar43) == '\0') {
                      local_3c0 = local_280;
                      uVar27 = *local_280;
                      piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + uVar27 * uVar22);
                      *piVar1 = *piVar1 + 1;
                      local_3a8 = (long *)local_330._80_8_;
                      local_358 = *(long *)local_330._80_8_;
                      local_3e0 = (long *)local_330._24_8_;
                      *(undefined4 *)(local_358 * uVar22 + local_330._24_8_ + lVar32 * 4) = 0;
                      local_400 = lVar32 + 2;
                      local_390._0_4_ = (uint)local_400;
                      local_230 = local_358;
                      if (local_370 <= (int)(uint)local_390) {
                        piVar1 = (int *)(lVar45 + (long)puVar29 * uVar22 + 8 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar3 = *(char *)(lVar32 + 2 + lVar40 + lVar48 * uVar22);
                        if ((int)(uint)local_390 <= local_370) {
                          if (cVar3 != '\0') goto LAB_00160ee6;
                          local_348 = *local_138;
                          local_340 = *(long *)local_1e8._80_8_;
                          goto LAB_0015e68d;
                        }
                        if (cVar3 != '\0') goto LAB_0016162b;
                        local_348 = *local_138;
                        local_340 = *(long *)local_1e8._80_8_;
                        lVar42 = (long)(int)(uint)local_390;
                        goto LAB_0015e6ec;
                      }
                      piVar1 = (int *)((long)puVar29 * uVar22 + lVar45 + 8 + lVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar42 = local_248;
                      lVar43 = local_228;
                      lVar36 = local_338;
                      lVar41 = local_340;
                      local_3f0 = uVar27;
                      local_390 = (ulong)puVar29;
                      local_380 = uVar27;
                      local_260 = lVar40;
                      local_258 = uVar27;
                      local_250 = uVar27;
                      local_240 = local_358;
                      local_208 = local_358;
                      local_1f8 = lVar45;
                      local_1f0 = lVar48;
                      if (*(char *)(lVar32 + 2 + lVar48 * uVar22 + lVar40) != '\0')
                      goto LAB_0015fdf8;
LAB_0015ea69:
                      lVar36 = (long)(int)local_400;
                      piVar1 = (int *)(local_390 * (uVar22 | 1) + local_1f8 + lVar36 * 4);
                      *piVar1 = *piVar1 + 1;
                      puVar29 = (pointer)local_390;
                      lVar45 = local_1f8;
                      lVar48 = local_1f0;
                      lVar40 = local_260;
                      local_248 = lVar42;
                      local_238 = uVar46;
                      local_228 = lVar43;
                      local_218 = uVar28;
                      if (*(char *)(lVar36 + (uVar22 | 1) * local_1f0 + local_260) != '\0') {
                        piVar1 = (int *)(local_1f8 + local_390 * uVar22 + 4 + lVar36 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar16 = RemSP::length_;
                        lVar42 = local_388;
                        if (*(char *)(lVar36 + 1 + local_260 + local_1f0 * uVar22) == '\0') {
                          lVar42 = (long)(int)RemSP::length_;
                          RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar42] =
                               RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                          RemSP::mem_P_.vec_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar42] = uVar16;
                          uVar16 = RemSP::length_;
                          RemSP::length_ = RemSP::length_ + 1;
                          uVar27 = *local_280;
                          piVar1 = (int *)((long)local_3d0 + lVar36 * 4 + uVar27 * uVar22);
                          *piVar1 = *piVar1 + 1;
                          local_358 = *(long *)local_330._80_8_;
                          *(uint *)(local_358 * uVar22 + (long)local_3e0 + lVar36 * 4) = uVar16;
                          lVar42 = local_358;
                          local_3c0 = local_280;
                          local_3a8 = (long *)local_330._80_8_;
                          local_380 = uVar27;
                          local_258 = uVar27;
                          local_250 = uVar27;
                          local_240 = local_358;
                          local_230 = local_358;
                          goto LAB_001609c2;
                        }
                        goto LAB_0015ec3a;
                      }
                    }
                    else {
                      lVar36 = (long)(int)RemSP::length_;
                      RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar36] =
                           RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start[lVar36] + 1;
                      RemSP::mem_P_.vec_.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar36] = uVar16;
                      uVar16 = RemSP::length_;
                      RemSP::length_ = RemSP::length_ + 1;
                      local_3c0 = local_280;
                      uVar27 = *local_280;
                      lVar41 = uVar27 * uVar22;
                      piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41);
                      *piVar1 = *piVar1 + 1;
                      local_3e0 = (long *)local_330._24_8_;
                      local_3a8 = (long *)local_330._80_8_;
                      local_358 = *(long *)local_330._80_8_;
                      lVar36 = local_358 * uVar22 + local_330._24_8_;
                      *(uint *)(lVar36 + lVar32 * 4) = uVar16;
                      local_400 = lVar32 + 2;
                      local_390._0_4_ = (uint)local_400;
                      if (local_370 <= (int)(uint)local_390) {
                        lVar45 = lVar45 + (long)puVar29 * uVar22;
                        piVar1 = (int *)(lVar45 + 8 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar48 = lVar40 + lVar48 * uVar22;
                        cVar3 = *(char *)(lVar32 + 2 + lVar48);
                        if (local_370 < (int)(uint)local_390) {
                          local_260 = lVar40;
                          if (cVar3 == '\0') goto LAB_0016464a;
                          goto LAB_00161287;
                        }
                        local_260 = lVar40;
                        if (cVar3 != '\0') goto LAB_00160d3e;
                        piVar1 = (int *)(lVar42 + 8 + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar43 + 2 + lVar32) == '\0') goto LAB_00167a72;
                        piVar1 = (int *)(lVar45 + 0xc + lVar32 * 4);
                        *piVar1 = *piVar1 + 1;
                        if (*(char *)(lVar48 + 3 + lVar32) == '\0') {
                          piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41);
                          *piVar1 = *piVar1 + 1;
                          uVar23 = *(undefined4 *)(lVar36 + lVar32 * 4);
                          piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41 + 8);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)(lVar36 + 8 + lVar32 * 4) = uVar23;
                          goto LAB_00167b4a;
                        }
                        uVar28 = local_400 & 0xffffffff;
                        goto LAB_0016115c;
                      }
                      lVar31 = (long)puVar29 * uVar22 + lVar45;
                      piVar1 = (int *)(lVar31 + 8 + lVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar33 = lVar48 * uVar22 + lVar40;
                      local_380 = uVar27;
                      if (*(char *)(lVar32 + 2 + lVar33) != '\0') {
                        local_220 = (long)local_398;
                        local_210 = (ulong)local_3e8;
                        local_3f0 = uVar27;
                        local_260 = lVar40;
                        local_258 = uVar27;
                        local_240 = local_358;
                        local_230 = local_358;
                        goto LAB_00160b12;
                      }
                      piVar1 = (int *)(lVar42 + 8 + lVar32 * 4);
                      *piVar1 = *piVar1 + 1;
                      local_260 = lVar40;
                      if (*(char *)(lVar43 + 2 + lVar32) != '\0') goto code_r0x0015fb9e;
                    }
LAB_0015ec05:
                    piVar1 = (int *)((long)puVar29 * uVar22 + lVar45 + 4 + (long)(int)local_400 * 4)
                    ;
                    *piVar1 = *piVar1 + 1;
                    uVar46 = local_400 & 0xffffffff;
                    lVar42 = local_388;
                    if (*(char *)((long)(int)local_400 + 1 + lVar48 * uVar22 + lVar40) != '\0')
                    goto LAB_0015ec3a;
                    goto LAB_0015f73e;
                  }
                  lVar42 = uVar22 - 1;
                  piVar1 = (int *)(local_248 + local_238 * lVar42 + 4 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar20 + 1 + local_3d8 + (long)local_360 * lVar42) != '\0') {
                    lVar42 = *local_3c0;
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2));
                    *piVar1 = *piVar1 + 1;
                    lVar43 = *local_3a8;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar20 * 4);
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_0016325c;
                  }
                  uVar20 = (ulong)iVar49;
                  piVar1 = (int *)((long)local_3e8 * lVar42 + local_3f8 + 8 + uVar20 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = RemSP::length_;
                  if (*(char *)(uVar20 + 2 + lVar42 * local_338 + local_3b0) != '\0') {
                    local_380 = *local_3c0;
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * (uVar22 - 2) + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar43 = *local_3a8;
                    uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
                    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
                    *piVar1 = *piVar1 + 1;
                    local_390 = local_400;
                    plVar30 = (long *)local_330._24_8_;
                    local_3a8 = local_3a8;
                    lVar42 = lVar43;
                    goto LAB_00163484;
                  }
                  lVar42 = (long)(int)RemSP::length_;
                  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar42] =
                       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar42] + 1;
                  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar42] = uVar16;
                  uVar16 = RemSP::length_;
                  RemSP::length_ = RemSP::length_ + 1;
                  local_3c0 = local_280;
                  local_380 = *local_280;
                  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + local_380 * uVar22);
                  *piVar1 = *piVar1 + 1;
                  local_3a8 = (long *)local_330._80_8_;
                  local_230 = *(long *)local_330._80_8_;
                  *(uint *)(local_230 * uVar22 + local_330._24_8_ + (long)iVar49 * 4) = uVar16;
                  lVar43 = local_3b0;
                  lVar36 = local_338;
                  local_388 = local_3f8;
                  lVar42 = local_230;
                  lVar45 = local_3b0;
                  local_378 = (pointer)local_338;
                  local_360 = (pointer)local_338;
                  local_348 = (ulong)local_3e8;
                  local_340 = local_338;
                  local_258 = local_380;
                  local_248 = local_3f8;
                  local_238 = (ulong)local_3e8;
                } while( true );
              }
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * (uVar22 - 2));
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                       uVar20 * 4));
              local_3c0 = local_280;
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
              *piVar1 = *piVar1 + 1;
              local_3a8 = (long *)local_330._80_8_;
              uVar46 = local_400;
              plVar30 = (long *)local_330._24_8_;
              lVar42 = *(long *)local_330._80_8_;
              goto LAB_0015edca;
            }
            piVar1 = (int *)((long)local_3d0 + lVar40 * 4 + local_3f0 * (uVar22 - 2) + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + -8 + lVar40 * 4);
            piVar1 = (int *)((long)local_3d0 + lVar40 * 4 + local_3f0 * uVar22 + -8);
            *piVar1 = *piVar1 + 1;
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                     lVar40 * 4));
            piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * uVar22);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + lVar40 * 4) = uVar16;
            goto LAB_00164326;
          }
          piVar1 = (int *)(lVar42 + uVar20 * 4);
          *piVar1 = *piVar1 + 1;
          local_390 = local_400;
          if (*(char *)(lVar43 + uVar20) == '\0') {
            lVar45 = (long)iVar49;
            piVar1 = (int *)(lVar42 + -4 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = uVar22 - 2;
            if (*(char *)(lVar43 + -1 + lVar45) == '\0') {
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + 8 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                       lVar45 * 4));
              local_380 = *local_280;
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
              *piVar1 = *piVar1 + 1;
              lVar43 = *(long *)local_330._80_8_;
              plVar30 = (long *)local_330._24_8_;
              local_3a8 = (long *)local_330._80_8_;
              lVar42 = lVar43;
              local_3c0 = local_280;
            }
            else {
              local_388 = local_388 + local_210 * lVar42;
              piVar1 = (int *)(local_388 + 4 + uVar46 * 4);
              *piVar1 = *piVar1 + 1;
              local_3d8 = local_3d8 + local_220 * lVar42;
              if (*(char *)(uVar46 + 1 + local_3d8) == '\0') {
                piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * lVar42 + -8);
                *piVar1 = *piVar1 + 1;
                lVar43 = (long)local_3e0 + local_358 * lVar42;
                uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
                piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
                *piVar1 = *piVar1 + 1;
                uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
                piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
                *piVar1 = *piVar1 + 1;
                uVar16 = RemSP::MemMerge(uVar16,*(uint *)(*(long *)local_330._80_8_ * uVar22 +
                                                          local_330._24_8_ + -8 + lVar45 * 4));
                local_380 = *local_280;
                piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                plVar30 = (long *)local_330._24_8_;
                local_3a8 = (long *)local_330._80_8_;
                lVar42 = lVar43;
                local_3c0 = local_280;
              }
              else {
                piVar1 = (int *)(local_388 + uVar20 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(local_3d8 + uVar20) == '\0') {
                  piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * lVar42 + -8);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = (long)local_3e0 + local_358 * lVar42;
                  uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
                  piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
                  piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 +
                                    lVar45 * 4);
                }
                else {
                  piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * lVar42 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + 8 + uVar20 * 4);
                  piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
                  *piVar1 = *piVar1 + 1;
                  uVar17 = *(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 + lVar45 * 4);
                }
                uVar16 = RemSP::MemMerge(uVar16,uVar17);
                local_380 = *local_280;
                piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
                *piVar1 = *piVar1 + 1;
                lVar43 = *(long *)local_330._80_8_;
                plVar30 = (long *)local_330._24_8_;
                local_3a8 = (long *)local_330._80_8_;
                lVar42 = lVar43;
                local_3c0 = local_280;
              }
            }
          }
          else {
            lVar42 = uVar22 - 2;
            piVar1 = (int *)(local_388 + local_210 * lVar42 + 4 + uVar46 * 4);
            *piVar1 = *piVar1 + 1;
            lVar45 = local_3f0 * lVar42;
            lVar43 = lVar42 * local_358 + (long)local_3e0;
            if (*(char *)(uVar46 + 1 + local_3d8 + local_220 * lVar42) == '\0') {
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar45);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar43 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar45 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
              piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)local_330._80_8_ * uVar22 + local_330._24_8_;
            }
            else {
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar45 + 8);
              *piVar1 = *piVar1 + 1;
              uVar16 = *(uint *)(lVar43 + 8 + uVar20 * 4);
              piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_3f0 * uVar22 + -8);
              *piVar1 = *piVar1 + 1;
              lVar42 = (long)local_3e0 + local_358 * uVar22;
            }
            uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar42 + -8 + uVar20 * 4));
            local_380 = *local_280;
            piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)local_330._80_8_;
            plVar30 = (long *)local_330._24_8_;
            local_3a8 = (long *)local_330._80_8_;
            lVar42 = lVar43;
            local_3c0 = local_280;
          }
          goto LAB_00163484;
        }
        piVar1 = (int *)(lVar42 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar43 + uVar46) != '\0') {
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * (uVar22 - 2));
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)((uVar22 - 2) * local_358 + (long)local_3e0 + uVar46 * 4);
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                   uVar46 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          goto LAB_00161910;
        }
        lVar45 = (long)iVar49;
        piVar1 = (int *)(lVar42 + -4 + lVar45 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = uVar22 - 2;
        if (*(char *)(lVar43 + -1 + lVar45) == '\0') {
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * lVar42);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + uVar46 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                   lVar45 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)local_330._80_8_;
          goto LAB_00161910;
        }
        piVar1 = (int *)(local_388 + local_210 * lVar42 + uVar46 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(uVar46 + local_3d8 + local_220 * lVar42) == '\0') {
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * lVar42 + -8);
          *piVar1 = *piVar1 + 1;
          lVar43 = (long)local_3e0 + local_358 * lVar42;
          uVar16 = *(uint *)(lVar43 + -8 + lVar45 * 4);
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * lVar42);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + uVar46 * 4));
          piVar1 = (int *)((long)local_2b8 + lVar45 * 4 + *local_280 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(*(long *)local_330._80_8_ * uVar22 +
                                                    local_330._24_8_ + -8 + lVar45 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_3f0 * lVar42);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar42 * local_358 + (long)local_3e0 + uVar46 * 4);
          piVar1 = (int *)((long)local_3d0 + lVar45 * 4 + local_3f0 * uVar22 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_358 * uVar22 + (long)local_3e0 + -8 +
                                                   lVar45 * 4));
          piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
          *piVar1 = *piVar1 + 1;
        }
        local_3e0 = (long *)local_330._24_8_;
        lVar43 = *(long *)local_330._80_8_;
        goto LAB_00166f6c;
      }
LAB_001606b6:
      local_260 = lVar45;
      lVar42 = (long)local_3e8 * (uVar22 | 1) + local_388;
      lVar36 = (long)(int)local_400;
      piVar1 = (int *)(lVar42 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      lVar43 = (uVar22 | 1) * (long)local_398 + local_3d8;
      puVar29 = local_3e8;
      lVar45 = local_388;
      uVar28 = local_218;
      lVar48 = (long)local_398;
      lVar40 = local_3d8;
      if (*(char *)(lVar36 + lVar43) == '\0') goto LAB_0015ec05;
      piVar1 = (int *)((long)local_3e8 * uVar22 + local_388 + 4 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      local_358 = local_260;
      if (*(char *)(lVar36 + 1 + (long)local_398 * uVar22 + local_3d8) != '\0') {
        piVar1 = (int *)(lVar42 + -4 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = local_388;
        if (*(char *)(lVar43 + -1 + lVar36) == '\0') goto LAB_0015ec3a;
        lVar36 = lVar36 + 1;
        local_358 = local_230;
        goto LAB_0016076d;
      }
LAB_001608bf:
      lVar42 = (long)(int)local_400;
      piVar1 = (int *)((long)local_3e8 * (uVar22 | 1) + local_388 + -4 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = RemSP::length_;
      if (*(char *)(lVar42 + -1 + (uVar22 | 1) * (long)local_398 + local_3d8) == '\0') {
        lVar43 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar43] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar43] = uVar16;
        uVar16 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + uVar27 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_358 * uVar22 + local_330._24_8_ + lVar42 * 4) = uVar16;
        lVar42 = local_358;
        local_250 = uVar27;
      }
      else {
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + local_250 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        lVar43 = local_208 * uVar22 + local_330._24_8_;
        uVar23 = *(undefined4 *)(lVar43 + -8 + lVar42 * 4);
        piVar1 = (int *)((long)local_2b8 + lVar42 * 4 + local_250 * uVar22);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar43 + lVar42 * 4) = uVar23;
        lVar42 = local_208;
      }
      local_3e0 = (long *)local_330._24_8_;
      uVar46 = local_238;
      local_3d0 = local_2b8;
    } while( true );
  }
  lVar48 = local_3a0 * (uVar22 - 1);
  piVar1 = (int *)(local_170 + lVar48 + 0xc + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar45 = (uVar22 - 1) * (long)local_360;
  if (*(char *)(lVar41 + 3 + local_1e8._24_8_ + lVar45) == '\0') {
LAB_0015f2c1:
    piVar1 = (int *)(lVar48 + local_170 + 0x10 + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar41 + 4 + lVar45 + local_1e8._24_8_) == '\0') {
      lVar42 = *local_3c0;
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *local_3a8 * uVar22 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar43 + lVar41 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar43 + 8 + lVar41 * 4) = uVar23;
      goto LAB_00164326;
    }
    lVar42 = uVar22 - 2;
    lVar36 = local_3a0 * lVar42;
    piVar1 = (int *)(local_170 + lVar36 + 0xc + lVar41 * 4);
    *piVar1 = *piVar1 + 1;
    lVar48 = (long)local_360 * lVar42;
    if ((*(char *)(lVar41 + 3 + lVar48 + local_1e8._24_8_) != '\0') &&
       (piVar1 = (int *)(local_170 + lVar36 + 8 + lVar41 * 4), *piVar1 = *piVar1 + 1,
       *(char *)(lVar48 + local_1e8._24_8_ + 2 + lVar41) != '\0')) goto LAB_00164967;
    lVar43 = *local_3c0;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * lVar42 + 0x10);
    *piVar1 = *piVar1 + 1;
    lVar45 = *local_3a8;
    uVar16 = *(uint *)(lVar42 * lVar45 + local_330._24_8_ + 0x10 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar43 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar45 * uVar22 + local_330._24_8_ + lVar41 * 4);
LAB_00162e68:
    uVar16 = RemSP::MemMerge(uVar16,uVar17);
    local_3c0 = local_280;
    local_380 = *local_280;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + local_380 * uVar22 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    plVar30 = (long *)local_330._24_8_;
    uVar20 = local_390;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = *(long *)local_330._80_8_;
    goto LAB_00163484;
  }
  lVar45 = uVar22 - 2;
  lVar42 = local_3a0 * lVar45;
  piVar1 = (int *)(local_170 + lVar42 + 8 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  lVar43 = (long)local_360 * lVar45;
  if (*(char *)(lVar41 + 2 + local_1e8._24_8_ + lVar43) == '\0') {
    lVar42 = *local_3c0;
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * lVar45 + 8);
    *piVar1 = *piVar1 + 1;
    lVar43 = *local_3a8;
    uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 8 + lVar41 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar41 * 4 + lVar42 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar42 = lVar43 * uVar22 + local_330._24_8_;
    uVar20 = local_400;
    goto LAB_00166a52;
  }
  local_400 = local_400 & 0xffffffff;
LAB_00164e5d:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar42 + local_170 + -4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)((uVar20 - 1) + lVar43 + local_1e8._24_8_);
  lVar42 = *local_280;
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * (uVar22 - 2));
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
  uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + uVar20 * 4);
  if (cVar3 == '\0') {
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar42 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
LAB_00168264:
    uVar17 = *(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 + uVar20 * 4);
LAB_00168272:
    uVar16 = RemSP::MemMerge(uVar16,uVar17);
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
  }
  else {
    puVar29 = (pointer)((long)local_2b8 + lVar42 * uVar22);
LAB_0015ecc9:
    puVar29[uVar20] = puVar29[uVar20] + 1;
  }
  goto LAB_0016325c;
LAB_0015fdf8:
  local_338 = lVar41;
  uVar46 = (ulong)(int)local_400;
  lVar42 = local_390 * (uVar22 - 1) + local_1f8;
  piVar1 = (int *)(lVar42 + 4 + uVar46 * 4);
  *piVar1 = *piVar1 + 1;
  lVar48 = (uVar22 - 1) * local_1f0 + local_260;
  if (*(char *)(uVar46 + 1 + lVar48) != '\0') {
    piVar1 = (int *)(lVar42 + uVar46 * 4);
    *piVar1 = *piVar1 + 1;
    lVar43 = local_208;
    if (*(char *)(lVar48 + uVar46) == '\0') {
      piVar1 = (int *)(lVar42 + -4 + (long)(int)local_400 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar48 + -1 + (long)(int)local_400) != '\0') goto LAB_00167952;
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar46 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
    }
    else {
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar46 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar46 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      local_400 = local_400 & 0xffffffff;
      local_3e0 = local_3e0;
    }
    goto LAB_00166f6c;
  }
  piVar1 = (int *)(local_390 * uVar22 + local_1f8 + 4 + uVar46 * 4);
  *piVar1 = *piVar1 + 1;
  local_340 = local_338;
  if (*(char *)(uVar46 + 1 + local_1f0 * uVar22 + local_260) == '\0') {
    uVar20 = (ulong)(int)local_400;
    piVar1 = (int *)(lVar42 + uVar20 * 4);
    *piVar1 = *piVar1 + 1;
    uVar27 = local_3f0;
    if (*(char *)(lVar48 + uVar20) != '\0') {
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2));
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar20 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar42 = local_208;
      goto LAB_001621b6;
    }
    lVar43 = (long)(int)local_400;
    piVar1 = (int *)(lVar42 + -4 + lVar43 * 4);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::length_;
    lVar42 = local_208 * uVar22 + (long)local_3e0;
    if (*(char *)(lVar48 + -1 + lVar43) == '\0') {
      lVar43 = (long)(int)RemSP::length_;
      RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43] =
           RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar43] + 1;
      RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[lVar43] = uVar16;
      uVar16 = RemSP::length_;
      RemSP::length_ = RemSP::length_ + 1;
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(uint *)(lVar42 + uVar20 * 4) = uVar16;
      uVar20 = local_400;
      local_338 = lVar36;
    }
    else {
      piVar1 = (int *)((long)local_3d0 + lVar43 * 4 + local_250 * (uVar22 - 2) + -8);
      *piVar1 = *piVar1 + 1;
      uVar23 = *(undefined4 *)((uVar22 - 2) * local_208 + (long)local_3e0 + -8 + lVar43 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar42 + uVar20 * 4) = uVar23;
      uVar20 = local_400;
      local_338 = lVar36;
    }
    goto LAB_00160327;
  }
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar42 + 8 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)(lVar48 + 2 + uVar20);
  piVar1 = (int *)(lVar42 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  if (cVar3 != '\0') {
    if (*(char *)(lVar48 + uVar20) != '\0') goto LAB_0015ed2d;
    piVar1 = (int *)(lVar42 + -4 + (long)(int)local_400 * 4);
    *piVar1 = *piVar1 + 1;
    lVar42 = uVar46 + 1;
    if (*(char *)(lVar48 + -1 + (long)(int)local_400) != '\0') goto LAB_001682dc;
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2) + 8);
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + 8 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = local_230;
    local_390 = local_400;
    plVar30 = local_3e0;
    local_3a8 = local_3a8;
    lVar42 = local_208;
    goto LAB_00163484;
  }
  if (*(char *)(lVar48 + uVar20) != '\0') {
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar46 = local_400;
    plVar30 = local_3e0;
    lVar42 = local_208;
    goto LAB_0015edca;
  }
  lVar41 = (long)(int)local_400;
  piVar1 = (int *)(lVar42 + -4 + lVar41 * 4);
  *piVar1 = *piVar1 + 1;
  uVar16 = RemSP::length_;
  lVar40 = local_208 * uVar22 + (long)local_3e0;
  lVar43 = local_228;
  local_3e8 = (pointer)local_218;
  lVar42 = local_240;
  lVar45 = local_3d8;
  if (*(char *)(lVar48 + -1 + lVar41) == '\0') {
    lVar48 = (long)(int)RemSP::length_;
    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar48] =
         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start[lVar48] + 1;
    RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar48] = uVar16;
    uVar16 = RemSP::length_;
    RemSP::length_ = RemSP::length_ + 1;
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(uint *)(lVar40 + uVar20 * 4) = uVar16;
  }
  else {
    piVar1 = (int *)((long)local_3d0 + lVar41 * 4 + local_250 * (uVar22 - 2) + -8);
    *piVar1 = *piVar1 + 1;
    uVar23 = *(undefined4 *)((long)local_3e0 + local_208 * (uVar22 - 2) + -8 + lVar41 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar40 + uVar20 * 4) = uVar23;
  }
  goto LAB_00162ac7;
LAB_001682dc:
  lVar45 = uVar22 - 2;
  local_3f8 = local_348 * lVar45 + local_3f8;
  piVar1 = (int *)(local_3f8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  local_3b0 = local_338 * lVar45 + local_3b0;
  iVar49 = (int)local_400;
  if (*(char *)(lVar42 + local_3b0) == '\0') {
    lVar42 = *local_280;
    lVar48 = (long)iVar49;
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 * lVar45 + -8);
    *piVar1 = *piVar1 + 1;
    lVar43 = lVar45 * *(long *)local_330._80_8_ + local_330._24_8_;
    uVar16 = *(uint *)(lVar43 + -8 + lVar48 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 * lVar45 + 8);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar43 + 8 + lVar48 * 4);
  }
  else {
    lVar48 = (long)iVar49;
    piVar1 = (int *)(local_3f8 + lVar48 * 4);
    *piVar1 = *piVar1 + 1;
    local_380 = *local_280;
    lVar42 = local_380 * lVar45;
    if (*(char *)(local_3b0 + lVar48) != '\0') {
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 + 8);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar45 * lVar43 + local_330._24_8_ + 8 + lVar48 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      goto LAB_0016855e;
    }
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 + -8);
    *piVar1 = *piVar1 + 1;
    lVar43 = lVar45 * *(long *)local_330._80_8_ + local_330._24_8_;
    uVar16 = *(uint *)(lVar43 + -8 + lVar48 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar42 + 8);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar43 + 8 + lVar48 * 4);
  }
  uVar16 = RemSP::MemMerge(uVar16,uVar17);
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + (long)iVar49 * 4 + local_380 * uVar22);
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
LAB_0016855e:
  local_390 = local_400;
  plVar30 = (long *)local_330._24_8_;
  uVar20 = (long)iVar49;
  local_3a8 = (long *)local_330._80_8_;
  lVar42 = lVar43;
  local_3c0 = local_280;
  goto LAB_00163484;
LAB_0015ec3a:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(uVar28 * (uVar22 - 1) + lVar42 + 4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  lVar45 = local_248;
  uVar27 = local_238;
  lVar48 = local_228;
  if (*(char *)(uVar20 + 1 + (uVar22 - 1) * (long)local_378 + local_3d8) != '\0') goto LAB_0015ec83;
LAB_0015ecda:
  local_228 = lVar48;
  local_238 = uVar27;
  local_248 = lVar45;
  uVar20 = (ulong)(int)local_400;
  lVar45 = uVar28 * (uVar22 - 1) + lVar42;
  piVar1 = (int *)(lVar45 + 8 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  lVar43 = (uVar22 - 1) * (long)local_378 + local_3d8;
  cVar3 = *(char *)(uVar20 + 2 + lVar43);
  piVar1 = (int *)(lVar45 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  uVar16 = RemSP::length_;
  cVar4 = *(char *)(uVar20 + lVar43);
  if (cVar3 != '\0') {
    local_390 = local_400;
    local_338 = local_340;
    if (cVar4 == '\0') goto LAB_0015f06a;
    goto LAB_0015ed2d;
  }
  if (cVar4 != '\0') {
    local_3c0 = local_280;
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)((uVar22 - 2) * lVar42 + local_330._24_8_ + uVar20 * 4);
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + lVar43 * uVar22);
    *piVar1 = *piVar1 + 1;
    uVar46 = local_400;
    plVar30 = (long *)local_330._24_8_;
    goto LAB_0015edca;
  }
  lVar43 = (long)(int)RemSP::length_;
  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar43] =
       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar43] + 1;
  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar43] = uVar16;
  uVar16 = RemSP::length_;
  RemSP::length_ = RemSP::length_ + 1;
  local_3c0 = local_280;
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
  *piVar1 = *piVar1 + 1;
  local_3a8 = (long *)local_330._80_8_;
  local_230 = *(long *)local_330._80_8_;
  *(uint *)(local_230 * uVar22 + local_330._24_8_ + uVar20 * 4) = uVar16;
  lVar43 = local_228;
  lVar36 = local_338;
  local_388 = lVar42;
  lVar42 = local_230;
  lVar45 = local_3d8;
  local_3e8 = (pointer)uVar28;
  local_258 = local_380;
  goto LAB_00162ac7;
code_r0x0015fb9e:
  piVar1 = (int *)(lVar31 + 0xc + lVar32 * 4);
  *piVar1 = *piVar1 + 1;
  local_250 = uVar27;
  if (*(char *)(lVar33 + 3 + lVar32) == '\0') {
    piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41);
    *piVar1 = *piVar1 + 1;
    uVar23 = *(undefined4 *)(lVar36 + lVar32 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar32 * 4 + lVar41 + 8);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar36 + 8 + lVar32 * 4) = uVar23;
    lVar42 = local_358;
    local_258 = uVar27;
    local_240 = local_358;
    local_230 = local_358;
    goto LAB_001609c2;
  }
  lVar36 = (long)(iVar49 + 3);
  local_260 = local_358;
  local_258 = uVar27;
  local_240 = local_358;
  local_208 = local_358;
LAB_0016076d:
  lVar43 = (long)local_3e8 * (uVar22 - 1);
  piVar1 = (int *)(local_388 + lVar43 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  lVar42 = (long)local_398 * (uVar22 - 1);
  if (*(char *)(lVar36 + local_3d8 + lVar42) != '\0') {
    uVar20 = (ulong)(int)local_400;
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * (uVar22 - 2));
    *piVar1 = *piVar1 + 1;
    uVar16 = *(uint *)((uVar22 - 2) * local_208 + (long)local_3e0 + uVar20 * 4);
    piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_208 * uVar22 + (long)local_3e0 + -8 + uVar20 * 4
                                             ));
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    goto LAB_0016325c;
  }
  local_230 = local_358;
  local_358 = local_260;
  local_3f0 = uVar27;
LAB_00160f94:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar43 + local_388 + 8 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar20 + 2 + lVar42 + local_3d8) != '\0') {
    lVar45 = uVar22 - 2;
    piVar1 = (int *)(local_388 + (long)local_3e8 * lVar45 + 4 + uVar20 * 4);
    *piVar1 = *piVar1 + 1;
    local_390 = local_400;
    if (*(char *)(uVar20 + 1 + local_3d8 + (long)local_398 * lVar45) == '\0') {
      uVar28 = (ulong)(int)local_400;
      piVar1 = (int *)(lVar43 + local_388 + uVar28 * 4);
      *piVar1 = *piVar1 + 1;
      lVar48 = local_250 * lVar45;
      lVar43 = lVar45 * local_208 + (long)local_3e0;
      if (*(char *)(lVar42 + local_3d8 + uVar28) == '\0') {
        piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar48 + 8);
        *piVar1 = *piVar1 + 1;
        uVar17 = *(uint *)(lVar43 + 8 + uVar20 * 4);
        piVar1 = (int *)((long)local_3d0 + uVar28 * 4 + local_250 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)((long)local_3e0 + local_208 * uVar22 + -8 + uVar28 * 4);
      }
      else {
        piVar1 = (int *)((long)local_3d0 + uVar28 * 4 + lVar48);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar43 + uVar28 * 4);
        piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + lVar48 + 8);
        *piVar1 = *piVar1 + 1;
        uVar17 = RemSP::MemMerge(uVar16,*(uint *)(lVar43 + 8 + uVar20 * 4));
        piVar1 = (int *)((long)local_2b8 + uVar28 * 4 + *local_280 * uVar22 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(*(long *)local_330._80_8_ * uVar22 + local_330._24_8_ + -8 + uVar28 * 4);
      }
      uVar16 = RemSP::MemMerge(uVar17,uVar16);
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar28 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      plVar30 = (long *)local_330._24_8_;
      uVar20 = uVar28;
      local_3a8 = (long *)local_330._80_8_;
      lVar42 = lVar43;
      local_3c0 = local_280;
    }
    else {
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * lVar45 + 8);
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)(lVar45 * local_208 + (long)local_3e0 + 8 + uVar20 * 4);
      piVar1 = (int *)((long)local_3d0 + uVar20 * 4 + local_250 * uVar22 + -8);
      *piVar1 = *piVar1 + 1;
      uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_208 * uVar22 + (long)local_3e0 + -8 +
                                               uVar20 * 4));
      local_380 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)local_330._80_8_;
      plVar30 = (long *)local_330._24_8_;
      local_3a8 = (long *)local_330._80_8_;
      lVar42 = lVar43;
      local_3c0 = local_280;
    }
    goto LAB_00163484;
  }
  lVar48 = (long)local_3e8 * (uVar22 - 1);
  lVar45 = (long)local_398 * (uVar22 - 1);
  goto LAB_001613fe;
LAB_00164967:
  uVar20 = (ulong)(int)local_400;
  piVar1 = (int *)(lVar36 + local_170 + -4 + uVar20 * 4);
  *piVar1 = *piVar1 + 1;
  cVar3 = *(char *)((uVar20 - 1) + lVar48 + local_1e8._24_8_);
  local_3c0 = local_280;
  local_380 = *local_280;
  piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * (uVar22 - 2) + 8);
  *piVar1 = *piVar1 + 1;
  lVar43 = *(long *)local_330._80_8_;
  uVar16 = *(uint *)((uVar22 - 2) * lVar43 + local_330._24_8_ + 8 + uVar20 * 4);
  local_390 = local_400;
  if (cVar3 == '\0') {
    uVar20 = (ulong)(int)local_400;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22 + -8);
    *piVar1 = *piVar1 + 1;
    uVar16 = RemSP::MemMerge(uVar16,*(uint *)(local_330._24_8_ + lVar43 * uVar22 + -8 + uVar20 * 4))
    ;
LAB_0015f11a:
    local_380 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar43;
    local_3c0 = local_280;
  }
  else {
    piVar1 = (int *)((long)local_2b8 + uVar20 * 4 + local_380 * uVar22);
    *piVar1 = *piVar1 + 1;
    plVar30 = (long *)local_330._24_8_;
    local_3a8 = (long *)local_330._80_8_;
    lVar42 = lVar43;
  }
  goto LAB_00163484;
LAB_001678ff:
  uVar46 = lVar50 + 0x200000000 >> 0x20;
  local_400 = (ulong)(uint)(iVar49 + (int)lVar54);
LAB_00167952:
  lVar42 = uVar22 - 2;
  piVar1 = (int *)(local_348 * lVar42 + local_3f8 + uVar46 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar46 + local_338 * lVar42 + local_3b0) == '\0') {
    lVar43 = *local_280;
    piVar1 = (int *)((long)local_2b8 + (long)(int)local_400 * 4 + lVar43 * lVar42 + -8);
    *piVar1 = *piVar1 + 1;
    lVar45 = lVar42 * *(long *)local_330._80_8_ + local_330._24_8_;
    uVar16 = *(uint *)(lVar45 + -8 + (long)(int)local_400 * 4);
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar43 * lVar42);
    *piVar1 = *piVar1 + 1;
    uVar17 = *(uint *)(lVar45 + uVar46 * 4);
    local_3f0 = local_400;
LAB_00167a02:
    uVar16 = RemSP::MemMerge(uVar16,uVar17);
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + *local_280 * uVar22);
    *piVar1 = *piVar1 + 1;
    local_3e0 = (long *)local_330._24_8_;
    lVar43 = *(long *)local_330._80_8_;
    local_400 = local_3f0;
  }
  else {
    lVar45 = *local_280;
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * lVar42);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)local_330._80_8_;
    uVar16 = *(uint *)(lVar42 * lVar43 + local_330._24_8_ + uVar46 * 4);
LAB_001679ae:
    piVar1 = (int *)((long)local_2b8 + uVar46 * 4 + lVar45 * uVar22);
    *piVar1 = *piVar1 + 1;
    local_3e0 = (long *)local_330._24_8_;
  }
  goto LAB_00166f6c;
LAB_0016a6d2:
  local_368 = (long *)local_1e8._24_8_;
  piVar1 = (int *)((long)puVar29 + lVar45 + local_400 * lVar26);
  *piVar1 = *piVar1 + 1;
  local_388 = local_388 + local_3d8 * lVar26;
  uVar23 = *(undefined4 *)(lVar45 + local_388);
  piVar1 = (int *)((long)puVar29 + lVar36 * 4 + lVar40 * 4 + local_400 * lVar26 + 8);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_388 + lVar40 * 4 + 8 + lVar36 * 4) = uVar23;
  uVar51 = (ulong)(uint)(iVar24 + iVar52);
  local_3a0 = local_260;
LAB_0016a842:
  do {
    this = local_268;
    iVar24 = (int)uVar51;
    uVar18 = iVar24 + 2;
    local_3f8 = local_3a0;
    if (local_370 <= (int)uVar18) {
LAB_0016c177:
      local_3a0 = local_3f8;
      if (local_370 < (int)uVar18) goto LAB_0016c942;
      lVar48 = (long)(int)uVar18;
      piVar1 = (int *)(*local_138 * lVar26 + local_170 + lVar48 * 4);
      *piVar1 = *piVar1 + 1;
      local_3e8 = local_378;
      if (*(char *)(lVar48 + local_3f0 * lVar26 + (long)local_368) == '\0') goto LAB_0016c578;
      lVar45 = (long)iVar24;
      piVar1 = (int *)(*local_138 * lVar42 + local_170 + 0xc + lVar45 * 4);
      *piVar1 = *piVar1 + 1;
      lVar40 = local_3f0 * lVar42 + (long)local_368;
      if (*(char *)(lVar45 + 3 + lVar40) == '\0') {
        lVar42 = *local_3e0;
        piVar1 = (int *)((long)local_378 + lVar45 * 4 + lVar42 * lVar26);
        *piVar1 = *piVar1 + 1;
        local_3f8 = local_3f8 + lVar26 * *(long *)local_3d0;
        uVar23 = *(undefined4 *)(local_3f8 + lVar45 * 4);
        piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar26);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_3f8 + lVar48 * 4) = uVar23;
        goto LAB_0016d178;
      }
      piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar48 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = local_3f0 * lVar43;
      if ((*(char *)(lVar48 + (long)local_368 + lVar36) != '\0') &&
         (piVar1 = (int *)(lVar42 * *local_138 + local_170 + lVar45 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar40 + lVar45) != '\0')) goto LAB_0016c309;
      lVar42 = *local_3e0;
      piVar1 = (int *)((long)local_378 + lVar48 * 4 + lVar42 * lVar43);
      *piVar1 = *piVar1 + 1;
      lVar40 = *(long *)local_3d0;
      uVar18 = *(uint *)(lVar43 * lVar40 + local_3f8 + lVar48 * 4);
      piVar1 = (int *)((long)local_378 + lVar45 * 4 + lVar42 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar16 = *(uint *)(lVar40 * lVar26 + local_3f8 + lVar45 * 4);
      goto LAB_0016d139;
    }
    lVar41 = (long)local_3c0 * lVar26;
    lVar31 = local_3f0 * lVar26;
    local_350 = (ulong *)local_1e8._24_8_;
    local_398 = local_2b8;
    local_3e0 = local_280;
    local_3f8 = local_330._24_8_;
    local_3d0 = (pointer)local_330._80_8_;
    lVar33 = (long)iVar24;
    lVar45 = lVar33 + 2;
    local_3c0 = (long *)*local_138;
    lVar36 = lVar33 << 0x20;
    lVar48 = local_170 + (long)local_3c0 * lVar42 + lVar33 * 4;
    lVar40 = local_1e8._24_8_ + lVar33;
    lVar32 = lVar33 * 4 + local_330._24_8_;
    lVar35 = 0;
    while( true ) {
      piVar1 = (int *)(lVar41 + lVar33 * 4 + (long)local_3a8 + 8 + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      local_378 = local_2b8;
      if (*(char *)((long)local_368 + lVar31 + lVar33 + 2 + lVar35) == '\0') {
        uVar51 = (ulong)(uint)((int)lVar45 + (int)lVar35);
        local_3f0 = *(ulong *)local_1e8._80_8_;
        local_3a0 = local_330._24_8_;
        local_368 = (long *)local_1e8._24_8_;
        local_3b0 = local_170;
        plVar30 = (long *)local_170;
        local_3a8 = (long *)local_170;
        puVar29 = local_2b8;
        local_380 = local_1e8._24_8_;
        local_388 = local_3a0;
        local_360 = local_378;
        local_260 = local_3a0;
        goto LAB_00169fa0;
      }
      piVar1 = (int *)(lVar48 + 0xc + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = *(ulong *)local_1e8._80_8_;
      lVar37 = lVar40 + local_3f0 * lVar42;
      lVar54 = lVar36 >> 0x1e;
      lVar44 = lVar36 >> 0x20;
      if (*(char *)(lVar35 + 3 + lVar37) != '\0') break;
      piVar1 = (int *)(local_170 + 0xc + (long)local_3c0 * lVar26 + lVar33 * 4 + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar35 + 3 + local_3f0 * lVar26 + lVar40) == '\0') {
        lVar48 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar54 + lVar48 * lVar26);
        *piVar1 = *piVar1 + 1;
        lVar40 = local_330._24_8_ + *(long *)local_330._80_8_ * lVar26;
        uVar23 = *(undefined4 *)(lVar54 + lVar40);
        piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + lVar48 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar40 + lVar33 * 4 + 8 + lVar35 * 4) = uVar23;
        uVar16 = (int)lVar45 + (int)lVar35;
        goto LAB_0016bdad;
      }
      piVar1 = (int *)(lVar48 + 0x10 + lVar35 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar35 + 4 + lVar37) != '\0') {
        uVar51 = lVar45 + lVar35;
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar33 * 4 + 0xc + lVar35 * 4);
        *piVar1 = *piVar1 + 1;
        lVar41 = local_3f0 * lVar43;
        uVar22 = lVar33 + 2 + lVar35;
        if (*(char *)(lVar35 + 3 + lVar40 + lVar41) == '\0') {
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar45 * lVar43 + lVar33 * 4 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar48 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(lVar32 + lVar48 * lVar43 + 0x10 + lVar35 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar54 + lVar45 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar54 + local_330._24_8_ + lVar48 * lVar26));
          local_400 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_330._80_8_;
          local_388 = local_330._24_8_;
          local_378 = local_2b8;
          puVar29 = local_2b8;
          this = local_268;
          lVar45 = local_330._24_8_;
          local_3f8 = local_330._24_8_;
          local_3e8 = local_2b8;
          local_3e0 = local_280;
          local_3d0 = (pointer)local_330._80_8_;
          local_3a0 = local_330._24_8_;
          local_398 = local_2b8;
          goto LAB_0016a266;
        }
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar33 * 4 + 8 + lVar35 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar35 + 2 + lVar40 + lVar41) == '\0') {
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar45 * lVar43 + lVar33 * 4 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar48 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(lVar32 + lVar48 * lVar43 + 0x10 + lVar35 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar54 + lVar45 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar54 + local_330._24_8_ + lVar48 * lVar26);
        }
        else {
          piVar1 = (int *)(lVar54 + *local_138 * lVar42 + local_170);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_3f0 * lVar42 + local_1e8._24_8_ + lVar44) != '\0') {
            local_3a0 = local_330._24_8_;
            local_380 = local_330._24_8_;
            local_3e8 = local_2b8;
            local_368 = (long *)local_1e8._24_8_;
            lVar45 = local_330._24_8_;
            local_360 = local_2b8;
            goto LAB_0016ad5a;
          }
          lVar45 = *local_280;
          piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar45 * lVar43 + lVar33 * 4 + 0x10);
          *piVar1 = *piVar1 + 1;
          lVar48 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(lVar32 + lVar48 * lVar43 + 0x10 + lVar35 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar44 * 4 + lVar45 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(local_330._24_8_ + lVar48 * lVar26 + lVar44 * 4);
        }
        uVar18 = RemSP::MemMerge(uVar18,uVar16);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        local_388 = local_330._24_8_;
        local_378 = local_2b8;
        puVar29 = local_2b8;
        this = local_268;
        lVar45 = local_330._24_8_;
        local_3f8 = local_330._24_8_;
        local_3e8 = local_2b8;
        local_3e0 = local_280;
        local_3d0 = (pointer)local_330._80_8_;
        local_3a0 = local_330._24_8_;
        local_398 = local_2b8;
        goto LAB_0016a266;
      }
      lVar37 = *local_280 * lVar26 + lVar33 * 4;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar37);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)local_330._80_8_ * lVar26 + lVar32;
      uVar23 = *(undefined4 *)(lVar44 + lVar35 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar37 + 8);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 + 8 + lVar35 * 4) = uVar23;
      lVar36 = lVar36 + 0x200000000;
      lVar37 = lVar33 + lVar35;
      lVar35 = lVar35 + 2;
      if ((long)local_200 <= lVar37 + 4) {
        uVar18 = iVar24 + (int)lVar35 + 2;
        iVar24 = iVar24 + (int)lVar35;
        local_368 = (long *)local_1e8._24_8_;
        goto LAB_0016c177;
      }
    }
    piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar33 * 4 + 8 + lVar35 * 4);
    *piVar1 = *piVar1 + 1;
    uVar51 = lVar45 + lVar35;
    lVar45 = *(long *)local_1e8._80_8_;
    local_410 = lVar33 + 2 + lVar35;
    if (*(char *)(lVar33 + lVar35 + 2 + lVar45 * lVar43 + local_1e8._24_8_) == '\0') {
      lVar45 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + lVar45 * lVar43 + 8);
      *piVar1 = *piVar1 + 1;
      lVar48 = *(long *)local_330._80_8_;
      uVar18 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + lVar33 * 4 + 8 + lVar35 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar54 + lVar45 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar54 + lVar48 * lVar26 + local_330._24_8_));
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      local_3e8 = local_2b8;
      local_380 = local_330._24_8_;
      this = local_268;
      local_3a0 = local_330._24_8_;
    }
    else {
      piVar1 = (int *)(lVar54 + *local_138 * lVar42 + local_170);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + local_1e8._24_8_ + lVar45 * lVar42) != '\0') goto LAB_0016ab5a;
      lVar45 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + lVar45 * lVar43 + 8);
      *piVar1 = *piVar1 + 1;
      lVar48 = *(long *)local_330._80_8_;
      uVar18 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + lVar33 * 4 + 8 + lVar35 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar44 * 4 + lVar45 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar48 * lVar26 + local_330._24_8_ + lVar44 * 4));
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar35 * 4 + lVar33 * 4 + local_400 * lVar26 + 8);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      local_3e8 = local_2b8;
      local_380 = local_330._24_8_;
      local_3a0 = local_330._24_8_;
    }
LAB_0016b23e:
    *(uint *)(local_3d8 * lVar26 + local_3a0 + local_410 * 4) = uVar18;
    iVar24 = (int)uVar51;
    uVar18 = iVar24 + 2;
    local_3a8 = (long *)local_170;
    if (local_370 <= (int)uVar18) {
LAB_0016c082:
      local_3c0 = (long *)*local_138;
      local_410 = (ulong)(int)uVar18;
      piVar1 = (int *)((long)local_3c0 * lVar26 + local_170 + local_410 * 4);
      *piVar1 = *piVar1 + 1;
      local_3f0 = *(ulong *)local_1e8._80_8_;
      local_368 = (long *)local_1e8._24_8_;
      lVar45 = local_3f0 * lVar26 + local_1e8._24_8_;
      local_3a0 = local_380;
      if (local_370 < (int)uVar18) {
        if (*(char *)(local_410 + lVar45) == '\0') {
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_380 + local_3d8 * lVar26 + local_410 * 4) = 0;
          goto LAB_0016d178;
        }
        lVar48 = (long)iVar24;
        piVar1 = (int *)(*local_138 * lVar26 + local_170 + 4 + lVar48 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar45 + 1 + lVar48) != '\0') {
          piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          lVar42 = local_380 + local_3d8 * lVar26;
          uVar23 = *(undefined4 *)(lVar42 + lVar48 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar42 + local_410 * 4) = uVar23;
          goto LAB_0016d178;
        }
        lVar45 = *(long *)local_1e8._80_8_ * lVar42;
LAB_0016cb49:
        piVar1 = (int *)(lVar42 * *local_138 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_410 + lVar45 + local_1e8._24_8_) != '\0') {
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
          uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_380 + local_410 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_3d8 * lVar26 + local_380 + local_410 * 4) = uVar23;
          goto LAB_0016d178;
        }
        piVar1 = (int *)((long)local_3e8 + (long)iVar24 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_380 + (long)iVar24 * 4);
        piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      else {
        if (*(char *)(local_410 + lVar45) == '\0') goto LAB_0016c669;
        lVar48 = (long)iVar24;
        piVar1 = (int *)(*local_138 * lVar26 + local_170 + 4 + lVar48 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar45 + 1 + lVar48) != '\0') {
LAB_0016c3c5:
          lVar48 = (long)(int)uVar18;
          piVar1 = (int *)(*local_138 * lVar42 + local_170 + 4 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          lVar45 = *(long *)local_1e8._80_8_ * lVar42 + local_1e8._24_8_;
          if (*(char *)(lVar48 + 1 + lVar45) == '\0') {
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + -8);
            *piVar1 = *piVar1 + 1;
            lVar42 = local_380 + local_3d8 * lVar26;
            uVar18 = *(uint *)(lVar42 + -8 + lVar48 * 4);
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            goto LAB_0016d16f;
          }
          piVar1 = (int *)(lVar42 * *local_138 + local_170 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar45 + lVar48) != '\0') {
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_380 + lVar48 * 4);
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_3d8 * lVar26 + local_380 + lVar48 * 4) = uVar23;
            goto LAB_0016d178;
          }
          piVar1 = (int *)(*local_138 * lVar43 + local_170 + lVar48 * 4);
          *piVar1 = *piVar1 + 1;
          cVar3 = *(char *)(lVar48 + *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_);
          piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
          uVar18 = *(uint *)(lVar43 * local_3d8 + local_380 + lVar48 * 4);
          if (cVar3 != '\0') {
            piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_380 + local_3d8 * lVar26 + lVar48 * 4) = uVar18;
            goto LAB_0016d178;
          }
          piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(local_380 + local_3d8 * lVar26 + -8 + lVar48 * 4);
          goto LAB_0016d139;
        }
        piVar1 = (int *)(*local_138 * lVar42 + local_170 + 0xc + lVar48 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = *(long *)local_1e8._80_8_ * lVar42;
        if (*(char *)(lVar48 + 3 + local_1e8._24_8_ + lVar45) == '\0') goto LAB_0016cb49;
        piVar1 = (int *)(lVar42 * *local_138 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_1e8._24_8_ + lVar45 + local_410) == '\0') {
LAB_0016cac5:
          piVar1 = (int *)(*local_138 * lVar43 + local_170 + local_410 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_410 + *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_) == '\0')
          {
            piVar1 = (int *)((long)local_3e8 + (long)(int)uVar18 * 4 + local_400 * lVar43 + -8);
            *piVar1 = *piVar1 + 1;
            lVar42 = local_3a0 + local_3d8 * lVar43;
            uVar18 = *(uint *)(lVar42 + -8 + (long)(int)uVar18 * 4);
            piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar42 + local_410 * 4));
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + *local_280 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + local_410 * 4) =
                 uVar18;
            goto LAB_0016d178;
          }
        }
        piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar43 * local_3d8 + local_3a0 + local_410 * 4);
        piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      *(undefined4 *)(local_3d8 * lVar26 + local_3a0 + local_410 * 4) = uVar23;
      goto LAB_0016d178;
    }
    local_3c0 = (long *)*local_138;
    local_3f0 = *(ulong *)local_1e8._80_8_;
    local_3e0 = local_280;
    local_3d0 = (pointer)local_330._80_8_;
    lVar37 = (long)iVar24;
    lVar44 = lVar37 << 0x20;
    lVar48 = (long)local_3c0 * lVar26 + lVar37 * 4 + local_170;
    lVar54 = local_3f0 * lVar26 + lVar37;
    lVar40 = (long)local_3c0 * lVar42 + lVar37 * 4 + local_170;
    lVar35 = local_3f0 * lVar42 + lVar37;
    lVar45 = lVar37 + 2;
    lVar36 = local_1e8._24_8_ + lVar54;
    local_350 = (ulong *)local_1e8._24_8_;
    lVar41 = local_1e8._24_8_ + 2 + lVar35;
    lVar32 = local_330._24_8_ + 8 + lVar37 * 4;
    local_3e8 = local_2b8;
    lVar31 = lVar37 * 4 + 8;
    lVar33 = 0;
LAB_0016b34c:
    piVar1 = (int *)(lVar48 + 8 + lVar33 * 4);
    *piVar1 = *piVar1 + 1;
    iVar52 = (int)lVar45;
    iVar25 = (int)lVar33;
    local_3b0 = local_170;
    if (*(char *)(lVar36 + 2 + lVar33) == '\0') {
      uVar51 = (ulong)(uint)(iVar52 + iVar25);
      plVar30 = (long *)local_170;
      local_368 = (long *)local_1e8._24_8_;
      local_380 = local_1e8._24_8_;
      goto LAB_00168e6d;
    }
    piVar1 = (int *)(lVar48 + 4 + lVar33 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar36 + 1 + lVar33) == '\0') {
      piVar1 = (int *)(lVar40 + 0xc + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      this = local_268;
      local_3a0 = local_330._24_8_;
      if (*(char *)(lVar41 + 1 + lVar33) != '\0') {
        piVar1 = (int *)(lVar40 + 8 + lVar33 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar41 + lVar33) != '\0') goto code_r0x0016b38a;
        uVar51 = (ulong)(uint)(iVar52 + iVar25);
        local_410 = lVar44 + 0x200000000 >> 0x20;
LAB_0016b7d2:
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_410 + local_3f0 * lVar43 + (long)local_350) == '\0') {
          lVar45 = *local_3e0;
          piVar1 = (int *)((long)local_3e8 + (long)(int)uVar51 * 4 + lVar45 * lVar43 + -8);
          *piVar1 = *piVar1 + 1;
          lVar48 = local_3a0 + *(long *)local_3d0 * lVar43;
          uVar18 = *(uint *)(lVar48 + -8 + (long)(int)uVar51 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + lVar45 * lVar43);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(lVar48 + local_410 * 4);
LAB_0016baa1:
          uVar18 = RemSP::MemMerge(uVar18,uVar16);
          local_400 = *local_280;
          piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_330._80_8_;
          local_3e8 = local_2b8;
          local_380 = local_330._24_8_;
          local_3a0 = local_330._24_8_;
        }
        else {
          local_400 = *local_3e0;
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
LAB_0016b82e:
          local_3d8 = *(long *)local_3d0;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + local_410 * 4);
          piVar1 = (int *)((long)local_3e8 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_380 = local_3a0;
        }
        goto LAB_0016b23e;
      }
      local_410 = lVar45 + lVar33;
      piVar1 = (int *)(*local_138 * lVar26 + local_170 + lVar37 * 4 + 0xc + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      lVar45 = *local_138 * lVar42 + local_170;
      lVar48 = lVar44 >> 0x1e;
      if (*(char *)(lVar33 + 3 + lVar54 + local_1e8._24_8_) == '\0') {
        piVar1 = (int *)(lVar45 + lVar37 * 4 + 8 + lVar33 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = *local_280;
        if (*(char *)(lVar33 + 2 + lVar35 + local_1e8._24_8_) == '\0') {
          piVar1 = (int *)((long)local_2b8 + lVar48 + lVar45 * lVar43);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)local_330._80_8_;
          uVar23 = *(undefined4 *)(lVar48 + lVar40 * lVar43 + local_330._24_8_);
          piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + lVar45 * lVar26 + lVar37 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_330._24_8_ + lVar37 * 4 + lVar40 * lVar26 + 8 + lVar33 * 4) = uVar23
          ;
        }
        else {
          piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + lVar45 * lVar43 + lVar37 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)local_330._80_8_;
          lVar48 = local_330._24_8_ + lVar37 * 4;
          uVar23 = *(undefined4 *)(lVar40 * lVar43 + lVar48 + 8 + lVar33 * 4);
          piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + lVar45 * lVar26 + lVar37 * 4 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar40 * lVar26 + lVar48 + 8 + lVar33 * 4) = uVar23;
        }
LAB_0016bda8:
        uVar16 = (uint)local_410;
        goto LAB_0016bdad;
      }
      piVar1 = (int *)(lVar45 + (lVar44 + 0x400000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      cVar3 = *(char *)(local_1e8._24_8_ + local_3f0 * lVar42 + (lVar44 + 0x400000000 >> 0x20));
      local_3c0 = (long *)*local_138;
      piVar1 = (int *)((long)local_3c0 * lVar42 + local_170 + lVar37 * 4 + 8 + lVar33 * 4);
      *piVar1 = *piVar1 + 1;
      cVar4 = *(char *)(lVar33 + 2 + lVar35 + local_1e8._24_8_);
      local_3f8 = local_330._24_8_;
      if (cVar3 != '\0') {
        local_368 = (long *)local_1e8._24_8_;
        if (cVar4 != '\0') {
          uVar51 = local_410 & 0xffffffff;
          goto LAB_00169040;
        }
        local_398 = local_2b8;
LAB_0016bc7d:
        uVar51 = local_410 & 0xffffffff;
        uVar22 = (ulong)(int)local_410;
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + 4 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar45 = local_3f0 * lVar43 + (long)local_368;
        if (*(char *)(uVar22 + 1 + lVar45) == '\0') {
          lVar45 = *local_3e0;
          uVar22 = (ulong)(int)local_410;
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar45 * lVar43 + -8);
          *piVar1 = *piVar1 + 1;
          lVar48 = local_3a0 + *(long *)local_3d0 * lVar43;
          uVar18 = *(uint *)(lVar48 + -8 + uVar22 * 4);
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar45 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          goto LAB_0016944e;
        }
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        local_400 = *local_3e0;
        lVar48 = local_400 * lVar43;
        if (*(char *)(lVar45 + uVar22) != '\0') {
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar48 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_3d0;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 8 + uVar22 * 4);
          piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_388 = local_3a0;
          local_378 = local_3e8;
          puVar29 = local_3e8;
          lVar45 = local_3a0;
          goto LAB_0016a266;
        }
        piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar48 + -8);
        *piVar1 = *piVar1 + 1;
        lVar45 = local_3a0 + *(long *)local_3d0 * lVar43;
        uVar18 = *(uint *)(lVar45 + -8 + uVar22 * 4);
        piVar1 = (int *)((long)local_3e8 + uVar22 * 4 + lVar48 + 8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar45 + 8 + uVar22 * 4);
        goto LAB_00169452;
      }
      local_400 = *local_280;
      local_398 = local_2b8;
      if (cVar4 != '\0') {
        piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar43 + lVar37 * 4 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        local_360 = local_2b8;
        local_260 = local_330._24_8_;
        local_378 = local_2b8;
        local_368 = (long *)local_1e8._24_8_;
        uVar18 = (uint)local_410;
        lVar45 = local_330._24_8_;
        puVar29 = local_2b8;
        local_388 = local_330._24_8_;
        goto LAB_00169174;
      }
      piVar1 = (int *)((long)local_2b8 + lVar48 + local_400 * lVar43);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      uVar16 = *(uint *)(lVar48 + local_3d8 * lVar43 + local_330._24_8_);
      piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar26 + lVar37 * 4 + 8);
      *piVar1 = *piVar1 + 1;
      local_368 = (long *)local_1e8._24_8_;
      local_380 = local_1e8._24_8_;
      local_220 = local_170;
LAB_0016bf40:
      uVar18 = (uint)local_410;
LAB_00169cdf:
      lVar45 = local_3d8 * lVar26 + local_3a0;
      *(uint *)(lVar45 + local_410 * 4) = uVar16;
      lVar40 = (long)(int)uVar18;
      uVar51 = lVar40 + 2;
      uVar18 = (uint)uVar51;
      local_378 = local_3e8;
      if (local_370 <= (int)uVar18) {
        if (local_370 < (int)uVar18) goto LAB_0016c942;
        piVar1 = (int *)((long)local_3c0 * lVar26 + local_220 + 8 + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        local_3f8 = local_3a0;
        if (*(char *)(lVar40 + 2 + local_3f0 * lVar26 + local_380) == '\0') goto LAB_0016c578;
        piVar1 = (int *)(local_220 + (long)local_3c0 * lVar42 + 0xc + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar40 + 3 + local_380 + local_3f0 * lVar42) == '\0') {
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar23 = *(undefined4 *)(lVar45 + lVar40 * 4);
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26 + 8);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar45 + 8 + lVar40 * 4) = uVar23;
        }
        else {
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          uVar18 = *(uint *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar40 * 4);
          piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar45 + lVar40 * 4));
          piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + *local_280 * lVar26 + 8);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar26 * *(long *)local_330._80_8_ + local_330._24_8_ + 8 + lVar40 * 4) = uVar18
          ;
        }
        goto LAB_0016d178;
      }
      lVar48 = (long)local_3c0 * lVar26 + local_220;
      piVar1 = (int *)(lVar48 + 8 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = local_3f0 * lVar26 + local_380;
      if (*(char *)(lVar40 + 2 + lVar36) == '\0') {
        local_360 = local_3e8;
        plVar30 = (long *)local_220;
        puVar29 = local_3e8;
        local_388 = local_3a0;
        local_260 = local_3a0;
LAB_00169fa0:
        uVar18 = (uint)uVar51;
        local_410 = (ulong)(int)uVar18;
        piVar1 = (int *)((long)local_3c0 * lVar26 + (long)plVar30 + 4 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        local_3e8 = local_398;
        if (*(char *)(local_410 + 1 + local_3f0 * lVar26 + local_380) == '\0') {
          local_400 = *local_3e0;
          local_410 = (ulong)(int)uVar18;
          piVar1 = (int *)((long)local_398 + local_410 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_3a0 = local_3f8;
          goto LAB_00169744;
        }
        piVar1 = (int *)((long)plVar30 + (long)local_3c0 * lVar42 + 4 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(local_410 + 1 + local_380 + local_3f0 * lVar42) != '\0') {
          local_400 = *local_3e0;
          piVar1 = (int *)((long)puVar29 + local_410 * 4 + local_400 * lVar43);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_3d0;
          local_380 = local_388;
          local_3e8 = puVar29;
LAB_0016a038:
          while( true ) {
            uVar23 = *(undefined4 *)(local_3d8 * lVar43 + local_388 + local_410 * 4);
            piVar1 = (int *)((long)puVar29 + local_410 * 4 + local_400 * lVar26);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_3d8 * lVar26 + local_388 + local_410 * 4) = uVar23;
            lVar45 = (long)(int)uVar51;
            uVar18 = (int)uVar51 + 2;
            uVar51 = (ulong)uVar18;
            if (local_370 <= (int)uVar18) break;
            piVar1 = (int *)((long)local_3c0 * lVar26 + local_3b0 + 8 + lVar45 * 4);
            *piVar1 = *piVar1 + 1;
            plVar30 = (long *)local_3b0;
            local_380 = (long)local_368;
            if (*(char *)(lVar45 + 2 + local_3f0 * lVar26 + (long)local_368) != '\0')
            goto LAB_0016b459;
LAB_00168e6d:
            while( true ) {
              uVar18 = (uint)uVar51;
              local_410 = (ulong)(int)uVar18;
              piVar1 = (int *)((long)local_3c0 * lVar26 + (long)plVar30 + 4 + local_410 * 4);
              *piVar1 = *piVar1 + 1;
              this = local_268;
              if (*(char *)(local_410 + 1 + local_3f0 * lVar26 + local_380) != '\0') break;
              local_3e0 = local_280;
              local_400 = *local_280;
              local_410 = (ulong)(int)uVar18;
              piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
              *piVar1 = *piVar1 + 1;
              local_3f8 = local_330._24_8_;
              local_398 = local_2b8;
              local_3e8 = local_2b8;
              local_3d0 = (pointer)local_330._80_8_;
              local_3a0 = local_330._24_8_;
LAB_00169744:
              local_3d8 = *(long *)local_3d0;
              lVar45 = local_3d8 * lVar26 + local_3a0;
              *(undefined4 *)(lVar45 + local_410 * 4) = 0;
              lVar48 = (long)(int)uVar18;
              local_410 = lVar48 + 2;
              uVar18 = (uint)local_410;
              if (local_370 <= (int)uVar18) {
                piVar1 = (int *)((long)local_3c0 * lVar26 + (long)plVar30 + 8 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar48 + 2 + local_3f0 * lVar26 + local_380);
                if (local_370 < (int)uVar18) {
                  if (cVar3 == '\0') {
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar45 + 8 + lVar48 * 4) = 0;
                    goto LAB_0016d178;
                  }
LAB_0016cead:
                  lVar40 = (long)plVar30 + (long)local_3c0 * lVar42;
                  piVar1 = (int *)(lVar40 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = local_380 + local_3f0 * lVar42;
                  if (*(char *)(lVar48 + 2 + lVar42) != '\0') goto LAB_0016cec4;
                  piVar1 = (int *)(lVar40 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::length_;
                  if (*(char *)(lVar42 + 1 + lVar48) == '\0') {
                    lVar42 = (long)(int)RemSP::length_;
                    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] =
                         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar42] + 1;
                    RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar42] = uVar18;
                    uVar18 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(lVar45 + 8 + lVar48 * 4) = uVar18;
                    goto LAB_0016d178;
                  }
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(local_3a0 + local_3d8 * lVar43 + lVar48 * 4);
                }
                else {
                  if (cVar3 == '\0') goto LAB_0016c669;
                  lVar40 = (long)plVar30 + (long)local_3c0 * lVar42;
                  piVar1 = (int *)(lVar40 + 0xc + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar36 = local_380 + local_3f0 * lVar42;
                  if (*(char *)(lVar48 + 3 + lVar36) == '\0') goto LAB_0016cead;
                  piVar1 = (int *)(lVar40 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar36 + 2 + lVar48) == '\0') {
                    piVar1 = (int *)(lVar40 + 4 + lVar48 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar36 + 1 + lVar48) != '\0') goto LAB_0016cac5;
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar23 = *(undefined4 *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + lVar26 * local_400 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar45 + 8 + lVar48 * 4) = uVar23;
                    goto LAB_0016d178;
                  }
LAB_0016cec4:
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar23 = *(undefined4 *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar48 * 4);
                }
                piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + lVar26 * local_400 + 8);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar45 + 8 + lVar48 * 4) = uVar23;
                goto LAB_0016d178;
              }
              lVar45 = (long)local_3c0 * lVar26 + (long)plVar30;
              piVar1 = (int *)(lVar45 + 8 + lVar48 * 4);
              *piVar1 = *piVar1 + 1;
              lVar40 = local_3f0 * lVar26 + local_380;
              if (*(char *)(lVar48 + 2 + lVar40) != '\0') {
                lVar36 = (long)local_3c0 * lVar42 + (long)plVar30;
                piVar1 = (int *)(lVar36 + 0xc + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                lVar41 = local_3f0 * lVar42 + local_380;
                if (*(char *)(lVar48 + 3 + lVar41) != '\0') {
                  piVar1 = (int *)(lVar36 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 2 + lVar48) != '\0') {
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_00169dff;
                  }
                  piVar1 = (int *)(lVar36 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 1 + lVar48) == '\0') {
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar51 = local_410 & 0xffffffff;
                    local_380 = local_3a0;
                    goto LAB_0016b23e;
                  }
                  local_350 = (ulong *)local_368;
                  uVar51 = local_410 & 0xffffffff;
                  goto LAB_0016b7d2;
                }
                piVar1 = (int *)(lVar45 + 0xc + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                local_220 = (long)plVar30;
                if (*(char *)(lVar40 + 3 + lVar48) == '\0') {
                  piVar1 = (int *)(*local_138 * lVar42 + local_170 + 8 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar45 = (long)local_368 + local_3f0 * lVar42;
                  if (*(char *)(lVar48 + 2 + lVar45) != '\0') {
                    lVar45 = *local_3e0;
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar43 + 8);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = *(long *)local_3d0;
                    uVar23 = *(undefined4 *)(lVar40 * lVar43 + local_3f8 + 8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar40 * lVar26 + local_3f8 + 8 + lVar48 * 4) = uVar23;
                    goto LAB_001699d6;
                  }
                  piVar1 = (int *)(*local_138 * lVar42 + local_170 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = RemSP::length_;
                  if (*(char *)(lVar45 + 1 + lVar48) == '\0') {
                    lVar45 = (long)(int)RemSP::length_;
                    RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar45] =
                         RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar45] + 1;
                    RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar45] = uVar18;
                    uVar18 = RemSP::length_;
                    RemSP::length_ = RemSP::length_ + 1;
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + *local_3e0 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(local_3f8 + *(long *)local_3d0 * lVar26 + 8 + lVar48 * 4) = uVar18;
                  }
                  else {
                    lVar45 = *local_3e0;
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar43);
                    *piVar1 = *piVar1 + 1;
                    lVar40 = *(long *)local_3d0;
                    uVar23 = *(undefined4 *)(lVar40 * lVar43 + local_3f8 + lVar48 * 4);
                    piVar1 = (int *)((long)local_398 + lVar48 * 4 + lVar45 * lVar26 + 8);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar40 * lVar26 + local_3f8 + 8 + lVar48 * 4) = uVar23;
                  }
                  goto LAB_0016bda8;
                }
                piVar1 = (int *)(lVar36 + 0x10 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar41 + 4 + lVar48);
                piVar1 = (int *)(lVar36 + 8 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                cVar4 = *(char *)(lVar41 + 2 + lVar48);
                local_378 = local_3e8;
                local_388 = local_3a0;
                if (cVar3 != '\0') {
                  if (cVar4 != '\0') {
                    uVar51 = local_410 & 0xffffffff;
                    local_368 = local_368;
                    goto LAB_00169040;
                  }
                  piVar1 = (int *)(lVar36 + 4 + lVar48 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar41 + 1 + lVar48) != '\0') goto LAB_0016bc7d;
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 0x10);
                  *piVar1 = *piVar1 + 1;
                  uVar18 = *(uint *)(local_3d8 * lVar43 + local_3a0 + 0x10 + lVar48 * 4);
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  uVar22 = local_410;
                  puVar29 = local_3e8;
                  lVar45 = local_3a0;
                  uVar51 = local_410 & 0xffffffff;
                  goto LAB_0016a266;
                }
                if (cVar4 != '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43 + 8);
                  *piVar1 = *piVar1 + 1;
                  lVar45 = local_3a0;
                  puVar29 = local_3e8;
                  local_360 = local_378;
                  local_260 = local_3a0;
                  goto LAB_00169174;
                }
                piVar1 = (int *)(lVar36 + 4 + lVar48 * 4);
                *piVar1 = *piVar1 + 1;
                uVar16 = RemSP::length_;
                if (*(char *)(lVar41 + 1 + lVar48) != '\0') {
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar43);
                  *piVar1 = *piVar1 + 1;
                  uVar16 = *(uint *)(local_3d8 * lVar43 + local_3a0 + lVar48 * 4);
                  piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                  *piVar1 = *piVar1 + 1;
                  goto LAB_0016bf40;
                }
                lVar45 = (long)(int)RemSP::length_;
                RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar45] =
                     RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar45] + 1;
                RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar45] = uVar16;
                uVar16 = RemSP::length_;
                RemSP::length_ = RemSP::length_ + 1;
                piVar1 = (int *)((long)local_3e8 + lVar48 * 4 + local_400 * lVar26 + 8);
                *piVar1 = *piVar1 + 1;
                goto LAB_00169cdf;
              }
              uVar51 = local_410 & 0xffffffff;
            }
            lVar40 = (long)local_3c0 * lVar42;
            piVar1 = (int *)((long)plVar30 + lVar40 + 4 + local_410 * 4);
            *piVar1 = *piVar1 + 1;
            lVar36 = local_3f0 * lVar42;
            if (*(char *)(local_410 + 1 + local_380 + lVar36) == '\0') goto LAB_00168fd4;
            local_3e0 = local_280;
            local_400 = *local_280;
            piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
            *piVar1 = *piVar1 + 1;
            local_3d0 = (pointer)local_330._80_8_;
            local_3d8 = *(long *)local_330._80_8_;
            local_260 = local_330._24_8_;
            local_378 = local_2b8;
            local_380 = local_330._24_8_;
            local_3e8 = local_2b8;
            local_388 = local_330._24_8_;
            puVar29 = local_2b8;
          }
          local_3a0 = local_260;
          if (local_370 < (int)uVar18) goto LAB_0016c942;
          piVar1 = (int *)(local_3b0 + (long)local_3c0 * lVar26 + 8 + lVar45 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar45 + 2 + (long)local_368 + local_3f0 * lVar26) == '\0')
          goto LAB_0016c669;
          goto LAB_0016c3c5;
        }
        uVar22 = (ulong)(int)uVar18;
        piVar1 = (int *)((long)local_3c0 * lVar42 + local_3b0 + 8 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        uVar16 = RemSP::length_;
        if (*(char *)(uVar22 + 2 + local_3f0 * lVar42 + (long)local_368) != '\0') {
          local_400 = *local_3e0;
          piVar1 = (int *)((long)puVar29 + uVar22 * 4 + local_400 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_3d0;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_388 + 8 + uVar22 * 4);
          piVar1 = (int *)((long)puVar29 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          local_3e8 = local_360;
          local_388 = local_388;
          lVar45 = local_260;
          goto LAB_0016a266;
        }
        lVar45 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar45] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar45] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar45] = uVar16;
        uVar16 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        local_400 = *local_3e0;
        local_410 = (ulong)(int)uVar18;
        piVar1 = (int *)((long)local_398 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_3d0;
        local_380 = (long)local_368;
        local_220 = local_3b0;
        local_3a0 = local_3f8;
        goto LAB_00169cdf;
      }
      lVar41 = local_220 + (long)local_3c0 * lVar42;
      piVar1 = (int *)(lVar41 + 0xc + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar32 = local_380 + local_3f0 * lVar42;
      local_410 = uVar51;
      if (*(char *)(lVar40 + 3 + lVar32) != '\0') {
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar43 + 8);
        *piVar1 = *piVar1 + 1;
        uVar18 = *(uint *)(local_3a0 + local_3d8 * lVar43 + 8 + lVar40 * 4);
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar45 + lVar40 * 4);
LAB_00169dc1:
        uVar18 = RemSP::MemMerge(uVar18,uVar16);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        local_3e8 = local_2b8;
        local_3a0 = local_330._24_8_;
LAB_00169dff:
        uVar51 = local_410 & 0xffffffff;
        local_380 = local_3a0;
        goto LAB_0016b23e;
      }
      piVar1 = (int *)(lVar48 + 0xc + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar36 + 3 + lVar40) == '\0') {
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar45 + lVar40 * 4);
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar45 + 8 + lVar40 * 4) = uVar23;
        uVar16 = uVar18;
        goto LAB_0016bdad;
      }
      piVar1 = (int *)(lVar41 + 0x10 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar32 + 4 + lVar40) == '\0') {
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
        uVar23 = *(undefined4 *)(lVar45 + lVar40 * 4);
        piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26 + 8);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar45 + 8 + lVar40 * 4) = uVar23;
        goto LAB_0016a842;
      }
      piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar43 + 0x10);
      *piVar1 = *piVar1 + 1;
      uVar18 = *(uint *)(local_3a0 + local_3d8 * lVar43 + 0x10 + lVar40 * 4);
      piVar1 = (int *)((long)local_3e8 + lVar40 * 4 + local_400 * lVar26);
      *piVar1 = *piVar1 + 1;
      uVar18 = RemSP::MemMerge(uVar18,*(uint *)(lVar45 + lVar40 * 4));
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + lVar40 * 4 + local_400 * lVar26 + 8);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
LAB_00169f2f:
      local_388 = local_330._24_8_;
      uVar22 = local_410;
      local_378 = local_2b8;
      puVar29 = local_2b8;
      lVar45 = local_330._24_8_;
      uVar51 = local_410 & 0xffffffff;
      local_3f8 = local_330._24_8_;
      local_3e8 = local_2b8;
      local_3e0 = local_280;
      local_3d0 = (pointer)local_330._80_8_;
      local_3a0 = local_330._24_8_;
      local_398 = local_2b8;
      goto LAB_0016a266;
    }
    uVar51 = (ulong)(uint)(iVar52 + iVar25);
LAB_0016b459:
    this = local_268;
    uVar16 = (uint)uVar51;
    local_410 = (ulong)(int)uVar16;
    piVar1 = (int *)(*local_138 * lVar42 + local_170 + 4 + local_410 * 4);
    *piVar1 = *piVar1 + 1;
    local_3f0 = *(ulong *)local_1e8._80_8_;
    lVar45 = local_3f0 * lVar42 + local_1e8._24_8_;
    local_3a0 = local_330._24_8_;
    local_3e8 = local_2b8;
    if (*(char *)(local_410 + 1 + lVar45) != '\0') {
      piVar1 = (int *)(local_170 + *local_138 * lVar42 + local_410 * 4);
      *piVar1 = *piVar1 + 1;
      local_380 = local_330._24_8_;
      if (*(char *)(lVar45 + local_410) == '\0') {
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + local_410 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(local_410 + *(long *)local_1e8._80_8_ * lVar43 + local_1e8._24_8_);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + local_410 * 4);
        if (cVar3 == '\0') {
          piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26 + -8);
          *piVar1 = *piVar1 + 1;
          uVar16 = *(uint *)(local_330._24_8_ + local_3d8 * lVar26 + -8 + local_410 * 4);
          goto LAB_0016baa1;
        }
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      else {
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar43);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + local_410 * 4);
        piVar1 = (int *)((long)local_2b8 + local_410 * 4 + local_400 * lVar26);
        *piVar1 = *piVar1 + 1;
      }
      goto LAB_0016b23e;
    }
    piVar1 = (int *)(local_170 + *local_138 * lVar26 + 4 + local_410 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(local_410 + 1 + local_3f0 * lVar26 + local_1e8._24_8_) == '\0') {
      lVar45 = *local_280;
      lVar48 = (long)(int)uVar16;
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26 + -8);
      *piVar1 = *piVar1 + 1;
      lVar40 = *(long *)local_330._80_8_ * lVar26 + local_330._24_8_;
      uVar23 = *(undefined4 *)(lVar40 + -8 + lVar48 * 4);
      piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar40 + lVar48 * 4) = uVar23;
      local_350 = (ulong *)local_1e8._24_8_;
      goto LAB_0016bdad;
    }
    uVar22 = (ulong)(int)uVar16;
    local_3a8 = (long *)local_170;
    local_3c0 = (long *)*local_138;
    piVar1 = (int *)((long)local_3c0 * lVar42 + local_170 + 8 + uVar22 * 4);
    *piVar1 = *piVar1 + 1;
    local_368 = (long *)local_1e8._24_8_;
    local_3f0 = *(ulong *)local_1e8._80_8_;
    local_3d0 = (pointer)local_330._80_8_;
    local_378 = local_2b8;
    local_3e0 = local_280;
    if (*(char *)(uVar22 + 2 + local_3f0 * lVar42 + local_1e8._24_8_) != '\0') {
      piVar1 = (int *)(*local_138 * lVar43 + local_170 + 4 + local_410 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(local_410 + 1 + local_1e8._24_8_ + local_3f0 * lVar43) == '\0') {
        lVar45 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar43 + 8);
        *piVar1 = *piVar1 + 1;
        lVar48 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(lVar48 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar26 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(lVar48 * lVar26 + local_330._24_8_ + -8 + uVar22 * 4);
      }
      else {
        piVar1 = (int *)(*local_138 * lVar42 + local_170 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar48 = *(long *)local_1e8._80_8_;
        local_3f8 = local_330._24_8_;
        puVar29 = local_2b8;
        local_388 = local_330._24_8_;
        lVar45 = local_330._24_8_;
        local_398 = local_2b8;
        if (*(char *)(uVar22 + lVar48 * lVar42 + local_1e8._24_8_) != '\0') {
          local_400 = *local_280;
          piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar43 + 8);
          *piVar1 = *piVar1 + 1;
          local_3d8 = *(long *)local_330._80_8_;
          uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
          piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          goto LAB_0016a266;
        }
        piVar1 = (int *)(*local_138 * lVar43 + local_170 + uVar22 * 4);
        *piVar1 = *piVar1 + 1;
        cVar3 = *(char *)(uVar22 + local_1e8._24_8_ + lVar48 * lVar43);
        local_400 = *local_280;
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar43 + 8);
        *piVar1 = *piVar1 + 1;
        local_3d8 = *(long *)local_330._80_8_;
        uVar18 = *(uint *)(local_3d8 * lVar43 + local_330._24_8_ + 8 + uVar22 * 4);
        if (cVar3 != '\0') {
          piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
          *piVar1 = *piVar1 + 1;
          goto LAB_0016a266;
        }
        piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26 + -8);
        *piVar1 = *piVar1 + 1;
        uVar16 = *(uint *)(local_330._24_8_ + local_3d8 * lVar26 + -8 + uVar22 * 4);
      }
      uVar18 = RemSP::MemMerge(uVar18,uVar16);
      local_400 = *local_280;
      piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + local_400 * lVar26);
      *piVar1 = *piVar1 + 1;
      local_3d8 = *(long *)local_330._80_8_;
      local_388 = local_330._24_8_;
      local_378 = local_2b8;
      puVar29 = local_2b8;
      lVar45 = local_330._24_8_;
      local_3f8 = local_330._24_8_;
      local_3e8 = local_2b8;
      local_3e0 = local_280;
      local_3d0 = (pointer)local_330._80_8_;
      local_3a0 = local_330._24_8_;
      local_398 = local_2b8;
      goto LAB_0016a266;
    }
    lVar45 = *local_280;
    lVar48 = (long)(int)uVar16;
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26 + -8);
    *piVar1 = *piVar1 + 1;
    lVar40 = *(long *)local_330._80_8_ * lVar26 + local_330._24_8_;
    uVar23 = *(undefined4 *)(lVar40 + -8 + lVar48 * 4);
    piVar1 = (int *)((long)local_2b8 + lVar48 * 4 + lVar45 * lVar26);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar40 + lVar48 * 4) = uVar23;
  } while( true );
LAB_0016940b:
  lVar45 = *local_280;
  uVar22 = (ulong)(int)uVar51;
  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar43);
  *piVar1 = *piVar1 + 1;
  lVar48 = *(long *)local_330._80_8_ * lVar43 + local_330._24_8_;
  uVar18 = *(uint *)(lVar48 + uVar22 * 4);
  piVar1 = (int *)((long)local_2b8 + uVar22 * 4 + lVar45 * lVar43 + 8);
  *piVar1 = *piVar1 + 1;
LAB_0016944e:
  uVar16 = *(uint *)(lVar48 + 8 + uVar22 * 4);
  goto LAB_00169452;
code_r0x0016b38a:
  local_400 = *local_280;
  piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar43 + lVar31);
  *piVar1 = *piVar1 + 1;
  local_3d8 = *(long *)local_330._80_8_;
  uVar23 = *(undefined4 *)(local_3d8 * lVar43 + lVar32 + lVar33 * 4);
  piVar1 = (int *)((long)local_2b8 + lVar33 * 4 + local_400 * lVar26 + lVar31);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(local_3d8 * lVar26 + lVar32 + lVar33 * 4) = uVar23;
  lVar44 = lVar44 + 0x200000000;
  lVar38 = lVar45 + lVar33;
  lVar33 = lVar33 + 2;
  if ((long)local_200 <= lVar38 + 2) {
    uVar18 = iVar24 + (int)lVar33 + 2;
    iVar24 = iVar24 + (int)lVar33;
    local_380 = local_330._24_8_;
    goto LAB_0016c082;
  }
  goto LAB_0016b34c;
LAB_0015d9a0:
  uVar23 = 0;
LAB_0015d9f7:
  local_2b8[lVar26] = local_2b8[lVar26] + 1;
  *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = uVar23;
  iVar24 = iVar49;
LAB_0015da05:
  iVar49 = iVar24 + 2;
  if (local_370 <= iVar49) goto code_r0x0015da14;
  goto LAB_0015d877;
code_r0x0015da14:
  lVar42 = (long)(iVar24 + 3);
LAB_0015dfb4:
  lVar26 = (long)iVar49;
  piVar1 = (int *)(local_170 + lVar26 * 4);
  *piVar1 = *piVar1 + 1;
  if (local_370 < iVar49) {
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
      local_2b8[lVar26] = local_2b8[lVar26] + 1;
LAB_0015e27b:
      *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
      goto LAB_0016d178;
    }
  }
  else {
    if (*(char *)(local_1e8._24_8_ + lVar26) == '\0') {
LAB_0015e1c8:
      lVar26 = (long)iVar49;
      piVar1 = (int *)(local_170 + 4 + lVar26 * 4);
      *piVar1 = *piVar1 + 1;
      uVar18 = RemSP::length_;
      if (*(char *)(local_1e8._24_8_ + 1 + lVar26) == '\0') {
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
        *(undefined4 *)(local_330._24_8_ + lVar26 * 4) = 0;
      }
      else {
        lVar42 = (long)(int)RemSP::length_;
        RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] =
             RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar42] + 1;
        RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar42] = uVar18;
        uVar18 = RemSP::length_;
        RemSP::length_ = RemSP::length_ + 1;
        local_2b8[lVar26] = local_2b8[lVar26] + 1;
        *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
      }
      goto LAB_0016d178;
    }
    piVar1 = (int *)(local_170 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
  }
  uVar18 = RemSP::length_;
  lVar42 = (long)(int)RemSP::length_;
  RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar42] =
       RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start[lVar42] + 1;
  RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start[lVar42] = uVar18;
  uVar18 = RemSP::length_;
  RemSP::length_ = RemSP::length_ + 1;
  local_2b8[lVar26] = local_2b8[lVar26] + 1;
  *(uint *)(local_330._24_8_ + lVar26 * 4) = uVar18;
LAB_0016d178:
  uVar18 = RemSP::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar18;
  if (0 < iVar5) {
    local_200 = local_2b8;
    local_3a8 = (long *)0x1;
    uVar51 = 0;
    do {
      piVar12 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar29 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar6) {
        uVar22 = uVar51 | 1;
        lVar42 = *local_280 * (long)local_3a8;
        lVar48 = *(long *)local_330._80_8_ * (long)local_3a8 + local_330._24_8_;
        lVar45 = *(long *)local_330._80_8_ * uVar51 + local_330._24_8_;
        lVar43 = *local_280 * uVar51;
        lVar26 = 1;
        do {
          iVar5 = *(int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4);
          *(int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4) = iVar5 + 1;
          lVar40 = (long)*(int *)(lVar45 + -4 + lVar26 * 4);
          if (lVar40 < 1) {
            *(int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4) = iVar5 + 2;
            *(undefined4 *)(lVar45 + -4 + lVar26 * 4) = 0;
            if (lVar26 < lVar53) {
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar43);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar45 + lVar26 * 4) = 0;
              if (uVar22 < uVar34) {
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar48 + -4 + lVar26 * 4) = 0;
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar48 + lVar26 * 4) = 0;
              }
            }
            else if (uVar22 < uVar34) {
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar48 + -4 + lVar26 * 4) = 0;
            }
          }
          else {
            piVar12[lVar40] = piVar12[lVar40] + 1;
            uVar18 = puVar29[lVar40];
            uVar28 = *local_138;
            lVar41 = uVar51 * uVar28 + local_170;
            piVar1 = (int *)(lVar41 + -4 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = *(long *)local_1e8._80_8_;
            lVar36 = uVar51 * lVar40 + local_1e8._24_8_;
            uVar16 = uVar18;
            if (*(char *)(lVar26 + -1 + lVar36) == '\0') {
              uVar16 = 0;
            }
            piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar43 + -4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar45 + -4 + lVar26 * 4) = uVar16;
            if (lVar26 < lVar53) {
              piVar1 = (int *)(lVar41 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = uVar18;
              if (*(char *)(lVar26 + lVar36) == '\0') {
                uVar16 = 0;
              }
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar43);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar45 + lVar26 * 4) = uVar16;
              if (uVar22 < uVar34) {
                lVar36 = uVar28 * (long)local_3a8 + local_170;
                piVar1 = (int *)(lVar36 + -4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                lVar40 = lVar40 * (long)local_3a8 + local_1e8._24_8_;
                uVar16 = uVar18;
                if (*(char *)(lVar26 + -1 + lVar40) == '\0') {
                  uVar16 = 0;
                }
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(lVar48 + -4 + lVar26 * 4) = uVar16;
                piVar1 = (int *)(lVar36 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar26 + lVar40);
                piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42);
                *piVar1 = *piVar1 + 1;
                if (cVar3 == '\0') {
                  *(undefined4 *)(lVar48 + lVar26 * 4) = 0;
                }
                else {
                  *(uint *)(lVar48 + lVar26 * 4) = uVar18;
                }
              }
            }
            else if (uVar22 < uVar34) {
              piVar1 = (int *)(uVar28 * (long)local_3a8 + local_170 + -4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar26 + -1 + lVar40 * (long)local_3a8 + local_1e8._24_8_);
              piVar1 = (int *)((long)local_2b8 + lVar26 * 4 + lVar42 + -4);
              *piVar1 = *piVar1 + 1;
              if (cVar3 == '\0') {
                *(undefined4 *)(lVar48 + -4 + lVar26 * 4) = 0;
              }
              else {
                *(uint *)(lVar48 + -4 + lVar26 * 4) = uVar18;
              }
            }
          }
          lVar40 = lVar26 + 1;
          lVar26 = lVar26 + 2;
        } while (lVar40 < lVar53);
      }
      uVar51 = uVar51 + 2;
      local_3a8 = (long *)((long)local_3a8 + 2);
    } while (uVar51 < uVar34);
  }
  pauVar19 = (undefined1 (*) [16])operator_new(0x20);
  pvVar15 = local_118;
  pauVar19[1] = (undefined1  [16])0x0;
  *pauVar19 = (undefined1  [16])0x0;
  puVar9 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar10 = (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)pauVar19;
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(pauVar19 + 2);
  (local_118->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(pauVar19 + 2);
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9,(long)puVar10 - (long)puVar9);
  }
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_180;
  cv::sum((_InputArray *)&local_f0);
  *(pvVar15->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_f0._0_8_ - 9.223372036854776e+18) & (long)(double)local_f0._0_8_ >> 0x3f
       | (long)(double)local_f0._0_8_;
  local_f8 = 0;
  local_108 = 0x81010004;
  local_100 = local_2c8;
  cv::sum((_InputArray *)&local_f0);
  pSVar14 = local_268;
  puVar9 = (pvVar15->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar9[1] = (long)((double)local_f0._0_8_ - 9.223372036854776e+18) &
              (long)(double)local_f0._0_8_ >> 0x3f | (long)(double)local_f0._0_8_;
  if ((long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar51 = 0;
  }
  else {
    lVar53 = (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar56 = 0.0;
    lVar26 = 0;
    do {
      dVar56 = dVar56 + (double)RemSP::mem_P_.accesses_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar26];
      lVar26 = lVar26 + 1;
    } while (lVar53 + (ulong)(lVar53 == 0) != lVar26);
    uVar51 = (long)(dVar56 - 9.223372036854776e+18) & (long)dVar56 >> 0x3f | (long)dVar56;
  }
  puVar9[2] = uVar51;
  MemMat<int>::GetImage(&local_f0,(MemMat<int> *)local_330);
  cv::Mat::operator=(&((pSVar14->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,&local_f0.super_Mat);
  cv::Mat::~Mat(&local_f0.super_Mat);
  cv::Mat::~Mat(local_2c8);
  cv::Mat::~Mat((Mat *)(local_330 + 8));
  cv::Mat::~Mat(local_180);
  cv::Mat::~Mat((Mat *)(local_1e8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
	{
		const int h = img_.rows;
		const int w = img_.cols;

		LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
		LabelsSolver::MemSetup();

		//Data structure for memory test
		MemMat<unsigned char> img(img_);
		MemMat<int> img_labels(img_.size(), 0);

		// We work with 2x2 blocks
		// +-+-+-+
		// |P|Q|R|
		// +-+-+-+
		// |S|X|
		// +-+-+

		// The pixels are named as follows
		// +---+---+---+
		// |a b|c d|e f|
		// |g h|i j|k l|
		// +---+---+---+
		// |m n|o p|
		// |q r|s t|
		// +---+---+

		// Pixels a, f, l, q are not needed, since we need to understand the
		// the connectivity between these blocks and those pixels only metter
		// when considering the outer connectivities

		// A bunch of defines used to check if the pixels are foreground,
		// without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

				// Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
				// Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
				//Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
				// Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
				// Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
				// Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
				// Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
				//Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
				// Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
				// Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
				// Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
				// Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
				// Action 13: not used
#define ACTION_13 
				// Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
				//Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
				//Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


		if (h == 1) {
			// Single line
			int r = 0;
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				int r = 0;
				int c = -2;
#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < h - (h % 2); r += 2) {
				int c = -2;
				goto tree_0;
#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case that the rows are odd)
			if ((h % 2) == 1)
			{
				int r = h - 1;
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}

		n_labels_ = LabelsSolver::MemFlatten();

		// Second scan
		for (int r = 0; r < h; r += 2) {
			for (int c = 0; c < w; c += 2) {
				int iLabel = img_labels(r, c);
				if (iLabel > 0) {
					iLabel = LabelsSolver::MemGetLabel(iLabel);
					if (img(r, c) > 0)
						img_labels(r, c) = iLabel;
					else
						img_labels(r, c) = 0;
					if (c + 1 < w) {
						if (img(r, c + 1) > 0)
							img_labels(r, c + 1) = iLabel;
						else
							img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							if (img(r + 1, c) > 0)
								img_labels(r + 1, c) = iLabel;
							else
								img_labels(r + 1, c) = 0;
							if (img(r + 1, c + 1) > 0)
								img_labels(r + 1, c + 1) = iLabel;
							else
								img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						if (img(r + 1, c) > 0)
							img_labels(r + 1, c) = iLabel;
						else
							img_labels(r + 1, c) = 0;
					}
				}
				else {
					img_labels(r, c) = 0;
					if (c + 1 < w) {
						img_labels(r, c + 1) = 0;
						if (r + 1 < h) {
							img_labels(r + 1, c) = 0;
							img_labels(r + 1, c + 1) = 0;
						}
					}
					else if (r + 1 < h) {
						img_labels(r + 1, c) = 0;
					}
				}
			}
		}

		// Store total accesses in the output vector 'accesses'
		accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

		accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
		accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
		accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

		img_labels_ = img_labels.GetImage();

		LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
	}